

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  Primitive PVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [12];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  uint uVar80;
  uint uVar81;
  ulong uVar82;
  undefined1 (*pauVar83) [32];
  uint uVar84;
  uint uVar85;
  uint uVar86;
  long lVar87;
  long lVar88;
  int iVar89;
  ulong uVar90;
  float fVar91;
  float fVar113;
  float fVar114;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar115;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar103 [16];
  undefined1 auVar112 [32];
  float fVar116;
  float fVar141;
  float fVar143;
  vint4 bi;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar145;
  undefined1 auVar121 [16];
  float fVar117;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  float fVar150;
  float fVar172;
  float fVar175;
  vint4 bi_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar151;
  float fVar152;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar173;
  float fVar174;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar160 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar163 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar191;
  float fVar211;
  float fVar212;
  vint4 ai_1;
  undefined1 auVar192 [16];
  float fVar213;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar214;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar215;
  float fVar235;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar216 [16];
  float fVar237;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar228 [28];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar238;
  float fVar248;
  float fVar250;
  undefined1 auVar240 [16];
  float fVar252;
  undefined1 auVar241 [16];
  float fVar239;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar249;
  float fVar251;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar257;
  float fVar258;
  float fVar267;
  float fVar269;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar273;
  float fVar275;
  float fVar277;
  undefined1 auVar261 [32];
  float fVar271;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar268;
  float fVar270;
  float fVar272;
  float fVar274;
  float fVar276;
  float fVar278;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar292;
  vint4 ai;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar286 [32];
  float fVar293;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar297;
  float fVar298;
  float fVar307;
  float fVar309;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar314;
  float fVar316;
  float fVar318;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar306 [64];
  float s;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar325;
  float fVar329;
  undefined1 auVar323 [16];
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar324 [32];
  float fVar359;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar360 [16];
  float fVar367;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [64];
  float fVar368;
  float fVar369;
  float fVar373;
  float fVar375;
  undefined1 auVar370 [16];
  float fVar374;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar381;
  float fVar387;
  float fVar388;
  undefined1 auVar382 [16];
  float fVar389;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar386 [64];
  float fVar393;
  float fVar395;
  float fVar396;
  float fVar397;
  undefined1 auVar394 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_aec;
  float local_ae0;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  RTCFilterFunctionNArguments local_a58;
  int local_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [32];
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_870;
  float local_868;
  float local_864;
  undefined4 local_860;
  uint local_85c;
  uint local_858;
  uint local_854;
  uint local_850;
  undefined8 local_840;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined4 uStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar12 = prim[1];
  uVar82 = (ulong)(byte)PVar12;
  lVar88 = uVar82 * 0x25;
  fVar117 = *(float *)(prim + lVar88 + 0x12);
  auVar104 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar88 + 6));
  auVar118._0_4_ = fVar117 * auVar104._0_4_;
  auVar118._4_4_ = fVar117 * auVar104._4_4_;
  auVar118._8_4_ = fVar117 * auVar104._8_4_;
  auVar118._12_4_ = fVar117 * auVar104._12_4_;
  auVar279._0_4_ = fVar117 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar279._4_4_ = fVar117 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar279._8_4_ = fVar117 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar279._12_4_ = fVar117 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar158 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xf + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar158 = vcvtdq2ps_avx(auVar158);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar82 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1a + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1b + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x1c + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vshufps_avx(auVar279,auVar279,0);
  auVar20 = vshufps_avx(auVar279,auVar279,0x55);
  auVar21 = vshufps_avx(auVar279,auVar279,0xaa);
  fVar117 = auVar21._0_4_;
  fVar142 = auVar21._4_4_;
  fVar144 = auVar21._8_4_;
  fVar147 = auVar21._12_4_;
  fVar215 = auVar20._0_4_;
  fVar235 = auVar20._4_4_;
  fVar236 = auVar20._8_4_;
  fVar237 = auVar20._12_4_;
  fVar191 = auVar19._0_4_;
  fVar211 = auVar19._4_4_;
  fVar212 = auVar19._8_4_;
  fVar213 = auVar19._12_4_;
  auVar370._0_4_ = fVar191 * auVar104._0_4_ + fVar215 * auVar203._0_4_ + fVar117 * auVar223._0_4_;
  auVar370._4_4_ = fVar211 * auVar104._4_4_ + fVar235 * auVar203._4_4_ + fVar142 * auVar223._4_4_;
  auVar370._8_4_ = fVar212 * auVar104._8_4_ + fVar236 * auVar203._8_4_ + fVar144 * auVar223._8_4_;
  auVar370._12_4_ =
       fVar213 * auVar104._12_4_ + fVar237 * auVar203._12_4_ + fVar147 * auVar223._12_4_;
  auVar382._0_4_ = fVar191 * auVar158._0_4_ + fVar215 * auVar100._0_4_ + auVar99._0_4_ * fVar117;
  auVar382._4_4_ = fVar211 * auVar158._4_4_ + fVar235 * auVar100._4_4_ + auVar99._4_4_ * fVar142;
  auVar382._8_4_ = fVar212 * auVar158._8_4_ + fVar236 * auVar100._8_4_ + auVar99._8_4_ * fVar144;
  auVar382._12_4_ = fVar213 * auVar158._12_4_ + fVar237 * auVar100._12_4_ + auVar99._12_4_ * fVar147
  ;
  auVar280._0_4_ = fVar191 * auVar126._0_4_ + fVar215 * auVar102._0_4_ + auVar18._0_4_ * fVar117;
  auVar280._4_4_ = fVar211 * auVar126._4_4_ + fVar235 * auVar102._4_4_ + auVar18._4_4_ * fVar142;
  auVar280._8_4_ = fVar212 * auVar126._8_4_ + fVar236 * auVar102._8_4_ + auVar18._8_4_ * fVar144;
  auVar280._12_4_ = fVar213 * auVar126._12_4_ + fVar237 * auVar102._12_4_ + auVar18._12_4_ * fVar147
  ;
  auVar19 = vshufps_avx(auVar118,auVar118,0);
  auVar20 = vshufps_avx(auVar118,auVar118,0x55);
  auVar21 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar117 = auVar21._0_4_;
  fVar142 = auVar21._4_4_;
  fVar144 = auVar21._8_4_;
  fVar147 = auVar21._12_4_;
  fVar215 = auVar20._0_4_;
  fVar235 = auVar20._4_4_;
  fVar236 = auVar20._8_4_;
  fVar237 = auVar20._12_4_;
  fVar191 = auVar19._0_4_;
  fVar211 = auVar19._4_4_;
  fVar212 = auVar19._8_4_;
  fVar213 = auVar19._12_4_;
  auVar119._0_4_ = fVar191 * auVar104._0_4_ + fVar215 * auVar203._0_4_ + fVar117 * auVar223._0_4_;
  auVar119._4_4_ = fVar211 * auVar104._4_4_ + fVar235 * auVar203._4_4_ + fVar142 * auVar223._4_4_;
  auVar119._8_4_ = fVar212 * auVar104._8_4_ + fVar236 * auVar203._8_4_ + fVar144 * auVar223._8_4_;
  auVar119._12_4_ =
       fVar213 * auVar104._12_4_ + fVar237 * auVar203._12_4_ + fVar147 * auVar223._12_4_;
  auVar92._0_4_ = fVar191 * auVar158._0_4_ + auVar99._0_4_ * fVar117 + fVar215 * auVar100._0_4_;
  auVar92._4_4_ = fVar211 * auVar158._4_4_ + auVar99._4_4_ * fVar142 + fVar235 * auVar100._4_4_;
  auVar92._8_4_ = fVar212 * auVar158._8_4_ + auVar99._8_4_ * fVar144 + fVar236 * auVar100._8_4_;
  auVar92._12_4_ = fVar213 * auVar158._12_4_ + auVar99._12_4_ * fVar147 + fVar237 * auVar100._12_4_;
  auVar299._8_4_ = 0x7fffffff;
  auVar299._0_8_ = 0x7fffffff7fffffff;
  auVar299._12_4_ = 0x7fffffff;
  auVar104 = vandps_avx(auVar370,auVar299);
  auVar216._8_4_ = 0x219392ef;
  auVar216._0_8_ = 0x219392ef219392ef;
  auVar216._12_4_ = 0x219392ef;
  auVar104 = vcmpps_avx(auVar104,auVar216,1);
  auVar203 = vblendvps_avx(auVar370,auVar216,auVar104);
  auVar104 = vandps_avx(auVar382,auVar299);
  auVar104 = vcmpps_avx(auVar104,auVar216,1);
  auVar223 = vblendvps_avx(auVar382,auVar216,auVar104);
  auVar104 = vandps_avx(auVar299,auVar280);
  auVar104 = vcmpps_avx(auVar104,auVar216,1);
  auVar104 = vblendvps_avx(auVar280,auVar216,auVar104);
  auVar153._0_4_ = fVar191 * auVar126._0_4_ + fVar215 * auVar102._0_4_ + auVar18._0_4_ * fVar117;
  auVar153._4_4_ = fVar211 * auVar126._4_4_ + fVar235 * auVar102._4_4_ + auVar18._4_4_ * fVar142;
  auVar153._8_4_ = fVar212 * auVar126._8_4_ + fVar236 * auVar102._8_4_ + auVar18._8_4_ * fVar144;
  auVar153._12_4_ = fVar213 * auVar126._12_4_ + fVar237 * auVar102._12_4_ + auVar18._12_4_ * fVar147
  ;
  auVar158 = vrcpps_avx(auVar203);
  fVar191 = auVar158._0_4_;
  auVar192._0_4_ = fVar191 * auVar203._0_4_;
  fVar211 = auVar158._4_4_;
  auVar192._4_4_ = fVar211 * auVar203._4_4_;
  fVar212 = auVar158._8_4_;
  auVar192._8_4_ = fVar212 * auVar203._8_4_;
  fVar213 = auVar158._12_4_;
  auVar192._12_4_ = fVar213 * auVar203._12_4_;
  auVar259._8_4_ = 0x3f800000;
  auVar259._0_8_ = 0x3f8000003f800000;
  auVar259._12_4_ = 0x3f800000;
  auVar203 = vsubps_avx(auVar259,auVar192);
  fVar191 = fVar191 + fVar191 * auVar203._0_4_;
  fVar211 = fVar211 + fVar211 * auVar203._4_4_;
  fVar212 = fVar212 + fVar212 * auVar203._8_4_;
  fVar213 = fVar213 + fVar213 * auVar203._12_4_;
  auVar203 = vrcpps_avx(auVar223);
  fVar215 = auVar203._0_4_;
  auVar240._0_4_ = fVar215 * auVar223._0_4_;
  fVar235 = auVar203._4_4_;
  auVar240._4_4_ = fVar235 * auVar223._4_4_;
  fVar236 = auVar203._8_4_;
  auVar240._8_4_ = fVar236 * auVar223._8_4_;
  fVar237 = auVar203._12_4_;
  auVar240._12_4_ = fVar237 * auVar223._12_4_;
  auVar203 = vsubps_avx(auVar259,auVar240);
  fVar215 = fVar215 + fVar215 * auVar203._0_4_;
  fVar235 = fVar235 + fVar235 * auVar203._4_4_;
  fVar236 = fVar236 + fVar236 * auVar203._8_4_;
  fVar237 = fVar237 + fVar237 * auVar203._12_4_;
  auVar203 = vrcpps_avx(auVar104);
  fVar238 = auVar203._0_4_;
  auVar281._0_4_ = fVar238 * auVar104._0_4_;
  fVar248 = auVar203._4_4_;
  auVar281._4_4_ = fVar248 * auVar104._4_4_;
  fVar250 = auVar203._8_4_;
  auVar281._8_4_ = fVar250 * auVar104._8_4_;
  fVar252 = auVar203._12_4_;
  auVar281._12_4_ = fVar252 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar259,auVar281);
  fVar238 = fVar238 + fVar238 * auVar104._0_4_;
  fVar248 = fVar248 + fVar248 * auVar104._4_4_;
  fVar250 = fVar250 + fVar250 * auVar104._8_4_;
  fVar252 = fVar252 + fVar252 * auVar104._12_4_;
  auVar104 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar88 + 0x16)) * *(float *)(prim + lVar88 + 0x1a)));
  auVar223 = vshufps_avx(auVar104,auVar104,0);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar104 = vpmovsxwd_avx(auVar104);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar82 * 0xb + 6);
  auVar203 = vpmovsxwd_avx(auVar203);
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar158 = vsubps_avx(auVar203,auVar104);
  fVar117 = auVar223._0_4_;
  fVar142 = auVar223._4_4_;
  fVar144 = auVar223._8_4_;
  fVar147 = auVar223._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar203 = vpmovsxwd_avx(auVar223);
  auVar282._0_4_ = auVar158._0_4_ * fVar117 + auVar104._0_4_;
  auVar282._4_4_ = auVar158._4_4_ * fVar142 + auVar104._4_4_;
  auVar282._8_4_ = auVar158._8_4_ * fVar144 + auVar104._8_4_;
  auVar282._12_4_ = auVar158._12_4_ * fVar147 + auVar104._12_4_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar82 * 0xd + 6);
  auVar223 = vpmovsxwd_avx(auVar158);
  auVar104 = vcvtdq2ps_avx(auVar203);
  auVar203 = vcvtdq2ps_avx(auVar223);
  auVar203 = vsubps_avx(auVar203,auVar104);
  auVar300._0_4_ = auVar203._0_4_ * fVar117 + auVar104._0_4_;
  auVar300._4_4_ = auVar203._4_4_ * fVar142 + auVar104._4_4_;
  auVar300._8_4_ = auVar203._8_4_ * fVar144 + auVar104._8_4_;
  auVar300._12_4_ = auVar203._12_4_ * fVar147 + auVar104._12_4_;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar82 * 0x12 + 6);
  auVar104 = vpmovsxwd_avx(auVar100);
  uVar90 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar82 * 2 + uVar90 + 6);
  auVar203 = vpmovsxwd_avx(auVar99);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar203 = vsubps_avx(auVar203,auVar104);
  auVar323._0_4_ = auVar203._0_4_ * fVar117 + auVar104._0_4_;
  auVar323._4_4_ = auVar203._4_4_ * fVar142 + auVar104._4_4_;
  auVar323._8_4_ = auVar203._8_4_ * fVar144 + auVar104._8_4_;
  auVar323._12_4_ = auVar203._12_4_ * fVar147 + auVar104._12_4_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar90 + 6);
  auVar104 = vpmovsxwd_avx(auVar126);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar82 * 0x18 + 6);
  auVar203 = vpmovsxwd_avx(auVar102);
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar223 = vsubps_avx(auVar203,auVar104);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar82 * 0x1d + 6);
  auVar203 = vpmovsxwd_avx(auVar18);
  auVar351._0_4_ = auVar223._0_4_ * fVar117 + auVar104._0_4_;
  auVar351._4_4_ = auVar223._4_4_ * fVar142 + auVar104._4_4_;
  auVar351._8_4_ = auVar223._8_4_ * fVar144 + auVar104._8_4_;
  auVar351._12_4_ = auVar223._12_4_ * fVar147 + auVar104._12_4_;
  auVar104 = vcvtdq2ps_avx(auVar203);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar82 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar203 = vpmovsxwd_avx(auVar19);
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar203 = vsubps_avx(auVar203,auVar104);
  auVar360._0_4_ = auVar203._0_4_ * fVar117 + auVar104._0_4_;
  auVar360._4_4_ = auVar203._4_4_ * fVar142 + auVar104._4_4_;
  auVar360._8_4_ = auVar203._8_4_ * fVar144 + auVar104._8_4_;
  auVar360._12_4_ = auVar203._12_4_ * fVar147 + auVar104._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar82) + 6);
  auVar104 = vpmovsxwd_avx(auVar20);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar82 * 0x23 + 6);
  auVar203 = vpmovsxwd_avx(auVar21);
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar203 = vsubps_avx(auVar203,auVar104);
  auVar260._0_4_ = auVar104._0_4_ + auVar203._0_4_ * fVar117;
  auVar260._4_4_ = auVar104._4_4_ + auVar203._4_4_ * fVar142;
  auVar260._8_4_ = auVar104._8_4_ + auVar203._8_4_ * fVar144;
  auVar260._12_4_ = auVar104._12_4_ + auVar203._12_4_ * fVar147;
  auVar104 = vsubps_avx(auVar282,auVar119);
  auVar283._0_4_ = fVar191 * auVar104._0_4_;
  auVar283._4_4_ = fVar211 * auVar104._4_4_;
  auVar283._8_4_ = fVar212 * auVar104._8_4_;
  auVar283._12_4_ = fVar213 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar300,auVar119);
  auVar120._0_4_ = fVar191 * auVar104._0_4_;
  auVar120._4_4_ = fVar211 * auVar104._4_4_;
  auVar120._8_4_ = fVar212 * auVar104._8_4_;
  auVar120._12_4_ = fVar213 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar323,auVar92);
  auVar193._0_4_ = fVar215 * auVar104._0_4_;
  auVar193._4_4_ = fVar235 * auVar104._4_4_;
  auVar193._8_4_ = fVar236 * auVar104._8_4_;
  auVar193._12_4_ = fVar237 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar351,auVar92);
  auVar93._0_4_ = fVar215 * auVar104._0_4_;
  auVar93._4_4_ = fVar235 * auVar104._4_4_;
  auVar93._8_4_ = fVar236 * auVar104._8_4_;
  auVar93._12_4_ = fVar237 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar360,auVar153);
  auVar217._0_4_ = fVar238 * auVar104._0_4_;
  auVar217._4_4_ = fVar248 * auVar104._4_4_;
  auVar217._8_4_ = fVar250 * auVar104._8_4_;
  auVar217._12_4_ = fVar252 * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar260,auVar153);
  auVar154._0_4_ = fVar238 * auVar104._0_4_;
  auVar154._4_4_ = fVar248 * auVar104._4_4_;
  auVar154._8_4_ = fVar250 * auVar104._8_4_;
  auVar154._12_4_ = fVar252 * auVar104._12_4_;
  auVar104 = vpminsd_avx(auVar283,auVar120);
  auVar203 = vpminsd_avx(auVar193,auVar93);
  auVar104 = vmaxps_avx(auVar104,auVar203);
  auVar203 = vpminsd_avx(auVar217,auVar154);
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar301._4_4_ = uVar8;
  auVar301._0_4_ = uVar8;
  auVar301._8_4_ = uVar8;
  auVar301._12_4_ = uVar8;
  auVar203 = vmaxps_avx(auVar203,auVar301);
  auVar104 = vmaxps_avx(auVar104,auVar203);
  local_4e0._0_4_ = auVar104._0_4_ * 0.99999964;
  local_4e0._4_4_ = auVar104._4_4_ * 0.99999964;
  local_4e0._8_4_ = auVar104._8_4_ * 0.99999964;
  local_4e0._12_4_ = auVar104._12_4_ * 0.99999964;
  auVar104 = vpmaxsd_avx(auVar283,auVar120);
  auVar203 = vpmaxsd_avx(auVar193,auVar93);
  auVar104 = vminps_avx(auVar104,auVar203);
  auVar203 = vpmaxsd_avx(auVar217,auVar154);
  fVar117 = (ray->super_RayK<1>).tfar;
  auVar155._4_4_ = fVar117;
  auVar155._0_4_ = fVar117;
  auVar155._8_4_ = fVar117;
  auVar155._12_4_ = fVar117;
  auVar203 = vminps_avx(auVar203,auVar155);
  auVar104 = vminps_avx(auVar104,auVar203);
  auVar94._0_4_ = auVar104._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar104._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar104._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar104._12_4_ * 1.0000004;
  auVar104 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar203 = vpcmpgtd_avx(auVar104,_DAT_01f7fcf0);
  auVar104 = vcmpps_avx(local_4e0,auVar94,2);
  auVar104 = vandps_avx(auVar104,auVar203);
  uVar80 = vmovmskps_avx(auVar104);
  if (uVar80 == 0) {
    return;
  }
  uVar80 = uVar80 & 0xff;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
LAB_00f8f6a7:
  lVar88 = 0;
  if (uVar80 != 0) {
    for (; (uVar80 >> lVar88 & 1) == 0; lVar88 = lVar88 + 1) {
    }
  }
  uVar86 = *(uint *)(prim + 2);
  pGVar13 = (context->scene->geometries).items[uVar86].ptr;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           (ulong)*(uint *)(prim + lVar88 * 4 + 6) *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar117 = (pGVar13->time_range).lower;
  fVar117 = pGVar13->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar117) /
            ((pGVar13->time_range).upper - fVar117));
  auVar104 = vroundss_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),9);
  auVar104 = vminss_avx(auVar104,ZEXT416((uint)(pGVar13->fnumTimeSegments + -1.0)));
  auVar104 = vmaxss_avx(ZEXT816(0) << 0x20,auVar104);
  fVar117 = fVar117 - auVar104._0_4_;
  _Var14 = pGVar13[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar87 = (long)(int)auVar104._0_4_ * 0x38;
  lVar15 = *(long *)(_Var14 + lVar87);
  lVar16 = *(long *)(_Var14 + 0x10 + lVar87);
  auVar104 = vshufps_avx(ZEXT416((uint)(1.0 - fVar117)),ZEXT416((uint)(1.0 - fVar117)),0);
  pfVar1 = (float *)(lVar15 + lVar16 * uVar82);
  fVar142 = auVar104._0_4_;
  fVar144 = auVar104._4_4_;
  fVar191 = auVar104._8_4_;
  fVar212 = auVar104._12_4_;
  pfVar2 = (float *)(lVar15 + lVar16 * (uVar82 + 1));
  pfVar3 = (float *)(lVar15 + lVar16 * (uVar82 + 2));
  pfVar4 = (float *)(lVar15 + lVar16 * (uVar82 + 3));
  lVar15 = *(long *)(_Var14 + 0x38 + lVar87);
  lVar16 = *(long *)(_Var14 + 0x48 + lVar87);
  auVar104 = vshufps_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),0);
  pfVar5 = (float *)(lVar15 + uVar82 * lVar16);
  fVar213 = auVar104._0_4_;
  fVar215 = auVar104._4_4_;
  fVar235 = auVar104._8_4_;
  fVar236 = auVar104._12_4_;
  pfVar6 = (float *)(lVar15 + (uVar82 + 1) * lVar16);
  pfVar7 = (float *)(lVar15 + (uVar82 + 2) * lVar16);
  auVar194._0_4_ = fVar213 * *pfVar5 + fVar142 * *pfVar1;
  auVar194._4_4_ = fVar215 * pfVar5[1] + fVar144 * pfVar1[1];
  auVar194._8_4_ = fVar235 * pfVar5[2] + fVar191 * pfVar1[2];
  auVar194._12_4_ = fVar236 * pfVar5[3] + fVar212 * pfVar1[3];
  auVar218._0_4_ = fVar142 * *pfVar2 + fVar213 * *pfVar6;
  auVar218._4_4_ = fVar144 * pfVar2[1] + fVar215 * pfVar6[1];
  auVar218._8_4_ = fVar191 * pfVar2[2] + fVar235 * pfVar6[2];
  auVar218._12_4_ = fVar212 * pfVar2[3] + fVar236 * pfVar6[3];
  auVar241._0_4_ = fVar142 * *pfVar3 + fVar213 * *pfVar7;
  auVar241._4_4_ = fVar144 * pfVar3[1] + fVar215 * pfVar7[1];
  auVar241._8_4_ = fVar191 * pfVar3[2] + fVar235 * pfVar7[2];
  auVar241._12_4_ = fVar212 * pfVar3[3] + fVar236 * pfVar7[3];
  auVar95._0_4_ = (auVar194._0_4_ + auVar218._0_4_) * 0.5;
  auVar95._4_4_ = (auVar194._4_4_ + auVar218._4_4_) * 0.5;
  auVar95._8_4_ = (auVar194._8_4_ + auVar218._8_4_) * 0.5;
  auVar95._12_4_ = (auVar194._12_4_ + auVar218._12_4_) * 0.5;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar104 = vsubps_avx(auVar95,(undefined1  [16])aVar10);
  auVar104 = vdpps_avx(auVar104,(undefined1  [16])aVar11,0x7f);
  auVar203 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar223 = vrcpss_avx(auVar203,auVar203);
  fVar117 = auVar223._0_4_ * (2.0 - auVar203._0_4_ * auVar223._0_4_) * auVar104._0_4_;
  local_770 = ZEXT416((uint)fVar117);
  auVar203 = vshufps_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),0);
  fVar117 = aVar11.x;
  fVar147 = aVar11.y;
  fVar211 = aVar11.z;
  aVar145 = aVar11.field_3;
  auVar284._0_4_ = fVar117 * auVar203._0_4_ + aVar10.x;
  auVar284._4_4_ = fVar147 * auVar203._4_4_ + aVar10.y;
  auVar284._8_4_ = fVar211 * auVar203._8_4_ + aVar10.z;
  auVar284._12_4_ = aVar145.w * auVar203._12_4_ + aVar10.field_3.w;
  auVar104 = vblendps_avx(auVar284,_DAT_01f7aa10,8);
  _local_950 = vsubps_avx(auVar194,auVar104);
  auVar306 = ZEXT1664(_local_950);
  pfVar1 = (float *)(lVar15 + lVar16 * (uVar82 + 3));
  _local_960 = vsubps_avx(auVar241,auVar104);
  auVar156._0_4_ = fVar142 * *pfVar4 + fVar213 * *pfVar1;
  auVar156._4_4_ = fVar144 * pfVar4[1] + fVar215 * pfVar1[1];
  auVar156._8_4_ = fVar191 * pfVar4[2] + fVar235 * pfVar1[2];
  auVar156._12_4_ = fVar212 * pfVar4[3] + fVar236 * pfVar1[3];
  _local_970 = vsubps_avx(auVar218,auVar104);
  _local_980 = vsubps_avx(auVar156,auVar104);
  auVar104 = vshufps_avx(_local_950,_local_950,0);
  register0x00001290 = auVar104;
  _local_2c0 = auVar104;
  auVar104 = vshufps_avx(_local_950,_local_950,0x55);
  register0x00001290 = auVar104;
  _local_1e0 = auVar104;
  auVar104 = vshufps_avx(_local_950,_local_950,0xaa);
  register0x00001290 = auVar104;
  _local_200 = auVar104;
  auVar104 = vshufps_avx(_local_950,_local_950,0xff);
  register0x00001290 = auVar104;
  _local_220 = auVar104;
  auVar104 = vshufps_avx(_local_970,_local_970,0);
  local_3a0._16_16_ = auVar104;
  local_3a0._0_16_ = auVar104;
  auVar104 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar104;
  _local_2e0 = auVar104;
  auVar104 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001290 = auVar104;
  _local_300 = auVar104;
  auVar121._0_4_ = fVar117 * fVar117;
  auVar121._4_4_ = fVar147 * fVar147;
  auVar121._8_4_ = fVar211 * fVar211;
  auVar121._12_4_ = aVar145.w * aVar145.w;
  auVar104 = vshufps_avx(auVar121,auVar121,0xaa);
  auVar223 = vshufps_avx(auVar121,auVar121,0x55);
  auVar158 = vshufps_avx(_local_970,_local_970,0xff);
  register0x000012d0 = auVar158;
  _local_240 = auVar158;
  auVar158 = vshufps_avx(auVar121,auVar121,0);
  local_260._0_4_ = auVar158._0_4_ + auVar223._0_4_ + auVar104._0_4_;
  local_260._4_4_ = auVar158._4_4_ + auVar223._4_4_ + auVar104._4_4_;
  local_260._8_4_ = auVar158._8_4_ + auVar223._8_4_ + auVar104._8_4_;
  local_260._12_4_ = auVar158._12_4_ + auVar223._12_4_ + auVar104._12_4_;
  local_260._16_4_ = auVar158._0_4_ + auVar223._0_4_ + auVar104._0_4_;
  local_260._20_4_ = auVar158._4_4_ + auVar223._4_4_ + auVar104._4_4_;
  local_260._24_4_ = auVar158._8_4_ + auVar223._8_4_ + auVar104._8_4_;
  local_260._28_4_ = auVar158._12_4_ + auVar223._12_4_ + auVar104._12_4_;
  auVar104 = vshufps_avx(_local_960,_local_960,0);
  register0x00001550 = auVar104;
  _local_8e0 = auVar104;
  auVar386 = ZEXT3264(_local_8e0);
  auVar104 = vshufps_avx(_local_960,_local_960,0x55);
  register0x00001250 = auVar104;
  _local_320 = auVar104;
  auVar104 = vshufps_avx(_local_960,_local_960,0xaa);
  register0x00001250 = auVar104;
  _local_340 = auVar104;
  auVar104 = vshufps_avx(_local_960,_local_960,0xff);
  register0x00001250 = auVar104;
  _local_360 = auVar104;
  auVar104 = vshufps_avx(_local_980,_local_980,0);
  register0x000014d0 = auVar104;
  _local_900 = auVar104;
  auVar366 = ZEXT3264(_local_900);
  auVar104 = vshufps_avx(_local_980,_local_980,0x55);
  auVar223 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar223;
  _local_380 = auVar223;
  auVar223 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar223;
  _local_280 = auVar223;
  register0x00001210 = auVar203;
  _local_680 = auVar203;
  local_aec = 1;
  uVar90 = 0;
  local_3c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_3bc = local_3c0;
  fStack_3b8 = local_3c0;
  fStack_3b4 = local_3c0;
  fStack_3b0 = local_3c0;
  fStack_3ac = local_3c0;
  fStack_3a8 = local_3c0;
  fStack_3a4 = local_3c0;
  local_3e0 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  local_700 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  local_420 = vandps_avx(local_260,auVar106);
  local_4d0 = ZEXT816(0x3f80000000000000);
  uVar82 = (ulong)*(uint *)(prim + lVar88 * 4 + 6);
  do {
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = 0x3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar229._16_4_ = 0x3f800000;
    auVar229._20_4_ = 0x3f800000;
    iVar89 = (int)uVar90;
    auVar229._24_4_ = 0x3f800000;
    auVar229._28_4_ = 0x3f800000;
    auVar203 = vmovshdup_avx(local_4d0);
    auVar158 = vsubps_avx(auVar203,local_4d0);
    auVar203 = vshufps_avx(local_4d0,local_4d0,0);
    local_7a0._16_16_ = auVar203;
    local_7a0._0_16_ = auVar203;
    auVar223 = vshufps_avx(auVar158,auVar158,0);
    local_6c0._16_16_ = auVar223;
    local_6c0._0_16_ = auVar223;
    fVar116 = auVar223._0_4_;
    fVar141 = auVar223._4_4_;
    fVar143 = auVar223._8_4_;
    fVar146 = auVar223._12_4_;
    fVar91 = auVar203._0_4_;
    auVar206._0_4_ = fVar91 + fVar116 * 0.0;
    fVar113 = auVar203._4_4_;
    auVar206._4_4_ = fVar113 + fVar141 * 0.14285715;
    fVar114 = auVar203._8_4_;
    auVar206._8_4_ = fVar114 + fVar143 * 0.2857143;
    fVar115 = auVar203._12_4_;
    auVar206._12_4_ = fVar115 + fVar146 * 0.42857146;
    auVar206._16_4_ = fVar91 + fVar116 * 0.5714286;
    auVar206._20_4_ = fVar113 + fVar141 * 0.71428573;
    auVar206._24_4_ = fVar114 + fVar143 * 0.8571429;
    auVar206._28_4_ = fVar115 + fVar146;
    auVar105 = vsubps_avx(auVar229,auVar206);
    local_a20._4_4_ = auVar206._4_4_ * auVar206._4_4_;
    local_a20._0_4_ = auVar206._0_4_ * auVar206._0_4_;
    fStack_a18 = auVar206._8_4_ * auVar206._8_4_;
    fStack_a14 = auVar206._12_4_ * auVar206._12_4_;
    fStack_a10 = auVar206._16_4_ * auVar206._16_4_;
    fStack_a0c = auVar206._20_4_ * auVar206._20_4_;
    fStack_a08 = auVar206._24_4_ * auVar206._24_4_;
    fStack_a04 = fVar115;
    fVar235 = auVar206._0_4_ * 3.0;
    fVar236 = auVar206._4_4_ * 3.0;
    fVar237 = auVar206._8_4_ * 3.0;
    fVar238 = auVar206._12_4_ * 3.0;
    fVar248 = auVar206._16_4_ * 3.0;
    fVar250 = auVar206._20_4_ * 3.0;
    fVar252 = auVar206._24_4_ * 3.0;
    fVar142 = auVar105._0_4_;
    auVar140._0_4_ = fVar142 * fVar142;
    fVar144 = auVar105._4_4_;
    auVar140._4_4_ = fVar144 * fVar144;
    fVar147 = auVar105._8_4_;
    auVar140._8_4_ = fVar147 * fVar147;
    fVar191 = auVar105._12_4_;
    auVar140._12_4_ = fVar191 * fVar191;
    fVar211 = auVar105._16_4_;
    auVar140._16_4_ = fVar211 * fVar211;
    fVar212 = auVar105._20_4_;
    auVar140._20_4_ = fVar212 * fVar212;
    fVar213 = auVar105._24_4_;
    auVar140._28_36_ = auVar306._28_36_;
    auVar140._24_4_ = fVar213 * fVar213;
    fVar215 = auVar105._28_4_;
    fVar239 = (auVar140._0_4_ * (fVar142 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar249 = (auVar140._4_4_ * (fVar144 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar251 = (auVar140._8_4_ * (fVar147 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar253 = (auVar140._12_4_ * (fVar191 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar254 = (auVar140._16_4_ * (fVar211 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar255 = (auVar140._20_4_ * (fVar212 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar256 = (auVar140._24_4_ * (fVar213 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar319 = -fVar142 * auVar206._0_4_ * auVar206._0_4_ * 0.5;
    fVar325 = -fVar144 * auVar206._4_4_ * auVar206._4_4_ * 0.5;
    fVar329 = -fVar147 * auVar206._8_4_ * auVar206._8_4_ * 0.5;
    fVar333 = -fVar191 * auVar206._12_4_ * auVar206._12_4_ * 0.5;
    fVar337 = -fVar211 * auVar206._16_4_ * auVar206._16_4_ * 0.5;
    fVar341 = -fVar212 * auVar206._20_4_ * auVar206._20_4_ * 0.5;
    fVar345 = -fVar213 * auVar206._24_4_ * auVar206._24_4_ * 0.5;
    fVar368 = auVar104._0_4_;
    fVar373 = auVar104._4_4_;
    fVar359 = auVar104._8_4_;
    fVar376 = auVar104._12_4_;
    fVar117 = auVar386._28_4_;
    fVar367 = auVar366._28_4_ + fVar117;
    fVar381 = (auVar206._0_4_ * auVar206._0_4_ * (fVar235 + -5.0) + 2.0) * 0.5;
    fVar387 = (auVar206._4_4_ * auVar206._4_4_ * (fVar236 + -5.0) + 2.0) * 0.5;
    fVar388 = (auVar206._8_4_ * auVar206._8_4_ * (fVar237 + -5.0) + 2.0) * 0.5;
    fVar389 = (auVar206._12_4_ * auVar206._12_4_ * (fVar238 + -5.0) + 2.0) * 0.5;
    fVar390 = (auVar206._16_4_ * auVar206._16_4_ * (fVar248 + -5.0) + 2.0) * 0.5;
    fVar391 = (auVar206._20_4_ * auVar206._20_4_ * (fVar250 + -5.0) + 2.0) * 0.5;
    fVar392 = (auVar206._24_4_ * auVar206._24_4_ * (fVar252 + -5.0) + 2.0) * 0.5;
    fVar369 = -auVar206._0_4_ * fVar142 * fVar142 * 0.5;
    fVar374 = -auVar206._4_4_ * fVar144 * fVar144 * 0.5;
    fVar375 = -auVar206._8_4_ * fVar147 * fVar147 * 0.5;
    fVar377 = -auVar206._12_4_ * fVar191 * fVar191 * 0.5;
    fVar378 = -auVar206._16_4_ * fVar211 * fVar211 * 0.5;
    fVar379 = -auVar206._20_4_ * fVar212 * fVar212 * 0.5;
    fVar380 = -auVar206._24_4_ * fVar213 * fVar213 * 0.5;
    local_8a0 = fVar369 * (float)local_2c0._0_4_ +
                local_3a0._0_4_ * fVar381 + auVar366._0_4_ * fVar319 + auVar386._0_4_ * fVar239;
    fStack_89c = fVar374 * (float)local_2c0._4_4_ +
                 local_3a0._4_4_ * fVar387 + auVar366._4_4_ * fVar325 + auVar386._4_4_ * fVar249;
    fStack_898 = fVar375 * fStack_2b8 +
                 local_3a0._8_4_ * fVar388 + auVar366._8_4_ * fVar329 + auVar386._8_4_ * fVar251;
    aStack_894.w = fVar377 * fStack_2b4 +
                   local_3a0._12_4_ * fVar389 +
                   auVar366._12_4_ * fVar333 + auVar386._12_4_ * fVar253;
    fStack_890 = fVar378 * fStack_2b0 +
                 local_3a0._16_4_ * fVar390 + auVar366._16_4_ * fVar337 + auVar386._16_4_ * fVar254;
    fStack_88c = fVar379 * fStack_2ac +
                 local_3a0._20_4_ * fVar391 + auVar366._20_4_ * fVar341 + auVar386._20_4_ * fVar255;
    fStack_888 = fVar380 * fStack_2a8 +
                 local_3a0._24_4_ * fVar392 + auVar366._24_4_ * fVar345 + auVar386._24_4_ * fVar256;
    fStack_884 = fVar117 + 2.0 + -fVar215 + fVar117 + -0.0;
    fVar320 = (float)local_1e0._0_4_ * fVar369 +
              fVar381 * (float)local_2e0._0_4_ +
              fVar368 * fVar319 + fVar239 * (float)local_320._0_4_;
    fVar326 = (float)local_1e0._4_4_ * fVar374 +
              fVar387 * (float)local_2e0._4_4_ +
              fVar373 * fVar325 + fVar249 * (float)local_320._4_4_;
    fVar330 = fStack_1d8 * fVar375 + fVar388 * fStack_2d8 + fVar359 * fVar329 + fVar251 * fStack_318
    ;
    fVar334 = fStack_1d4 * fVar377 + fVar389 * fStack_2d4 + fVar376 * fVar333 + fVar253 * fStack_314
    ;
    fVar338 = fStack_1d0 * fVar378 + fVar390 * fStack_2d0 + fVar368 * fVar337 + fVar254 * fStack_310
    ;
    fVar342 = fStack_1cc * fVar379 + fVar391 * fStack_2cc + fVar373 * fVar341 + fVar255 * fStack_30c
    ;
    fVar346 = fStack_1c8 * fVar380 + fVar392 * fStack_2c8 + fVar359 * fVar345 + fVar256 * fStack_308
    ;
    fVar349 = fStack_884 + fVar117 + -0.0 + fVar367;
    fVar150 = (float)local_200._0_4_ * fVar369 +
              fVar381 * (float)local_300._0_4_ +
              fVar319 * (float)local_380._0_4_ + fVar239 * (float)local_340._0_4_;
    fVar172 = (float)local_200._4_4_ * fVar374 +
              fVar387 * (float)local_300._4_4_ +
              fVar325 * (float)local_380._4_4_ + fVar249 * (float)local_340._4_4_;
    fVar175 = fStack_1f8 * fVar375 +
              fVar388 * fStack_2f8 + fVar329 * fStack_378 + fVar251 * fStack_338;
    fVar178 = fStack_1f4 * fVar377 +
              fVar389 * fStack_2f4 + fVar333 * fStack_374 + fVar253 * fStack_334;
    fVar181 = fStack_1f0 * fVar378 +
              fVar390 * fStack_2f0 + fVar337 * fStack_370 + fVar254 * fStack_330;
    fVar184 = fStack_1ec * fVar379 +
              fVar391 * fStack_2ec + fVar341 * fStack_36c + fVar255 * fStack_32c;
    fVar187 = fStack_1e8 * fVar380 +
              fVar392 * fStack_2e8 + fVar345 * fStack_368 + fVar256 * fStack_328;
    fVar190 = fVar349 + fVar367 + fVar376 + fVar117;
    local_6e0._0_4_ =
         (float)local_220._0_4_ * fVar369 +
         (float)local_240._0_4_ * fVar381 +
         fVar319 * (float)local_280._0_4_ + fVar239 * (float)local_360._0_4_;
    local_6e0._4_4_ =
         (float)local_220._4_4_ * fVar374 +
         (float)local_240._4_4_ * fVar387 +
         fVar325 * (float)local_280._4_4_ + fVar249 * (float)local_360._4_4_;
    local_6e0._8_4_ =
         fStack_218 * fVar375 + fStack_238 * fVar388 + fVar329 * fStack_278 + fVar251 * fStack_358;
    local_6e0._12_4_ =
         fStack_214 * fVar377 + fStack_234 * fVar389 + fVar333 * fStack_274 + fVar253 * fStack_354;
    local_6e0._16_4_ =
         fStack_210 * fVar378 + fStack_230 * fVar390 + fVar337 * fStack_270 + fVar254 * fStack_350;
    local_6e0._20_4_ =
         fStack_20c * fVar379 + fStack_22c * fVar391 + fVar341 * fStack_26c + fVar255 * fStack_34c;
    local_6e0._24_4_ =
         fStack_208 * fVar380 + fStack_228 * fVar392 + fVar345 * fStack_268 + fVar256 * fStack_348;
    local_6e0._28_4_ = fVar349 + fVar117 + 2.0 + -fVar215 + -3.0;
    fVar350 = fVar215 + fVar215;
    auVar244._4_4_ = (fVar144 + fVar144) * auVar206._4_4_;
    auVar244._0_4_ = (fVar142 + fVar142) * auVar206._0_4_;
    auVar244._8_4_ = (fVar147 + fVar147) * auVar206._8_4_;
    auVar244._12_4_ = (fVar191 + fVar191) * auVar206._12_4_;
    auVar244._16_4_ = (fVar211 + fVar211) * auVar206._16_4_;
    auVar244._20_4_ = (fVar212 + fVar212) * auVar206._20_4_;
    auVar244._24_4_ = (fVar213 + fVar213) * auVar206._24_4_;
    auVar244._28_4_ = auVar206._28_4_ + auVar206._28_4_;
    auVar105 = vsubps_avx(auVar244,auVar140._0_32_);
    auVar365._4_4_ = (fVar144 + fVar144) * (fVar236 + 2.0);
    auVar365._0_4_ = (fVar142 + fVar142) * (fVar235 + 2.0);
    auVar365._8_4_ = (fVar147 + fVar147) * (fVar237 + 2.0);
    auVar365._12_4_ = (fVar191 + fVar191) * (fVar238 + 2.0);
    auVar365._16_4_ = (fVar211 + fVar211) * (fVar248 + 2.0);
    auVar365._20_4_ = (fVar212 + fVar212) * (fVar250 + 2.0);
    auVar365._24_4_ = (fVar213 + fVar213) * (fVar252 + 2.0);
    auVar365._28_4_ = 0x40400000;
    auVar22._4_4_ = fVar144 * fVar144 * 3.0;
    auVar22._0_4_ = fVar142 * fVar142 * 3.0;
    auVar22._8_4_ = fVar147 * fVar147 * 3.0;
    auVar22._12_4_ = fVar191 * fVar191 * 3.0;
    auVar22._16_4_ = fVar211 * fVar211 * 3.0;
    auVar22._20_4_ = fVar212 * fVar212 * 3.0;
    auVar22._24_4_ = fVar213 * fVar213 * 3.0;
    auVar22._28_4_ = fVar215;
    auVar106 = vsubps_avx(auVar365,auVar22);
    auVar244 = vsubps_avx(_local_a20,auVar244);
    fVar329 = auVar105._0_4_ * 0.5;
    fVar333 = auVar105._4_4_ * 0.5;
    fVar337 = auVar105._8_4_ * 0.5;
    fVar341 = auVar105._12_4_ * 0.5;
    fVar345 = auVar105._16_4_ * 0.5;
    fVar367 = auVar105._20_4_ * 0.5;
    fVar369 = auVar105._24_4_ * 0.5;
    fVar249 = (auVar206._0_4_ * fVar235 + (auVar206._0_4_ + auVar206._0_4_) * (fVar235 + -5.0)) *
              0.5;
    fVar253 = (auVar206._4_4_ * fVar236 + (auVar206._4_4_ + auVar206._4_4_) * (fVar236 + -5.0)) *
              0.5;
    fVar254 = (auVar206._8_4_ * fVar237 + (auVar206._8_4_ + auVar206._8_4_) * (fVar237 + -5.0)) *
              0.5;
    fVar255 = (auVar206._12_4_ * fVar238 + (auVar206._12_4_ + auVar206._12_4_) * (fVar238 + -5.0)) *
              0.5;
    fVar256 = (auVar206._16_4_ * fVar248 + (auVar206._16_4_ + auVar206._16_4_) * (fVar248 + -5.0)) *
              0.5;
    fVar319 = (auVar206._20_4_ * fVar250 + (auVar206._20_4_ + auVar206._20_4_) * (fVar250 + -5.0)) *
              0.5;
    fVar325 = (auVar206._24_4_ * fVar252 + (auVar206._24_4_ + auVar206._24_4_) * (fVar252 + -5.0)) *
              0.5;
    fVar117 = auVar106._0_4_ * 0.5;
    fVar142 = auVar106._4_4_ * 0.5;
    fVar144 = auVar106._8_4_ * 0.5;
    fVar147 = auVar106._12_4_ * 0.5;
    fVar213 = auVar106._16_4_ * 0.5;
    fVar215 = auVar106._20_4_ * 0.5;
    fVar235 = auVar106._24_4_ * 0.5;
    fVar211 = auVar244._0_4_ * 0.5;
    fVar236 = auVar244._4_4_ * 0.5;
    fVar238 = auVar244._8_4_ * 0.5;
    fVar248 = auVar244._12_4_ * 0.5;
    fVar250 = auVar244._16_4_ * 0.5;
    fVar252 = auVar244._20_4_ * 0.5;
    fVar251 = auVar244._24_4_ * 0.5;
    auVar203 = vpermilps_avx(ZEXT416((uint)(auVar158._0_4_ * 0.04761905)),0);
    fVar191 = auVar203._0_4_;
    fVar297 = fVar191 * (fVar329 * (float)local_2c0._0_4_ +
                        fVar249 * local_3a0._0_4_ +
                        fVar117 * (float)local_8e0._0_4_ + fVar211 * (float)local_900._0_4_);
    fVar212 = auVar203._4_4_;
    fVar307 = fVar212 * (fVar333 * (float)local_2c0._4_4_ +
                        fVar253 * local_3a0._4_4_ +
                        fVar142 * (float)local_8e0._4_4_ + fVar236 * (float)local_900._4_4_);
    local_800._4_4_ = fVar307;
    local_800._0_4_ = fVar297;
    fVar237 = auVar203._8_4_;
    fVar309 = fVar237 * (fVar337 * fStack_2b8 +
                        fVar254 * local_3a0._8_4_ + fVar144 * fStack_8d8 + fVar238 * fStack_8f8);
    local_800._8_4_ = fVar309;
    fVar239 = auVar203._12_4_;
    fVar311 = fVar239 * (fVar341 * fStack_2b4 +
                        fVar255 * local_3a0._12_4_ + fVar147 * fStack_8d4 + fVar248 * fStack_8f4);
    local_800._12_4_ = fVar311;
    fVar313 = fVar191 * (fVar345 * fStack_2b0 +
                        fVar256 * local_3a0._16_4_ + fVar213 * fStack_8d0 + fVar250 * fStack_8f0);
    local_800._16_4_ = fVar313;
    fVar315 = fVar212 * (fVar367 * fStack_2ac +
                        fVar319 * local_3a0._20_4_ + fVar215 * fStack_8cc + fVar252 * fStack_8ec);
    local_800._20_4_ = fVar315;
    fVar317 = fVar237 * (fVar369 * fStack_2a8 +
                        fVar325 * local_3a0._24_4_ + fVar235 * fStack_8c8 + fVar251 * fStack_8e8);
    local_800._24_4_ = fVar317;
    local_800._28_4_ = fVar350 + auVar105._28_4_;
    fVar151 = fVar191 * ((float)local_1e0._0_4_ * fVar329 +
                        fVar249 * (float)local_2e0._0_4_ +
                        fVar117 * (float)local_320._0_4_ + fVar211 * fVar368);
    fVar173 = fVar212 * ((float)local_1e0._4_4_ * fVar333 +
                        fVar253 * (float)local_2e0._4_4_ +
                        fVar142 * (float)local_320._4_4_ + fVar236 * fVar373);
    local_820._4_4_ = fVar173;
    local_820._0_4_ = fVar151;
    fVar176 = fVar237 * (fStack_1d8 * fVar337 +
                        fVar254 * fStack_2d8 + fVar144 * fStack_318 + fVar238 * fVar359);
    local_820._8_4_ = fVar176;
    fVar179 = fVar239 * (fStack_1d4 * fVar341 +
                        fVar255 * fStack_2d4 + fVar147 * fStack_314 + fVar248 * fVar376);
    local_820._12_4_ = fVar179;
    fVar182 = fVar191 * (fStack_1d0 * fVar345 +
                        fVar256 * fStack_2d0 + fVar213 * fStack_310 + fVar250 * fVar368);
    local_820._16_4_ = fVar182;
    fVar185 = fVar212 * (fStack_1cc * fVar367 +
                        fVar319 * fStack_2cc + fVar215 * fStack_30c + fVar252 * fVar373);
    local_820._20_4_ = fVar185;
    fVar188 = fVar237 * (fStack_1c8 * fVar369 +
                        fVar325 * fStack_2c8 + fVar235 * fStack_308 + fVar251 * fVar359);
    local_820._24_4_ = fVar188;
    local_820._28_4_ = auVar206._28_4_ + -4.0 + auVar244._28_4_ + fVar350 + 0.5;
    fVar321 = fVar191 * ((float)local_200._0_4_ * fVar329 +
                        fVar117 * (float)local_340._0_4_ + fVar211 * (float)local_380._0_4_ +
                        fVar249 * (float)local_300._0_4_);
    fVar327 = fVar212 * ((float)local_200._4_4_ * fVar333 +
                        fVar142 * (float)local_340._4_4_ + fVar236 * (float)local_380._4_4_ +
                        fVar253 * (float)local_300._4_4_);
    local_9c0._4_4_ = fVar327;
    local_9c0._0_4_ = fVar321;
    fVar331 = fVar237 * (fStack_1f8 * fVar337 +
                        fVar144 * fStack_338 + fVar238 * fStack_378 + fVar254 * fStack_2f8);
    local_9c0._8_4_ = fVar331;
    fVar335 = fVar239 * (fStack_1f4 * fVar341 +
                        fVar147 * fStack_334 + fVar248 * fStack_374 + fVar255 * fStack_2f4);
    local_9c0._12_4_ = fVar335;
    fVar339 = fVar191 * (fStack_1f0 * fVar345 +
                        fVar213 * fStack_330 + fVar250 * fStack_370 + fVar256 * fStack_2f0);
    local_9c0._16_4_ = fVar339;
    fVar343 = fVar212 * (fStack_1ec * fVar367 +
                        fVar215 * fStack_32c + fVar252 * fStack_36c + fVar319 * fStack_2ec);
    local_9c0._20_4_ = fVar343;
    fVar347 = fVar237 * (fStack_1e8 * fVar369 +
                        fVar235 * fStack_328 + fVar251 * fStack_368 + fVar325 * fStack_2e8);
    local_9c0._24_4_ = fVar347;
    local_9c0._28_4_ = fVar350;
    fVar211 = fVar191 * ((float)local_220._0_4_ * fVar329 +
                        (float)local_240._0_4_ * fVar249 +
                        fVar117 * (float)local_360._0_4_ + (float)local_280._0_4_ * fVar211);
    fVar236 = fVar212 * ((float)local_220._4_4_ * fVar333 +
                        (float)local_240._4_4_ * fVar253 +
                        fVar142 * (float)local_360._4_4_ + (float)local_280._4_4_ * fVar236);
    auVar234._4_4_ = fVar236;
    auVar234._0_4_ = fVar211;
    fVar238 = fVar237 * (fStack_218 * fVar337 +
                        fStack_238 * fVar254 + fVar144 * fStack_358 + fStack_278 * fVar238);
    auVar234._8_4_ = fVar238;
    fVar249 = fVar239 * (fStack_214 * fVar341 +
                        fStack_234 * fVar255 + fVar147 * fStack_354 + fStack_274 * fVar248);
    auVar234._12_4_ = fVar249;
    fVar191 = fVar191 * (fStack_210 * fVar345 +
                        fStack_230 * fVar256 + fVar213 * fStack_350 + fStack_270 * fVar250);
    auVar234._16_4_ = fVar191;
    fVar212 = fVar212 * (fStack_20c * fVar367 +
                        fStack_22c * fVar319 + fVar215 * fStack_34c + fStack_26c * fVar252);
    auVar234._20_4_ = fVar212;
    fVar237 = fVar237 * (fStack_208 * fVar369 +
                        fStack_228 * fVar325 + fVar235 * fStack_348 + fStack_268 * fVar251);
    auVar234._24_4_ = fVar237;
    auVar234._28_4_ = fVar239;
    auVar72._4_4_ = fVar326;
    auVar72._0_4_ = fVar320;
    auVar72._8_4_ = fVar330;
    auVar72._12_4_ = fVar334;
    auVar72._16_4_ = fVar338;
    auVar72._20_4_ = fVar342;
    auVar72._24_4_ = fVar346;
    auVar72._28_4_ = fVar349;
    auVar105 = vperm2f128_avx(auVar72,auVar72,1);
    auVar105 = vshufps_avx(auVar105,auVar72,0x30);
    _local_920 = vshufps_avx(auVar72,auVar105,0x29);
    auVar70._4_4_ = fVar172;
    auVar70._0_4_ = fVar150;
    auVar70._8_4_ = fVar175;
    auVar70._12_4_ = fVar178;
    auVar70._16_4_ = fVar181;
    auVar70._20_4_ = fVar184;
    auVar70._24_4_ = fVar187;
    auVar70._28_4_ = fVar190;
    auVar105 = vperm2f128_avx(auVar70,auVar70,1);
    auVar105 = vshufps_avx(auVar105,auVar70,0x30);
    _local_a20 = vshufps_avx(auVar70,auVar105,0x29);
    auVar106 = vsubps_avx(local_6e0,auVar234);
    auVar105 = vperm2f128_avx(auVar106,auVar106,1);
    auVar105 = vshufps_avx(auVar105,auVar106,0x30);
    _local_7c0 = vshufps_avx(auVar106,auVar105,0x29);
    local_540 = vsubps_avx(_local_920,auVar72);
    local_520 = vsubps_avx(_local_a20,auVar70);
    fVar142 = local_540._0_4_;
    fVar213 = local_540._4_4_;
    auVar23._4_4_ = fVar327 * fVar213;
    auVar23._0_4_ = fVar321 * fVar142;
    fVar248 = local_540._8_4_;
    auVar23._8_4_ = fVar331 * fVar248;
    fVar253 = local_540._12_4_;
    auVar23._12_4_ = fVar335 * fVar253;
    fVar329 = local_540._16_4_;
    auVar23._16_4_ = fVar339 * fVar329;
    fVar369 = local_540._20_4_;
    auVar23._20_4_ = fVar343 * fVar369;
    fVar377 = local_540._24_4_;
    auVar23._24_4_ = fVar347 * fVar377;
    auVar23._28_4_ = auVar106._28_4_;
    fVar144 = local_520._0_4_;
    fVar215 = local_520._4_4_;
    auVar24._4_4_ = fVar173 * fVar215;
    auVar24._0_4_ = fVar151 * fVar144;
    fVar250 = local_520._8_4_;
    auVar24._8_4_ = fVar176 * fVar250;
    fVar254 = local_520._12_4_;
    auVar24._12_4_ = fVar179 * fVar254;
    fVar333 = local_520._16_4_;
    auVar24._16_4_ = fVar182 * fVar333;
    fVar368 = local_520._20_4_;
    auVar24._20_4_ = fVar185 * fVar368;
    fVar378 = local_520._24_4_;
    auVar24._24_4_ = fVar188 * fVar378;
    auVar24._28_4_ = auVar105._28_4_;
    auVar244 = vsubps_avx(auVar24,auVar23);
    auVar76._4_4_ = fStack_89c;
    auVar76._0_4_ = local_8a0;
    auVar76._8_4_ = fStack_898;
    auVar76._12_4_ = aStack_894;
    auVar76._16_4_ = fStack_890;
    auVar76._20_4_ = fStack_88c;
    auVar76._24_4_ = fStack_888;
    auVar76._28_4_ = fStack_884;
    auVar105 = vperm2f128_avx(auVar76,auVar76,1);
    auVar105 = vshufps_avx(auVar105,auVar76,0x30);
    local_9a0 = vshufps_avx(auVar76,auVar105,0x29);
    _local_560 = vsubps_avx(local_9a0,auVar76);
    auVar25._4_4_ = fVar307 * fVar215;
    auVar25._0_4_ = fVar297 * fVar144;
    auVar25._8_4_ = fVar309 * fVar250;
    auVar25._12_4_ = fVar311 * fVar254;
    auVar25._16_4_ = fVar313 * fVar333;
    auVar25._20_4_ = fVar315 * fVar368;
    auVar25._24_4_ = fVar317 * fVar378;
    auVar25._28_4_ = local_9a0._28_4_;
    fVar147 = local_560._0_4_;
    fVar235 = local_560._4_4_;
    auVar364._4_4_ = fVar327 * fVar235;
    auVar364._0_4_ = fVar321 * fVar147;
    fVar252 = local_560._8_4_;
    auVar364._8_4_ = fVar331 * fVar252;
    fVar255 = local_560._12_4_;
    auVar364._12_4_ = fVar335 * fVar255;
    fVar337 = local_560._16_4_;
    auVar364._16_4_ = fVar339 * fVar337;
    fVar373 = local_560._20_4_;
    auVar364._20_4_ = fVar343 * fVar373;
    fVar379 = local_560._24_4_;
    auVar364._24_4_ = fVar347 * fVar379;
    auVar364._28_4_ = fStack_884;
    auVar365 = vsubps_avx(auVar364,auVar25);
    auVar26._4_4_ = fVar235 * fVar173;
    auVar26._0_4_ = fVar147 * fVar151;
    auVar26._8_4_ = fVar252 * fVar176;
    auVar26._12_4_ = fVar255 * fVar179;
    auVar26._16_4_ = fVar337 * fVar182;
    auVar26._20_4_ = fVar373 * fVar185;
    auVar26._24_4_ = fVar379 * fVar188;
    auVar26._28_4_ = fStack_884;
    auVar27._4_4_ = fVar307 * fVar213;
    auVar27._0_4_ = fVar297 * fVar142;
    auVar27._8_4_ = fVar309 * fVar248;
    auVar27._12_4_ = fVar311 * fVar253;
    auVar27._16_4_ = fVar313 * fVar329;
    auVar27._20_4_ = fVar315 * fVar369;
    auVar27._24_4_ = fVar317 * fVar377;
    auVar27._28_4_ = fVar190;
    auVar22 = vsubps_avx(auVar27,auVar26);
    fVar117 = auVar22._28_4_;
    fVar251 = auVar365._28_4_ + fVar117;
    auVar207._0_4_ = fVar147 * fVar147 + fVar142 * fVar142 + fVar144 * fVar144;
    auVar207._4_4_ = fVar235 * fVar235 + fVar213 * fVar213 + fVar215 * fVar215;
    auVar207._8_4_ = fVar252 * fVar252 + fVar248 * fVar248 + fVar250 * fVar250;
    auVar207._12_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar254 * fVar254;
    auVar207._16_4_ = fVar337 * fVar337 + fVar329 * fVar329 + fVar333 * fVar333;
    auVar207._20_4_ = fVar373 * fVar373 + fVar369 * fVar369 + fVar368 * fVar368;
    auVar207._24_4_ = fVar379 * fVar379 + fVar377 * fVar377 + fVar378 * fVar378;
    auVar207._28_4_ = fVar117 + fVar117 + fVar251;
    auVar105 = vrcpps_avx(auVar207);
    fVar256 = auVar105._0_4_;
    fVar319 = auVar105._4_4_;
    auVar28._4_4_ = fVar319 * auVar207._4_4_;
    auVar28._0_4_ = fVar256 * auVar207._0_4_;
    fVar325 = auVar105._8_4_;
    auVar28._8_4_ = fVar325 * auVar207._8_4_;
    fVar341 = auVar105._12_4_;
    auVar28._12_4_ = fVar341 * auVar207._12_4_;
    fVar345 = auVar105._16_4_;
    auVar28._16_4_ = fVar345 * auVar207._16_4_;
    fVar367 = auVar105._20_4_;
    auVar28._20_4_ = fVar367 * auVar207._20_4_;
    fVar374 = auVar105._24_4_;
    auVar28._24_4_ = fVar374 * auVar207._24_4_;
    auVar28._28_4_ = fVar190;
    auVar361._8_4_ = 0x3f800000;
    auVar361._0_8_ = 0x3f8000003f800000;
    auVar361._12_4_ = 0x3f800000;
    auVar361._16_4_ = 0x3f800000;
    auVar361._20_4_ = 0x3f800000;
    auVar361._24_4_ = 0x3f800000;
    auVar361._28_4_ = 0x3f800000;
    auVar234 = vsubps_avx(auVar361,auVar28);
    fVar256 = auVar234._0_4_ * fVar256 + fVar256;
    fVar319 = auVar234._4_4_ * fVar319 + fVar319;
    fVar325 = auVar234._8_4_ * fVar325 + fVar325;
    fVar341 = auVar234._12_4_ * fVar341 + fVar341;
    fVar345 = auVar234._16_4_ * fVar345 + fVar345;
    fVar367 = auVar234._20_4_ * fVar367 + fVar367;
    fVar374 = auVar234._24_4_ * fVar374 + fVar374;
    auVar106 = vperm2f128_avx(local_820,local_820,1);
    auVar106 = vshufps_avx(auVar106,local_820,0x30);
    local_9e0 = vshufps_avx(local_820,auVar106,0x29);
    auVar106 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar106 = vshufps_avx(auVar106,local_9c0,0x30);
    _local_940 = vshufps_avx(local_9c0,auVar106,0x29);
    fVar322 = local_940._0_4_;
    fVar328 = local_940._4_4_;
    auVar29._4_4_ = fVar328 * fVar213;
    auVar29._0_4_ = fVar322 * fVar142;
    fVar332 = local_940._8_4_;
    auVar29._8_4_ = fVar332 * fVar248;
    fVar336 = local_940._12_4_;
    auVar29._12_4_ = fVar336 * fVar253;
    fVar340 = local_940._16_4_;
    auVar29._16_4_ = fVar340 * fVar329;
    fVar344 = local_940._20_4_;
    auVar29._20_4_ = fVar344 * fVar369;
    fVar348 = local_940._24_4_;
    auVar29._24_4_ = fVar348 * fVar377;
    auVar29._28_4_ = auVar106._28_4_;
    fVar152 = local_9e0._0_4_;
    fVar174 = local_9e0._4_4_;
    auVar30._4_4_ = fVar174 * fVar215;
    auVar30._0_4_ = fVar152 * fVar144;
    fVar177 = local_9e0._8_4_;
    auVar30._8_4_ = fVar177 * fVar250;
    fVar180 = local_9e0._12_4_;
    auVar30._12_4_ = fVar180 * fVar254;
    fVar183 = local_9e0._16_4_;
    auVar30._16_4_ = fVar183 * fVar333;
    fVar186 = local_9e0._20_4_;
    auVar30._20_4_ = fVar186 * fVar368;
    fVar189 = local_9e0._24_4_;
    auVar30._24_4_ = fVar189 * fVar378;
    auVar30._28_4_ = 0x3f800000;
    auVar23 = vsubps_avx(auVar30,auVar29);
    auVar106 = vperm2f128_avx(local_800,local_800,1);
    auVar106 = vshufps_avx(auVar106,local_800,0x30);
    local_6a0 = vshufps_avx(local_800,auVar106,0x29);
    fVar298 = local_6a0._0_4_;
    fVar308 = local_6a0._4_4_;
    auVar31._4_4_ = fVar308 * fVar215;
    auVar31._0_4_ = fVar298 * fVar144;
    fVar310 = local_6a0._8_4_;
    auVar31._8_4_ = fVar310 * fVar250;
    fVar312 = local_6a0._12_4_;
    auVar31._12_4_ = fVar312 * fVar254;
    fVar314 = local_6a0._16_4_;
    auVar31._16_4_ = fVar314 * fVar333;
    fVar316 = local_6a0._20_4_;
    auVar31._20_4_ = fVar316 * fVar368;
    fVar318 = local_6a0._24_4_;
    auVar31._24_4_ = fVar318 * fVar378;
    auVar31._28_4_ = auVar106._28_4_;
    auVar25 = _local_940;
    auVar32._4_4_ = fVar328 * fVar235;
    auVar32._0_4_ = fVar322 * fVar147;
    auVar32._8_4_ = fVar332 * fVar252;
    auVar32._12_4_ = fVar336 * fVar255;
    auVar32._16_4_ = fVar340 * fVar337;
    auVar32._20_4_ = fVar344 * fVar373;
    auVar32._24_4_ = fVar348 * fVar379;
    auVar32._28_4_ = -auVar206._28_4_;
    auVar24 = vsubps_avx(auVar32,auVar31);
    auVar33._4_4_ = fVar235 * fVar174;
    auVar33._0_4_ = fVar147 * fVar152;
    auVar33._8_4_ = fVar252 * fVar177;
    auVar33._12_4_ = fVar255 * fVar180;
    auVar33._16_4_ = fVar337 * fVar183;
    auVar33._20_4_ = fVar373 * fVar186;
    auVar33._24_4_ = fVar379 * fVar189;
    auVar33._28_4_ = -auVar206._28_4_;
    auVar34._4_4_ = fVar308 * fVar213;
    auVar34._0_4_ = fVar298 * fVar142;
    auVar34._8_4_ = fVar310 * fVar248;
    auVar34._12_4_ = fVar312 * fVar253;
    auVar34._16_4_ = fVar314 * fVar329;
    auVar34._20_4_ = fVar316 * fVar369;
    auVar34._24_4_ = fVar318 * fVar377;
    auVar34._28_4_ = fStack_1c4;
    auVar106 = vsubps_avx(auVar34,auVar33);
    fVar117 = auVar106._28_4_;
    auVar35._4_4_ =
         (auVar244._4_4_ * auVar244._4_4_ +
         auVar365._4_4_ * auVar365._4_4_ + auVar22._4_4_ * auVar22._4_4_) * fVar319;
    auVar35._0_4_ =
         (auVar244._0_4_ * auVar244._0_4_ +
         auVar365._0_4_ * auVar365._0_4_ + auVar22._0_4_ * auVar22._0_4_) * fVar256;
    auVar35._8_4_ =
         (auVar244._8_4_ * auVar244._8_4_ +
         auVar365._8_4_ * auVar365._8_4_ + auVar22._8_4_ * auVar22._8_4_) * fVar325;
    auVar35._12_4_ =
         (auVar244._12_4_ * auVar244._12_4_ +
         auVar365._12_4_ * auVar365._12_4_ + auVar22._12_4_ * auVar22._12_4_) * fVar341;
    auVar35._16_4_ =
         (auVar244._16_4_ * auVar244._16_4_ +
         auVar365._16_4_ * auVar365._16_4_ + auVar22._16_4_ * auVar22._16_4_) * fVar345;
    auVar35._20_4_ =
         (auVar244._20_4_ * auVar244._20_4_ +
         auVar365._20_4_ * auVar365._20_4_ + auVar22._20_4_ * auVar22._20_4_) * fVar367;
    auVar35._24_4_ =
         (auVar244._24_4_ * auVar244._24_4_ +
         auVar365._24_4_ * auVar365._24_4_ + auVar22._24_4_ * auVar22._24_4_) * fVar374;
    auVar35._28_4_ = auVar244._28_4_ + fVar251;
    auVar36._4_4_ =
         (auVar23._4_4_ * auVar23._4_4_ +
         auVar24._4_4_ * auVar24._4_4_ + auVar106._4_4_ * auVar106._4_4_) * fVar319;
    auVar36._0_4_ =
         (auVar23._0_4_ * auVar23._0_4_ +
         auVar24._0_4_ * auVar24._0_4_ + auVar106._0_4_ * auVar106._0_4_) * fVar256;
    auVar36._8_4_ =
         (auVar23._8_4_ * auVar23._8_4_ +
         auVar24._8_4_ * auVar24._8_4_ + auVar106._8_4_ * auVar106._8_4_) * fVar325;
    auVar36._12_4_ =
         (auVar23._12_4_ * auVar23._12_4_ +
         auVar24._12_4_ * auVar24._12_4_ + auVar106._12_4_ * auVar106._12_4_) * fVar341;
    auVar36._16_4_ =
         (auVar23._16_4_ * auVar23._16_4_ +
         auVar24._16_4_ * auVar24._16_4_ + auVar106._16_4_ * auVar106._16_4_) * fVar345;
    auVar36._20_4_ =
         (auVar23._20_4_ * auVar23._20_4_ +
         auVar24._20_4_ * auVar24._20_4_ + auVar106._20_4_ * auVar106._20_4_) * fVar367;
    auVar36._24_4_ =
         (auVar23._24_4_ * auVar23._24_4_ +
         auVar24._24_4_ * auVar24._24_4_ + auVar106._24_4_ * auVar106._24_4_) * fVar374;
    auVar36._28_4_ = auVar234._28_4_ + auVar105._28_4_;
    auVar105 = vmaxps_avx(auVar35,auVar36);
    auVar106 = vperm2f128_avx(local_6e0,local_6e0,1);
    auVar106 = vshufps_avx(auVar106,local_6e0,0x30);
    local_760 = vshufps_avx(local_6e0,auVar106,0x29);
    local_720._0_4_ = (float)local_6e0._0_4_ + fVar211;
    local_720._4_4_ = local_6e0._4_4_ + fVar236;
    fStack_718 = local_6e0._8_4_ + fVar238;
    fStack_714 = local_6e0._12_4_ + fVar249;
    fStack_710 = local_6e0._16_4_ + fVar191;
    fStack_70c = local_6e0._20_4_ + fVar212;
    fStack_708 = local_6e0._24_4_ + fVar237;
    fStack_704 = local_6e0._28_4_ + fVar239;
    auVar106 = vmaxps_avx(local_6e0,_local_720);
    auVar244 = vmaxps_avx(_local_7c0,local_760);
    auVar106 = vmaxps_avx(auVar106,auVar244);
    auVar244 = vrsqrtps_avx(auVar207);
    fVar191 = auVar244._0_4_;
    fVar211 = auVar244._4_4_;
    fVar212 = auVar244._8_4_;
    fVar236 = auVar244._12_4_;
    fVar237 = auVar244._16_4_;
    fVar238 = auVar244._20_4_;
    fVar239 = auVar244._24_4_;
    auVar37._4_4_ = fVar211 * fVar211 * fVar211 * auVar207._4_4_ * 0.5;
    auVar37._0_4_ = fVar191 * fVar191 * fVar191 * auVar207._0_4_ * 0.5;
    auVar37._8_4_ = fVar212 * fVar212 * fVar212 * auVar207._8_4_ * 0.5;
    auVar37._12_4_ = fVar236 * fVar236 * fVar236 * auVar207._12_4_ * 0.5;
    auVar37._16_4_ = fVar237 * fVar237 * fVar237 * auVar207._16_4_ * 0.5;
    auVar37._20_4_ = fVar238 * fVar238 * fVar238 * auVar207._20_4_ * 0.5;
    auVar37._24_4_ = fVar239 * fVar239 * fVar239 * auVar207._24_4_ * 0.5;
    auVar37._28_4_ = auVar207._28_4_;
    auVar38._4_4_ = fVar211 * 1.5;
    auVar38._0_4_ = fVar191 * 1.5;
    auVar38._8_4_ = fVar212 * 1.5;
    auVar38._12_4_ = fVar236 * 1.5;
    auVar38._16_4_ = fVar237 * 1.5;
    auVar38._20_4_ = fVar238 * 1.5;
    auVar38._24_4_ = fVar239 * 1.5;
    auVar38._28_4_ = auVar244._28_4_;
    _local_740 = vsubps_avx(auVar38,auVar37);
    auVar73._4_4_ = fVar326;
    auVar73._0_4_ = fVar320;
    auVar73._8_4_ = fVar330;
    auVar73._12_4_ = fVar334;
    auVar73._16_4_ = fVar338;
    auVar73._20_4_ = fVar342;
    auVar73._24_4_ = fVar346;
    auVar73._28_4_ = fVar349;
    auVar244 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_8c0 = vsubps_avx(auVar244,auVar73);
    fVar214 = local_8c0._28_4_;
    auVar71._4_4_ = fVar172;
    auVar71._0_4_ = fVar150;
    auVar71._8_4_ = fVar175;
    auVar71._12_4_ = fVar178;
    auVar71._16_4_ = fVar181;
    auVar71._20_4_ = fVar184;
    auVar71._24_4_ = fVar187;
    auVar71._28_4_ = fVar190;
    local_7e0 = vsubps_avx(auVar244,auVar71);
    fVar191 = local_7e0._0_4_;
    fVar236 = local_7e0._4_4_;
    fVar239 = local_7e0._8_4_;
    fVar256 = local_7e0._12_4_;
    fVar341 = local_7e0._16_4_;
    fVar374 = local_7e0._20_4_;
    fVar380 = local_7e0._24_4_;
    fVar211 = local_8c0._0_4_;
    fVar237 = local_8c0._4_4_;
    fVar249 = local_8c0._8_4_;
    fVar319 = local_8c0._12_4_;
    fVar345 = local_8c0._16_4_;
    fVar359 = local_8c0._20_4_;
    fVar381 = local_8c0._24_4_;
    auVar77._4_4_ = fStack_89c;
    auVar77._0_4_ = local_8a0;
    auVar77._8_4_ = fStack_898;
    auVar77._12_4_ = aStack_894;
    auVar77._16_4_ = fStack_890;
    auVar77._20_4_ = fStack_88c;
    auVar77._24_4_ = fStack_888;
    auVar77._28_4_ = fStack_884;
    auVar244 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar77);
    fVar212 = auVar244._0_4_;
    fVar238 = auVar244._4_4_;
    fVar251 = auVar244._8_4_;
    fVar325 = auVar244._12_4_;
    fVar367 = auVar244._16_4_;
    fVar375 = auVar244._20_4_;
    fVar387 = auVar244._24_4_;
    auVar354._0_4_ = local_3c0 * fVar212 + local_3e0 * fVar211 + local_700 * fVar191;
    auVar354._4_4_ = fStack_3bc * fVar238 + fStack_3dc * fVar237 + fStack_6fc * fVar236;
    auVar354._8_4_ = fStack_3b8 * fVar251 + fStack_3d8 * fVar249 + fStack_6f8 * fVar239;
    auVar354._12_4_ = fStack_3b4 * fVar325 + fStack_3d4 * fVar319 + fStack_6f4 * fVar256;
    auVar354._16_4_ = fStack_3b0 * fVar367 + fStack_3d0 * fVar345 + fStack_6f0 * fVar341;
    auVar354._20_4_ = fStack_3ac * fVar375 + fStack_3cc * fVar359 + fStack_6ec * fVar374;
    auVar354._24_4_ = fStack_3a8 * fVar387 + fStack_3c8 * fVar381 + fStack_6e8 * fVar380;
    auVar354._28_4_ = fVar117 + auVar23._28_4_ + auVar24._28_4_ + fVar117 + local_760._28_4_;
    auVar371._0_4_ = fVar212 * fVar212 + fVar211 * fVar211 + fVar191 * fVar191;
    auVar371._4_4_ = fVar238 * fVar238 + fVar237 * fVar237 + fVar236 * fVar236;
    auVar371._8_4_ = fVar251 * fVar251 + fVar249 * fVar249 + fVar239 * fVar239;
    auVar371._12_4_ = fVar325 * fVar325 + fVar319 * fVar319 + fVar256 * fVar256;
    auVar371._16_4_ = fVar367 * fVar367 + fVar345 * fVar345 + fVar341 * fVar341;
    auVar371._20_4_ = fVar375 * fVar375 + fVar359 * fVar359 + fVar374 * fVar374;
    auVar371._24_4_ = fVar387 * fVar387 + fVar381 * fVar381 + fVar380 * fVar380;
    auVar371._28_4_ = fStack_1c4 + fStack_1c4 + fVar117;
    fVar258 = local_740._0_4_;
    fVar268 = local_740._4_4_;
    fVar270 = local_740._8_4_;
    fVar272 = local_740._12_4_;
    fVar274 = local_740._16_4_;
    fVar276 = local_740._20_4_;
    fVar278 = local_740._24_4_;
    fVar117 = local_520._28_4_;
    fVar393 = local_3c0 * fVar147 * fVar258 +
              local_3e0 * fVar258 * fVar142 + fVar258 * fVar144 * local_700;
    fVar395 = fStack_3bc * fVar235 * fVar268 +
              fStack_3dc * fVar268 * fVar213 + fVar268 * fVar215 * fStack_6fc;
    fStack_838 = fStack_3b8 * fVar252 * fVar270 +
                 fStack_3d8 * fVar270 * fVar248 + fVar270 * fVar250 * fStack_6f8;
    fStack_834 = fStack_3b4 * fVar255 * fVar272 +
                 fStack_3d4 * fVar272 * fVar253 + fVar272 * fVar254 * fStack_6f4;
    fStack_830 = fStack_3b0 * fVar337 * fVar274 +
                 fStack_3d0 * fVar274 * fVar329 + fVar274 * fVar333 * fStack_6f0;
    fStack_82c = fStack_3ac * fVar373 * fVar276 +
                 fStack_3cc * fVar276 * fVar369 + fVar276 * fVar368 * fStack_6ec;
    fStack_828 = fStack_3a8 * fVar379 * fVar278 +
                 fStack_3c8 * fVar278 * fVar377 + fVar278 * fVar378 * fStack_6e8;
    fVar388 = local_540._28_4_ + fVar117 + 0.0;
    local_a00._0_4_ =
         fVar212 * fVar147 * fVar258 + fVar258 * fVar142 * fVar211 + fVar258 * fVar144 * fVar191;
    local_a00._4_4_ =
         fVar238 * fVar235 * fVar268 + fVar268 * fVar213 * fVar237 + fVar268 * fVar215 * fVar236;
    fStack_9f8 = fVar251 * fVar252 * fVar270 +
                 fVar270 * fVar248 * fVar249 + fVar270 * fVar250 * fVar239;
    fStack_9f4 = fVar325 * fVar255 * fVar272 +
                 fVar272 * fVar253 * fVar319 + fVar272 * fVar254 * fVar256;
    fStack_9f0 = fVar367 * fVar337 * fVar274 +
                 fVar274 * fVar329 * fVar345 + fVar274 * fVar333 * fVar341;
    fStack_9ec = fVar375 * fVar373 * fVar276 +
                 fVar276 * fVar369 * fVar359 + fVar276 * fVar368 * fVar374;
    fStack_9e8 = fVar387 * fVar379 * fVar278 +
                 fVar278 * fVar377 * fVar381 + fVar278 * fVar378 * fVar380;
    fStack_9e4 = fVar117 + fVar388;
    auVar39._4_4_ = fVar395 * (float)local_a00._4_4_;
    auVar39._0_4_ = fVar393 * (float)local_a00._0_4_;
    auVar39._8_4_ = fStack_838 * fStack_9f8;
    auVar39._12_4_ = fStack_834 * fStack_9f4;
    auVar39._16_4_ = fStack_830 * fStack_9f0;
    auVar39._20_4_ = fStack_82c * fStack_9ec;
    auVar39._24_4_ = fStack_828 * fStack_9e8;
    auVar39._28_4_ = fVar388;
    auVar365 = vsubps_avx(auVar354,auVar39);
    auVar40._4_4_ = (float)local_a00._4_4_ * (float)local_a00._4_4_;
    auVar40._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar40._8_4_ = fStack_9f8 * fStack_9f8;
    auVar40._12_4_ = fStack_9f4 * fStack_9f4;
    auVar40._16_4_ = fStack_9f0 * fStack_9f0;
    auVar40._20_4_ = fStack_9ec * fStack_9ec;
    auVar40._24_4_ = fStack_9e8 * fStack_9e8;
    auVar40._28_4_ = fVar117;
    local_5a0 = vsubps_avx(auVar371,auVar40);
    _local_640 = vsqrtps_avx(auVar105);
    fVar388 = (auVar106._0_4_ + local_640._0_4_) * 1.0000002;
    fVar389 = (auVar106._4_4_ + local_640._4_4_) * 1.0000002;
    fVar390 = (auVar106._8_4_ + local_640._8_4_) * 1.0000002;
    fVar391 = (auVar106._12_4_ + local_640._12_4_) * 1.0000002;
    fVar392 = (auVar106._16_4_ + local_640._16_4_) * 1.0000002;
    fVar148 = (auVar106._20_4_ + local_640._20_4_) * 1.0000002;
    fVar149 = (auVar106._24_4_ + local_640._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar389 * fVar389;
    auVar41._0_4_ = fVar388 * fVar388;
    auVar41._8_4_ = fVar390 * fVar390;
    auVar41._12_4_ = fVar391 * fVar391;
    auVar41._16_4_ = fVar392 * fVar392;
    auVar41._20_4_ = fVar148 * fVar148;
    auVar41._24_4_ = fVar149 * fVar149;
    auVar41._28_4_ = auVar106._28_4_ + local_640._28_4_;
    fVar388 = auVar365._0_4_ + auVar365._0_4_;
    fVar389 = auVar365._4_4_ + auVar365._4_4_;
    local_2a0._0_8_ = CONCAT44(fVar389,fVar388);
    local_2a0._8_4_ = auVar365._8_4_ + auVar365._8_4_;
    local_2a0._12_4_ = auVar365._12_4_ + auVar365._12_4_;
    local_2a0._16_4_ = auVar365._16_4_ + auVar365._16_4_;
    local_2a0._20_4_ = auVar365._20_4_ + auVar365._20_4_;
    local_2a0._24_4_ = auVar365._24_4_ + auVar365._24_4_;
    local_2a0._28_4_ = auVar365._28_4_ + auVar365._28_4_;
    auVar365 = vsubps_avx(local_5a0,auVar41);
    local_580._4_4_ = fVar395 * fVar395;
    local_580._0_4_ = fVar393 * fVar393;
    fStack_578 = fStack_838 * fStack_838;
    fStack_574 = fStack_834 * fStack_834;
    fStack_570 = fStack_830 * fStack_830;
    fStack_56c = fStack_82c * fStack_82c;
    fStack_568 = fStack_828 * fStack_828;
    fStack_564 = auVar106._28_4_;
    local_440 = vsubps_avx(local_260,_local_580);
    local_5c0._4_4_ = (uint)(fVar389 * fVar389);
    local_5c0._0_4_ = (uint)(fVar388 * fVar388);
    local_5c0._8_4_ = (uint)(local_2a0._8_4_ * local_2a0._8_4_);
    local_5c0._12_4_ = (uint)(local_2a0._12_4_ * local_2a0._12_4_);
    local_5c0._16_4_ = (uint)(local_2a0._16_4_ * local_2a0._16_4_);
    local_5c0._20_4_ = (uint)(local_2a0._20_4_ * local_2a0._20_4_);
    local_5c0._24_4_ = (uint)(local_2a0._24_4_ * local_2a0._24_4_);
    local_5c0._28_4_ = (uint)fStack_3c4;
    fVar390 = local_440._0_4_;
    local_620._0_4_ = fVar390 * 4.0;
    fVar391 = local_440._4_4_;
    local_620._4_4_ = fVar391 * 4.0;
    fVar392 = local_440._8_4_;
    fStack_618 = fVar392 * 4.0;
    fVar148 = local_440._12_4_;
    fStack_614 = fVar148 * 4.0;
    fVar149 = local_440._16_4_;
    fStack_610 = fVar149 * 4.0;
    fVar396 = local_440._20_4_;
    fStack_60c = fVar396 * 4.0;
    fVar397 = local_440._24_4_;
    fStack_608 = fVar397 * 4.0;
    uStack_604 = 0x40800000;
    auVar42._4_4_ = auVar365._4_4_ * (float)local_620._4_4_;
    auVar42._0_4_ = auVar365._0_4_ * (float)local_620._0_4_;
    auVar42._8_4_ = auVar365._8_4_ * fStack_618;
    auVar42._12_4_ = auVar365._12_4_ * fStack_614;
    auVar42._16_4_ = auVar365._16_4_ * fStack_610;
    auVar42._20_4_ = auVar365._20_4_ * fStack_60c;
    auVar42._24_4_ = auVar365._24_4_ * fStack_608;
    auVar42._28_4_ = 0x40800000;
    auVar106 = vsubps_avx(local_5c0,auVar42);
    auVar105 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,5);
    local_840 = CONCAT44(fVar395,fVar393);
    fStack_824 = local_540._28_4_ + fVar117 + 0.0;
    fVar117 = local_440._28_4_;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar383._8_4_ = 0x7f800000;
      auVar383._0_8_ = 0x7f8000007f800000;
      auVar383._12_4_ = 0x7f800000;
      auVar383._16_4_ = 0x7f800000;
      auVar383._20_4_ = 0x7f800000;
      auVar383._24_4_ = 0x7f800000;
      auVar383._28_4_ = 0x7f800000;
      auVar362._8_4_ = 0xff800000;
      auVar362._0_8_ = 0xff800000ff800000;
      auVar362._12_4_ = 0xff800000;
      auVar362._16_4_ = 0xff800000;
      auVar362._20_4_ = 0xff800000;
      auVar362._24_4_ = 0xff800000;
      auVar362._28_4_ = 0xff800000;
      auVar306 = ZEXT3264(CONCAT428(fStack_6e4,
                                    CONCAT424(fStack_6e8,
                                              CONCAT420(fStack_6ec,
                                                        CONCAT416(fStack_6f0,
                                                                  CONCAT412(fStack_6f4,
                                                                            CONCAT48(fStack_6f8,
                                                                                     CONCAT44(
                                                  fStack_6fc,local_700))))))));
    }
    else {
      auVar22 = vcmpps_avx(auVar106,ZEXT832(0) << 0x20,5);
      auVar234 = vsqrtps_avx(auVar106);
      auVar261._0_4_ = fVar390 + fVar390;
      auVar261._4_4_ = fVar391 + fVar391;
      auVar261._8_4_ = fVar392 + fVar392;
      auVar261._12_4_ = fVar148 + fVar148;
      auVar261._16_4_ = fVar149 + fVar149;
      auVar261._20_4_ = fVar396 + fVar396;
      auVar261._24_4_ = fVar397 + fVar397;
      auVar261._28_4_ = fVar117 + fVar117;
      auVar106 = vrcpps_avx(auVar261);
      fVar257 = auVar106._0_4_;
      fVar267 = auVar106._4_4_;
      auVar43._4_4_ = auVar261._4_4_ * fVar267;
      auVar43._0_4_ = auVar261._0_4_ * fVar257;
      fVar269 = auVar106._8_4_;
      auVar43._8_4_ = auVar261._8_4_ * fVar269;
      fVar271 = auVar106._12_4_;
      auVar43._12_4_ = auVar261._12_4_ * fVar271;
      fVar273 = auVar106._16_4_;
      auVar43._16_4_ = auVar261._16_4_ * fVar273;
      fVar275 = auVar106._20_4_;
      auVar43._20_4_ = auVar261._20_4_ * fVar275;
      fVar277 = auVar106._24_4_;
      auVar43._24_4_ = auVar261._24_4_ * fVar277;
      auVar43._28_4_ = auVar261._28_4_;
      auVar355._8_4_ = 0x3f800000;
      auVar355._0_8_ = 0x3f8000003f800000;
      auVar355._12_4_ = 0x3f800000;
      auVar355._16_4_ = 0x3f800000;
      auVar355._20_4_ = 0x3f800000;
      auVar355._24_4_ = 0x3f800000;
      auVar355._28_4_ = 0x3f800000;
      auVar23 = vsubps_avx(auVar355,auVar43);
      fVar257 = fVar257 + fVar257 * auVar23._0_4_;
      fVar267 = fVar267 + fVar267 * auVar23._4_4_;
      fVar269 = fVar269 + fVar269 * auVar23._8_4_;
      fVar271 = fVar271 + fVar271 * auVar23._12_4_;
      fVar273 = fVar273 + fVar273 * auVar23._16_4_;
      fVar275 = fVar275 + fVar275 * auVar23._20_4_;
      fVar277 = fVar277 + fVar277 * auVar23._24_4_;
      fVar214 = -0.0;
      auVar286._0_8_ = CONCAT44(fVar389,fVar388) ^ 0x8000000080000000;
      auVar286._8_4_ = -local_2a0._8_4_;
      auVar286._12_4_ = -local_2a0._12_4_;
      auVar286._16_4_ = -local_2a0._16_4_;
      auVar286._20_4_ = -local_2a0._20_4_;
      auVar286._24_4_ = -local_2a0._24_4_;
      auVar286._28_4_ = -local_2a0._28_4_;
      auVar24 = vsubps_avx(auVar286,auVar234);
      fVar388 = auVar24._0_4_ * fVar257;
      fVar389 = auVar24._4_4_ * fVar267;
      auVar44._4_4_ = fVar389;
      auVar44._0_4_ = fVar388;
      fVar292 = auVar24._8_4_ * fVar269;
      auVar44._8_4_ = fVar292;
      fVar293 = auVar24._12_4_ * fVar271;
      auVar44._12_4_ = fVar293;
      fVar294 = auVar24._16_4_ * fVar273;
      auVar44._16_4_ = fVar294;
      fVar295 = auVar24._20_4_ * fVar275;
      auVar44._20_4_ = fVar295;
      fVar296 = auVar24._24_4_ * fVar277;
      auVar44._24_4_ = fVar296;
      auVar44._28_4_ = auVar24._28_4_;
      auVar234 = vsubps_avx(auVar234,local_2a0);
      fVar257 = auVar234._0_4_ * fVar257;
      fVar267 = auVar234._4_4_ * fVar267;
      auVar45._4_4_ = fVar267;
      auVar45._0_4_ = fVar257;
      fVar269 = auVar234._8_4_ * fVar269;
      auVar45._8_4_ = fVar269;
      fVar271 = auVar234._12_4_ * fVar271;
      auVar45._12_4_ = fVar271;
      fVar273 = auVar234._16_4_ * fVar273;
      auVar45._16_4_ = fVar273;
      fVar275 = auVar234._20_4_ * fVar275;
      auVar45._20_4_ = fVar275;
      fVar277 = auVar234._24_4_ * fVar277;
      auVar45._24_4_ = fVar277;
      auVar45._28_4_ = auVar234._28_4_;
      local_5e0._4_4_ = fVar268 * ((float)local_a00._4_4_ + fVar395 * fVar389);
      local_5e0._0_4_ = fVar258 * ((float)local_a00._0_4_ + fVar393 * fVar388);
      fStack_5d8 = fVar270 * (fStack_9f8 + fStack_838 * fVar292);
      fStack_5d4 = fVar272 * (fStack_9f4 + fStack_834 * fVar293);
      fStack_5d0 = fVar274 * (fStack_9f0 + fStack_830 * fVar294);
      fStack_5cc = fVar276 * (fStack_9ec + fStack_82c * fVar295);
      fStack_5c8 = fVar278 * (fStack_9e8 + fStack_828 * fVar296);
      fStack_5c4 = fStack_9e4 + auVar106._28_4_ + auVar23._28_4_;
      auVar356._8_4_ = 0x7fffffff;
      auVar356._0_8_ = 0x7fffffff7fffffff;
      auVar356._12_4_ = 0x7fffffff;
      auVar356._16_4_ = 0x7fffffff;
      auVar356._20_4_ = 0x7fffffff;
      auVar356._24_4_ = 0x7fffffff;
      auVar356._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(_local_580,auVar356);
      auVar106 = vmaxps_avx(local_420,auVar106);
      auVar46._4_4_ = auVar106._4_4_ * 1.9073486e-06;
      auVar46._0_4_ = auVar106._0_4_ * 1.9073486e-06;
      auVar46._8_4_ = auVar106._8_4_ * 1.9073486e-06;
      auVar46._12_4_ = auVar106._12_4_ * 1.9073486e-06;
      auVar46._16_4_ = auVar106._16_4_ * 1.9073486e-06;
      auVar46._20_4_ = auVar106._20_4_ * 1.9073486e-06;
      auVar46._24_4_ = auVar106._24_4_ * 1.9073486e-06;
      auVar46._28_4_ = auVar106._28_4_;
      auVar106 = vandps_avx(local_440,auVar356);
      auVar106 = vcmpps_avx(auVar106,auVar46,1);
      auVar303._8_4_ = 0x7f800000;
      auVar303._0_8_ = 0x7f8000007f800000;
      auVar303._12_4_ = 0x7f800000;
      auVar303._16_4_ = 0x7f800000;
      auVar303._20_4_ = 0x7f800000;
      auVar303._24_4_ = 0x7f800000;
      auVar303._28_4_ = 0x7f800000;
      auVar383 = vblendvps_avx(auVar303,auVar44,auVar22);
      local_600 = fVar258 * ((float)local_a00._0_4_ + fVar393 * fVar257);
      fStack_5fc = fVar268 * ((float)local_a00._4_4_ + fVar395 * fVar267);
      fStack_5f8 = fVar270 * (fStack_9f8 + fStack_838 * fVar269);
      fStack_5f4 = fVar272 * (fStack_9f4 + fStack_834 * fVar271);
      fStack_5f0 = fVar274 * (fStack_9f0 + fStack_830 * fVar273);
      fStack_5ec = fVar276 * (fStack_9ec + fStack_82c * fVar275);
      fStack_5e8 = fVar278 * (fStack_9e8 + fStack_828 * fVar277);
      fStack_5e4 = fStack_9e4;
      auVar262._8_4_ = 0xff800000;
      auVar262._0_8_ = 0xff800000ff800000;
      auVar262._12_4_ = 0xff800000;
      auVar262._16_4_ = 0xff800000;
      auVar262._20_4_ = 0xff800000;
      auVar262._24_4_ = 0xff800000;
      auVar262._28_4_ = 0xff800000;
      auVar362 = vblendvps_avx(auVar262,auVar45,auVar22);
      auVar234 = auVar22 & auVar106;
      if ((((((((auVar234 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar234 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar234 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar234 >> 0x7f,0) == '\0') &&
            (auVar234 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar234 >> 0xbf,0) == '\0') &&
          (auVar234 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar234[0x1f]) {
        auVar306 = ZEXT3264(CONCAT428(fStack_6e4,
                                      CONCAT424(fStack_6e8,
                                                CONCAT420(fStack_6ec,
                                                          CONCAT416(fStack_6f0,
                                                                    CONCAT412(fStack_6f4,
                                                                              CONCAT48(fStack_6f8,
                                                                                       CONCAT44(
                                                  fStack_6fc,local_700))))))));
      }
      else {
        auVar105 = vandps_avx(auVar106,auVar22);
        auVar203 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
        fVar214 = 0.0;
        auVar234 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar365 = vcmpps_avx(auVar365,auVar234,2);
        auVar305._8_4_ = 0xff800000;
        auVar305._0_8_ = 0xff800000ff800000;
        auVar305._12_4_ = 0xff800000;
        auVar305._16_4_ = 0xff800000;
        auVar305._20_4_ = 0xff800000;
        auVar305._24_4_ = 0xff800000;
        auVar305._28_4_ = 0xff800000;
        auVar372._8_4_ = 0x7f800000;
        auVar372._0_8_ = 0x7f8000007f800000;
        auVar372._12_4_ = 0x7f800000;
        auVar372._16_4_ = 0x7f800000;
        auVar372._20_4_ = 0x7f800000;
        auVar372._24_4_ = 0x7f800000;
        auVar372._28_4_ = 0x7f800000;
        auVar106 = vblendvps_avx(auVar372,auVar305,auVar365);
        auVar223 = vpmovsxwd_avx(auVar203);
        auVar203 = vpunpckhwd_avx(auVar203,auVar203);
        auVar247._16_16_ = auVar203;
        auVar247._0_16_ = auVar223;
        auVar383 = vblendvps_avx(auVar383,auVar106,auVar247);
        auVar106 = vblendvps_avx(auVar305,auVar372,auVar365);
        auVar362 = vblendvps_avx(auVar362,auVar106,auVar247);
        auVar106 = vcmpps_avx(auVar234,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar139._0_4_ = auVar105._0_4_ ^ auVar106._0_4_;
        auVar139._4_4_ = auVar105._4_4_ ^ auVar106._4_4_;
        auVar139._8_4_ = auVar105._8_4_ ^ auVar106._8_4_;
        auVar139._12_4_ = auVar105._12_4_ ^ auVar106._12_4_;
        auVar139._16_4_ = auVar105._16_4_ ^ auVar106._16_4_;
        auVar139._20_4_ = auVar105._20_4_ ^ auVar106._20_4_;
        auVar139._24_4_ = auVar105._24_4_ ^ auVar106._24_4_;
        auVar139._28_4_ = auVar105._28_4_ ^ auVar106._28_4_;
        auVar105 = vorps_avx(auVar365,auVar139);
        auVar105 = vandps_avx(auVar22,auVar105);
        auVar306 = ZEXT3264(CONCAT428(fStack_6e4,
                                      CONCAT424(fStack_6e8,
                                                CONCAT420(fStack_6ec,
                                                          CONCAT416(fStack_6f0,
                                                                    CONCAT412(fStack_6f4,
                                                                              CONCAT48(fStack_6f8,
                                                                                       CONCAT44(
                                                  fStack_6fc,local_700))))))));
      }
    }
    auVar106 = local_400 & auVar105;
    local_840 = uVar82;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      auVar386 = ZEXT3264(_local_8e0);
      auVar366 = ZEXT3264(_local_900);
    }
    else {
      auVar203 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_770._0_4_));
      auVar203 = vshufps_avx(auVar203,auVar203,0);
      auVar245._16_16_ = auVar203;
      auVar245._0_16_ = auVar203;
      auVar365 = vmaxps_avx(auVar245,auVar383);
      auVar203 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_770._0_4_));
      auVar203 = vshufps_avx(auVar203,auVar203,0);
      auVar246._16_16_ = auVar203;
      auVar246._0_16_ = auVar203;
      auVar22 = vminps_avx(auVar246,auVar362);
      fVar214 = local_5a0._28_4_ + fVar214;
      auVar164._0_4_ = local_3c0 * fVar297 + local_3e0 * fVar151 + auVar306._0_4_ * fVar321;
      auVar164._4_4_ = fStack_3bc * fVar307 + fStack_3dc * fVar173 + auVar306._4_4_ * fVar327;
      auVar164._8_4_ = fStack_3b8 * fVar309 + fStack_3d8 * fVar176 + auVar306._8_4_ * fVar331;
      auVar164._12_4_ = fStack_3b4 * fVar311 + fStack_3d4 * fVar179 + auVar306._12_4_ * fVar335;
      auVar164._16_4_ = fStack_3b0 * fVar313 + fStack_3d0 * fVar182 + auVar306._16_4_ * fVar339;
      auVar164._20_4_ = fStack_3ac * fVar315 + fStack_3cc * fVar185 + auVar306._20_4_ * fVar343;
      auVar164._24_4_ = fStack_3a8 * fVar317 + fStack_3c8 * fVar188 + auVar306._24_4_ * fVar347;
      auVar164._28_4_ = fVar214 + fVar350 + fVar214;
      auVar106 = vrcpps_avx(auVar164);
      fVar388 = auVar106._0_4_;
      fVar389 = auVar106._4_4_;
      auVar47._4_4_ = auVar164._4_4_ * fVar389;
      auVar47._0_4_ = auVar164._0_4_ * fVar388;
      fVar350 = auVar106._8_4_;
      auVar47._8_4_ = auVar164._8_4_ * fVar350;
      fVar257 = auVar106._12_4_;
      auVar47._12_4_ = auVar164._12_4_ * fVar257;
      fVar267 = auVar106._16_4_;
      auVar47._16_4_ = auVar164._16_4_ * fVar267;
      fVar269 = auVar106._20_4_;
      auVar47._20_4_ = auVar164._20_4_ * fVar269;
      fVar271 = auVar106._24_4_;
      auVar47._24_4_ = auVar164._24_4_ * fVar271;
      auVar47._28_4_ = fStack_3c4;
      auVar384._8_4_ = 0x3f800000;
      auVar384._0_8_ = 0x3f8000003f800000;
      auVar384._12_4_ = 0x3f800000;
      auVar384._16_4_ = 0x3f800000;
      auVar384._20_4_ = 0x3f800000;
      auVar384._24_4_ = 0x3f800000;
      auVar384._28_4_ = 0x3f800000;
      auVar234 = vsubps_avx(auVar384,auVar47);
      auVar287._8_4_ = 0x7fffffff;
      auVar287._0_8_ = 0x7fffffff7fffffff;
      auVar287._12_4_ = 0x7fffffff;
      auVar287._16_4_ = 0x7fffffff;
      auVar287._20_4_ = 0x7fffffff;
      auVar287._24_4_ = 0x7fffffff;
      auVar287._28_4_ = 0x7fffffff;
      auVar106 = vandps_avx(auVar164,auVar287);
      auVar363._8_4_ = 0x219392ef;
      auVar363._0_8_ = 0x219392ef219392ef;
      auVar363._12_4_ = 0x219392ef;
      auVar363._16_4_ = 0x219392ef;
      auVar363._20_4_ = 0x219392ef;
      auVar363._24_4_ = 0x219392ef;
      auVar363._28_4_ = 0x219392ef;
      auVar106 = vcmpps_avx(auVar106,auVar363,1);
      auVar48._4_4_ =
           (fVar389 + fVar389 * auVar234._4_4_) *
           -(fVar307 * fVar238 + fVar173 * fVar237 + fVar327 * fVar236);
      auVar48._0_4_ =
           (fVar388 + fVar388 * auVar234._0_4_) *
           -(fVar297 * fVar212 + fVar151 * fVar211 + fVar321 * fVar191);
      auVar48._8_4_ =
           (fVar350 + fVar350 * auVar234._8_4_) *
           -(fVar309 * fVar251 + fVar176 * fVar249 + fVar331 * fVar239);
      auVar48._12_4_ =
           (fVar257 + fVar257 * auVar234._12_4_) *
           -(fVar311 * fVar325 + fVar179 * fVar319 + fVar335 * fVar256);
      auVar48._16_4_ =
           (fVar267 + fVar267 * auVar234._16_4_) *
           -(fVar313 * fVar367 + fVar182 * fVar345 + fVar339 * fVar341);
      auVar48._20_4_ =
           (fVar269 + fVar269 * auVar234._20_4_) *
           -(fVar315 * fVar375 + fVar185 * fVar359 + fVar343 * fVar374);
      auVar48._24_4_ =
           (fVar271 + fVar271 * auVar234._24_4_) *
           -(fVar317 * fVar387 + fVar188 * fVar381 + fVar347 * fVar380);
      auVar48._28_4_ = -(auVar244._28_4_ + fVar214);
      auVar69 = ZEXT812(0);
      auVar244 = vcmpps_avx(auVar164,ZEXT1232(auVar69) << 0x20,1);
      auVar234 = vorps_avx(auVar106,auVar244);
      auVar244 = vcmpps_avx(auVar164,ZEXT1232(auVar69) << 0x20,6);
      auVar244 = vorps_avx(auVar106,auVar244);
      auVar304._8_4_ = 0xff800000;
      auVar304._0_8_ = 0xff800000ff800000;
      auVar304._12_4_ = 0xff800000;
      auVar304._16_4_ = 0xff800000;
      auVar304._20_4_ = 0xff800000;
      auVar304._24_4_ = 0xff800000;
      auVar304._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar48,auVar304,auVar234);
      auVar324._8_4_ = 0x7f800000;
      auVar324._0_8_ = 0x7f8000007f800000;
      auVar324._12_4_ = 0x7f800000;
      auVar324._16_4_ = 0x7f800000;
      auVar324._20_4_ = 0x7f800000;
      auVar324._24_4_ = 0x7f800000;
      auVar324._28_4_ = 0x7f800000;
      auVar244 = vblendvps_avx(auVar48,auVar324,auVar244);
      auVar365 = vmaxps_avx(auVar365,auVar106);
      auVar22 = vminps_avx(auVar22,auVar244);
      auVar364 = ZEXT1232(auVar69) << 0x20;
      auVar106 = vsubps_avx(auVar364,_local_920);
      auVar244 = vsubps_avx(auVar364,_local_a20);
      auVar49._4_4_ = auVar244._4_4_ * -fVar328;
      auVar49._0_4_ = auVar244._0_4_ * -fVar322;
      auVar49._8_4_ = auVar244._8_4_ * -fVar332;
      auVar49._12_4_ = auVar244._12_4_ * -fVar336;
      auVar49._16_4_ = auVar244._16_4_ * -fVar340;
      auVar49._20_4_ = auVar244._20_4_ * -fVar344;
      auVar49._24_4_ = auVar244._24_4_ * -fVar348;
      auVar49._28_4_ = auVar244._28_4_;
      auVar50._4_4_ = fVar174 * auVar106._4_4_;
      auVar50._0_4_ = fVar152 * auVar106._0_4_;
      auVar50._8_4_ = fVar177 * auVar106._8_4_;
      auVar50._12_4_ = fVar180 * auVar106._12_4_;
      auVar50._16_4_ = fVar183 * auVar106._16_4_;
      auVar50._20_4_ = fVar186 * auVar106._20_4_;
      auVar50._24_4_ = fVar189 * auVar106._24_4_;
      auVar50._28_4_ = auVar106._28_4_;
      auVar106 = vsubps_avx(auVar49,auVar50);
      auVar244 = vsubps_avx(auVar364,local_9a0);
      auVar51._4_4_ = fVar308 * auVar244._4_4_;
      auVar51._0_4_ = fVar298 * auVar244._0_4_;
      auVar51._8_4_ = fVar310 * auVar244._8_4_;
      auVar51._12_4_ = fVar312 * auVar244._12_4_;
      auVar51._16_4_ = fVar314 * auVar244._16_4_;
      auVar51._20_4_ = fVar316 * auVar244._20_4_;
      uVar8 = auVar244._28_4_;
      auVar51._24_4_ = fVar318 * auVar244._24_4_;
      auVar51._28_4_ = uVar8;
      auVar234 = vsubps_avx(auVar106,auVar51);
      auVar52._4_4_ = auVar306._4_4_ * -fVar328;
      auVar52._0_4_ = auVar306._0_4_ * -fVar322;
      auVar52._8_4_ = auVar306._8_4_ * -fVar332;
      auVar52._12_4_ = auVar306._12_4_ * -fVar336;
      auVar52._16_4_ = auVar306._16_4_ * -fVar340;
      auVar52._20_4_ = auVar306._20_4_ * -fVar344;
      auVar52._24_4_ = auVar306._24_4_ * -fVar348;
      auVar52._28_4_ = (uint)fStack_924 ^ 0x80000000;
      auVar53._4_4_ = fStack_3dc * fVar174;
      auVar53._0_4_ = local_3e0 * fVar152;
      auVar53._8_4_ = fStack_3d8 * fVar177;
      auVar53._12_4_ = fStack_3d4 * fVar180;
      auVar53._16_4_ = fStack_3d0 * fVar183;
      auVar53._20_4_ = fStack_3cc * fVar186;
      auVar53._24_4_ = fStack_3c8 * fVar189;
      auVar53._28_4_ = uVar8;
      auVar106 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fStack_3bc * fVar308;
      auVar54._0_4_ = local_3c0 * fVar298;
      auVar54._8_4_ = fStack_3b8 * fVar310;
      auVar54._12_4_ = fStack_3b4 * fVar312;
      auVar54._16_4_ = fStack_3b0 * fVar314;
      auVar54._20_4_ = fStack_3ac * fVar316;
      auVar54._24_4_ = fStack_3a8 * fVar318;
      auVar54._28_4_ = uVar8;
      auVar23 = vsubps_avx(auVar106,auVar54);
      auVar106 = vrcpps_avx(auVar23);
      fVar191 = auVar106._0_4_;
      fVar211 = auVar106._4_4_;
      auVar55._4_4_ = auVar23._4_4_ * fVar211;
      auVar55._0_4_ = auVar23._0_4_ * fVar191;
      fVar212 = auVar106._8_4_;
      auVar55._8_4_ = auVar23._8_4_ * fVar212;
      fVar236 = auVar106._12_4_;
      auVar55._12_4_ = auVar23._12_4_ * fVar236;
      fVar237 = auVar106._16_4_;
      auVar55._16_4_ = auVar23._16_4_ * fVar237;
      fVar238 = auVar106._20_4_;
      auVar55._20_4_ = auVar23._20_4_ * fVar238;
      fVar239 = auVar106._24_4_;
      auVar55._24_4_ = auVar23._24_4_ * fVar239;
      auVar55._28_4_ = auVar306._28_4_;
      auVar24 = vsubps_avx(auVar384,auVar55);
      auVar106 = vandps_avx(auVar23,auVar287);
      auVar131._8_4_ = 0x219392ef;
      auVar131._0_8_ = 0x219392ef219392ef;
      auVar131._12_4_ = 0x219392ef;
      auVar131._16_4_ = 0x219392ef;
      auVar131._20_4_ = 0x219392ef;
      auVar131._24_4_ = 0x219392ef;
      auVar131._28_4_ = 0x219392ef;
      auVar244 = vcmpps_avx(auVar106,auVar131,1);
      auVar56._4_4_ = (fVar211 + fVar211 * auVar24._4_4_) * -auVar234._4_4_;
      auVar56._0_4_ = (fVar191 + fVar191 * auVar24._0_4_) * -auVar234._0_4_;
      auVar56._8_4_ = (fVar212 + fVar212 * auVar24._8_4_) * -auVar234._8_4_;
      auVar56._12_4_ = (fVar236 + fVar236 * auVar24._12_4_) * -auVar234._12_4_;
      auVar56._16_4_ = (fVar237 + fVar237 * auVar24._16_4_) * -auVar234._16_4_;
      auVar56._20_4_ = (fVar238 + fVar238 * auVar24._20_4_) * -auVar234._20_4_;
      auVar56._24_4_ = (fVar239 + fVar239 * auVar24._24_4_) * -auVar234._24_4_;
      auVar56._28_4_ = auVar234._28_4_ ^ 0x80000000;
      auVar106 = vcmpps_avx(auVar23,auVar364,1);
      auVar106 = vorps_avx(auVar244,auVar106);
      auVar106 = vblendvps_avx(auVar56,auVar304,auVar106);
      local_480 = vmaxps_avx(auVar365,auVar106);
      auVar306 = ZEXT3264(local_480);
      auVar365 = ZEXT1232(auVar69) << 0x20;
      auVar106 = vcmpps_avx(auVar23,auVar365,6);
      auVar106 = vorps_avx(auVar244,auVar106);
      auVar106 = vblendvps_avx(auVar56,auVar324,auVar106);
      auVar105 = vandps_avx(auVar105,local_400);
      local_4a0 = vminps_avx(auVar22,auVar106);
      auVar106 = vcmpps_avx(local_480,local_4a0,2);
      auVar244 = auVar105 & auVar106;
      if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar244 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar244 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar244 >> 0x7f,0) == '\0') &&
            (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar244 >> 0xbf,0) == '\0') &&
          (auVar244 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar244[0x1f]) {
        auVar386 = ZEXT3264(_local_8e0);
        auVar366 = ZEXT3264(_local_900);
      }
      else {
        auVar244 = vminps_avx(local_6e0,_local_720);
        auVar22 = vminps_avx(_local_7c0,local_760);
        auVar244 = vminps_avx(auVar244,auVar22);
        auVar244 = vsubps_avx(auVar244,_local_640);
        auVar105 = vandps_avx(auVar106,auVar105);
        auVar106 = vminps_avx(_local_5e0,auVar384);
        auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar91 + fVar116 * (auVar106._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar113 + fVar141 * (auVar106._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar114 + fVar143 * (auVar106._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar115 + fVar146 * (auVar106._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar91 + fVar116 * (auVar106._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar113 + fVar141 * (auVar106._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar114 + fVar143 * (auVar106._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar115 + auVar106._28_4_ + 7.0;
        auVar79._4_4_ = fStack_5fc;
        auVar79._0_4_ = local_600;
        auVar79._8_4_ = fStack_5f8;
        auVar79._12_4_ = fStack_5f4;
        auVar79._16_4_ = fStack_5f0;
        auVar79._20_4_ = fStack_5ec;
        auVar79._24_4_ = fStack_5e8;
        auVar79._28_4_ = fStack_5e4;
        auVar106 = vminps_avx(auVar79,auVar384);
        auVar106 = vmaxps_avx(auVar106,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar91 + fVar116 * (auVar106._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar113 + fVar141 * (auVar106._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar114 + fVar143 * (auVar106._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar115 + fVar146 * (auVar106._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar91 + fVar116 * (auVar106._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar113 + fVar141 * (auVar106._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar114 + fVar143 * (auVar106._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar115 + auVar106._28_4_ + 7.0;
        auVar57._4_4_ = auVar244._4_4_ * 0.99999976;
        auVar57._0_4_ = auVar244._0_4_ * 0.99999976;
        auVar57._8_4_ = auVar244._8_4_ * 0.99999976;
        auVar57._12_4_ = auVar244._12_4_ * 0.99999976;
        auVar57._16_4_ = auVar244._16_4_ * 0.99999976;
        auVar57._20_4_ = auVar244._20_4_ * 0.99999976;
        auVar57._24_4_ = auVar244._24_4_ * 0.99999976;
        auVar57._28_4_ = 0x3f7ffffc;
        auVar106 = vmaxps_avx(auVar365,auVar57);
        auVar58._4_4_ = auVar106._4_4_ * auVar106._4_4_;
        auVar58._0_4_ = auVar106._0_4_ * auVar106._0_4_;
        auVar58._8_4_ = auVar106._8_4_ * auVar106._8_4_;
        auVar58._12_4_ = auVar106._12_4_ * auVar106._12_4_;
        auVar58._16_4_ = auVar106._16_4_ * auVar106._16_4_;
        auVar58._20_4_ = auVar106._20_4_ * auVar106._20_4_;
        auVar58._24_4_ = auVar106._24_4_ * auVar106._24_4_;
        auVar58._28_4_ = auVar106._28_4_;
        auVar244 = vsubps_avx(local_5a0,auVar58);
        auVar59._4_4_ = auVar244._4_4_ * (float)local_620._4_4_;
        auVar59._0_4_ = auVar244._0_4_ * (float)local_620._0_4_;
        auVar59._8_4_ = auVar244._8_4_ * fStack_618;
        auVar59._12_4_ = auVar244._12_4_ * fStack_614;
        auVar59._16_4_ = auVar244._16_4_ * fStack_610;
        auVar59._20_4_ = auVar244._20_4_ * fStack_60c;
        auVar59._24_4_ = auVar244._24_4_ * fStack_608;
        auVar59._28_4_ = auVar106._28_4_;
        auVar22 = vsubps_avx(local_5c0,auVar59);
        auVar106 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,5);
        _local_7c0 = local_480;
        auVar234 = _local_7c0;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          _local_620 = ZEXT832(0) << 0x20;
          _local_640 = ZEXT832(0) << 0x20;
          _local_740 = ZEXT832(0) << 0x20;
          _local_ac0 = local_740._0_28_;
          _local_920 = _local_740;
          auVar228 = ZEXT828(0) << 0x20;
          auVar263._8_4_ = 0x7f800000;
          auVar263._0_8_ = 0x7f8000007f800000;
          auVar263._12_4_ = 0x7f800000;
          auVar263._16_4_ = 0x7f800000;
          auVar263._20_4_ = 0x7f800000;
          auVar263._24_4_ = 0x7f800000;
          auVar263._28_4_ = 0x7f800000;
          auVar288._8_4_ = 0xff800000;
          auVar288._0_8_ = 0xff800000ff800000;
          auVar288._12_4_ = 0xff800000;
          auVar288._16_4_ = 0xff800000;
          auVar288._20_4_ = 0xff800000;
          auVar288._24_4_ = 0xff800000;
          auVar288._28_4_ = 0xff800000;
        }
        else {
          local_820 = auVar244;
          local_800 = auVar106;
          _local_a20 = auVar105;
          auVar24 = vsqrtps_avx(auVar22);
          auVar208._0_4_ = fVar390 + fVar390;
          auVar208._4_4_ = fVar391 + fVar391;
          auVar208._8_4_ = fVar392 + fVar392;
          auVar208._12_4_ = fVar148 + fVar148;
          auVar208._16_4_ = fVar149 + fVar149;
          auVar208._20_4_ = fVar396 + fVar396;
          auVar208._24_4_ = fVar397 + fVar397;
          auVar208._28_4_ = fVar117 + fVar117;
          auVar23 = vrcpps_avx(auVar208);
          fVar117 = auVar23._0_4_;
          fVar191 = auVar23._4_4_;
          auVar60._4_4_ = auVar208._4_4_ * fVar191;
          auVar60._0_4_ = auVar208._0_4_ * fVar117;
          fVar211 = auVar23._8_4_;
          auVar60._8_4_ = auVar208._8_4_ * fVar211;
          fVar212 = auVar23._12_4_;
          auVar60._12_4_ = auVar208._12_4_ * fVar212;
          fVar236 = auVar23._16_4_;
          auVar60._16_4_ = auVar208._16_4_ * fVar236;
          fVar237 = auVar23._20_4_;
          auVar60._20_4_ = auVar208._20_4_ * fVar237;
          fVar238 = auVar23._24_4_;
          auVar60._24_4_ = auVar208._24_4_ * fVar238;
          auVar60._28_4_ = auVar208._28_4_;
          auVar364 = vsubps_avx(auVar384,auVar60);
          fVar117 = fVar117 + fVar117 * auVar364._0_4_;
          fVar191 = fVar191 + fVar191 * auVar364._4_4_;
          fVar211 = fVar211 + fVar211 * auVar364._8_4_;
          fVar212 = fVar212 + fVar212 * auVar364._12_4_;
          fVar236 = fVar236 + fVar236 * auVar364._16_4_;
          fVar237 = fVar237 + fVar237 * auVar364._20_4_;
          fVar238 = fVar238 + fVar238 * auVar364._24_4_;
          fVar239 = auVar23._28_4_ + auVar364._28_4_;
          auVar230._0_8_ = local_2a0._0_8_ ^ 0x8000000080000000;
          auVar230._8_4_ = -local_2a0._8_4_;
          auVar230._12_4_ = -local_2a0._12_4_;
          auVar230._16_4_ = -local_2a0._16_4_;
          auVar230._20_4_ = -local_2a0._20_4_;
          auVar230._24_4_ = -local_2a0._24_4_;
          auVar230._28_4_ = -local_2a0._28_4_;
          auVar23 = vsubps_avx(auVar230,auVar24);
          fVar367 = auVar23._0_4_ * fVar117;
          fVar374 = auVar23._4_4_ * fVar191;
          auVar61._4_4_ = fVar374;
          auVar61._0_4_ = fVar367;
          fVar359 = auVar23._8_4_ * fVar211;
          auVar61._8_4_ = fVar359;
          fVar375 = auVar23._12_4_ * fVar212;
          auVar61._12_4_ = fVar375;
          fVar380 = auVar23._16_4_ * fVar236;
          auVar61._16_4_ = fVar380;
          fVar381 = auVar23._20_4_ * fVar237;
          auVar61._20_4_ = fVar381;
          fVar387 = auVar23._24_4_ * fVar238;
          auVar61._24_4_ = fVar387;
          auVar61._28_4_ = 0x3f800000;
          auVar24 = vsubps_avx(auVar24,local_2a0);
          fVar117 = auVar24._0_4_ * fVar117;
          fVar191 = auVar24._4_4_ * fVar191;
          auVar62._4_4_ = fVar191;
          auVar62._0_4_ = fVar117;
          fVar211 = auVar24._8_4_ * fVar211;
          auVar62._8_4_ = fVar211;
          fVar212 = auVar24._12_4_ * fVar212;
          auVar62._12_4_ = fVar212;
          fVar236 = auVar24._16_4_ * fVar236;
          auVar62._16_4_ = fVar236;
          fVar237 = auVar24._20_4_ * fVar237;
          auVar62._20_4_ = fVar237;
          fVar238 = auVar24._24_4_ * fVar238;
          auVar62._24_4_ = fVar238;
          auVar62._28_4_ = fVar376;
          fVar249 = (fVar367 * fVar393 + (float)local_a00._0_4_) * fVar258;
          fVar251 = (fVar374 * fVar395 + (float)local_a00._4_4_) * fVar268;
          fVar256 = (fVar359 * fStack_838 + fStack_9f8) * fVar270;
          fVar319 = (fVar375 * fStack_834 + fStack_9f4) * fVar272;
          fVar325 = (fVar380 * fStack_830 + fStack_9f0) * fVar274;
          fVar341 = (fVar381 * fStack_82c + fStack_9ec) * fVar276;
          fVar345 = (fVar387 * fStack_828 + fStack_9e8) * fVar278;
          auVar132._0_4_ = local_8a0 + fVar147 * fVar249;
          auVar132._4_4_ = fStack_89c + fVar235 * fVar251;
          auVar132._8_4_ = fStack_898 + fVar252 * fVar256;
          auVar132._12_4_ = aStack_894.w + fVar255 * fVar319;
          auVar132._16_4_ = fStack_890 + fVar337 * fVar325;
          auVar132._20_4_ = fStack_88c + fVar373 * fVar341;
          auVar132._24_4_ = fStack_888 + fVar379 * fVar345;
          auVar132._28_4_ = fStack_884 + auVar24._28_4_ + fStack_9e4;
          auVar63._4_4_ = fStack_3bc * fVar374;
          auVar63._0_4_ = local_3c0 * fVar367;
          auVar63._8_4_ = fStack_3b8 * fVar359;
          auVar63._12_4_ = fStack_3b4 * fVar375;
          auVar63._16_4_ = fStack_3b0 * fVar380;
          auVar63._20_4_ = fStack_3ac * fVar381;
          auVar63._24_4_ = fStack_3a8 * fVar387;
          auVar63._28_4_ = fVar239;
          auVar24 = vsubps_avx(auVar63,auVar132);
          _local_ac0 = auVar24._0_28_;
          auVar209._0_4_ = fVar320 + fVar142 * fVar249;
          auVar209._4_4_ = fVar326 + fVar213 * fVar251;
          auVar209._8_4_ = fVar330 + fVar248 * fVar256;
          auVar209._12_4_ = fVar334 + fVar253 * fVar319;
          auVar209._16_4_ = fVar338 + fVar329 * fVar325;
          auVar209._20_4_ = fVar342 + fVar369 * fVar341;
          auVar209._24_4_ = fVar346 + fVar377 * fVar345;
          auVar209._28_4_ = fVar349 + fVar239;
          auVar264._0_4_ = local_3e0 * fVar367;
          auVar264._4_4_ = fStack_3dc * fVar374;
          auVar264._8_4_ = fStack_3d8 * fVar359;
          auVar264._12_4_ = fStack_3d4 * fVar375;
          auVar264._16_4_ = fStack_3d0 * fVar380;
          auVar264._20_4_ = fStack_3cc * fVar381;
          auVar264._24_4_ = fStack_3c8 * fVar387;
          auVar264._28_4_ = 0;
          _local_920 = vsubps_avx(auVar264,auVar209);
          auVar231._0_4_ = fVar150 + fVar144 * fVar249;
          auVar231._4_4_ = fVar172 + fVar215 * fVar251;
          auVar231._8_4_ = fVar175 + fVar250 * fVar256;
          auVar231._12_4_ = fVar178 + fVar254 * fVar319;
          auVar231._16_4_ = fVar181 + fVar333 * fVar325;
          auVar231._20_4_ = fVar184 + fVar368 * fVar341;
          auVar231._24_4_ = fVar187 + fVar378 * fVar345;
          auVar231._28_4_ = fVar190 + auVar23._28_4_;
          auVar64._4_4_ = fVar374 * fStack_6fc;
          auVar64._0_4_ = fVar367 * local_700;
          auVar64._8_4_ = fVar359 * fStack_6f8;
          auVar64._12_4_ = fVar375 * fStack_6f4;
          auVar64._16_4_ = fVar380 * fStack_6f0;
          auVar64._20_4_ = fVar381 * fStack_6ec;
          auVar64._24_4_ = fVar387 * fStack_6e8;
          auVar64._28_4_ = 0;
          auVar23 = vsubps_avx(auVar64,auVar231);
          auVar228 = auVar23._0_28_;
          fVar258 = (fVar117 * fVar393 + (float)local_a00._0_4_) * fVar258;
          fVar268 = (fVar191 * fVar395 + (float)local_a00._4_4_) * fVar268;
          fVar270 = (fVar211 * fStack_838 + fStack_9f8) * fVar270;
          fVar272 = (fVar212 * fStack_834 + fStack_9f4) * fVar272;
          fVar274 = (fVar236 * fStack_830 + fStack_9f0) * fVar274;
          fVar276 = (fVar237 * fStack_82c + fStack_9ec) * fVar276;
          fVar278 = (fVar238 * fStack_828 + fStack_9e8) * fVar278;
          auVar289._0_4_ = local_8a0 + fVar147 * fVar258;
          auVar289._4_4_ = fStack_89c + fVar235 * fVar268;
          auVar289._8_4_ = fStack_898 + fVar252 * fVar270;
          auVar289._12_4_ = aStack_894.w + fVar255 * fVar272;
          auVar289._16_4_ = fStack_890 + fVar337 * fVar274;
          auVar289._20_4_ = fStack_88c + fVar373 * fVar276;
          auVar289._24_4_ = fStack_888 + fVar379 * fVar278;
          auVar289._28_4_ = fStack_884 + fStack_544;
          auVar65._4_4_ = fStack_3bc * fVar191;
          auVar65._0_4_ = local_3c0 * fVar117;
          auVar65._8_4_ = fStack_3b8 * fVar211;
          auVar65._12_4_ = fStack_3b4 * fVar212;
          auVar65._16_4_ = fStack_3b0 * fVar236;
          auVar65._20_4_ = fStack_3ac * fVar237;
          auVar65._24_4_ = fStack_3a8 * fVar238;
          auVar65._28_4_ = fStack_884;
          _local_620 = vsubps_avx(auVar65,auVar289);
          auVar290._0_4_ = fVar320 + fVar142 * fVar258;
          auVar290._4_4_ = fVar326 + fVar213 * fVar268;
          auVar290._8_4_ = fVar330 + fVar248 * fVar270;
          auVar290._12_4_ = fVar334 + fVar253 * fVar272;
          auVar290._16_4_ = fVar338 + fVar329 * fVar274;
          auVar290._20_4_ = fVar342 + fVar369 * fVar276;
          auVar290._24_4_ = fVar346 + fVar377 * fVar278;
          auVar290._28_4_ = fVar349 + local_620._28_4_;
          auVar66._4_4_ = fStack_3dc * fVar191;
          auVar66._0_4_ = local_3e0 * fVar117;
          auVar66._8_4_ = fStack_3d8 * fVar211;
          auVar66._12_4_ = fStack_3d4 * fVar212;
          auVar66._16_4_ = fStack_3d0 * fVar236;
          auVar66._20_4_ = fStack_3cc * fVar237;
          auVar66._24_4_ = fStack_3c8 * fVar238;
          auVar66._28_4_ = fStack_884;
          _local_640 = vsubps_avx(auVar66,auVar290);
          auVar265._0_4_ = fVar150 + fVar144 * fVar258;
          auVar265._4_4_ = fVar172 + fVar215 * fVar268;
          auVar265._8_4_ = fVar175 + fVar250 * fVar270;
          auVar265._12_4_ = fVar178 + fVar254 * fVar272;
          auVar265._16_4_ = fVar181 + fVar333 * fVar274;
          auVar265._20_4_ = fVar184 + fVar368 * fVar276;
          auVar265._24_4_ = fVar187 + fVar378 * fVar278;
          auVar265._28_4_ = fVar190 + fStack_9e4 + 0.0;
          auVar67._4_4_ = fVar191 * fStack_6fc;
          auVar67._0_4_ = fVar117 * local_700;
          auVar67._8_4_ = fVar211 * fStack_6f8;
          auVar67._12_4_ = fVar212 * fStack_6f4;
          auVar67._16_4_ = fVar236 * fStack_6f0;
          auVar67._20_4_ = fVar237 * fStack_6ec;
          auVar67._24_4_ = fVar238 * fStack_6e8;
          auVar67._28_4_ = local_640._28_4_;
          _local_740 = vsubps_avx(auVar67,auVar265);
          auVar22 = vcmpps_avx(auVar22,auVar365,5);
          auVar266._8_4_ = 0x7f800000;
          auVar266._0_8_ = 0x7f8000007f800000;
          auVar266._12_4_ = 0x7f800000;
          auVar266._16_4_ = 0x7f800000;
          auVar266._20_4_ = 0x7f800000;
          auVar266._24_4_ = 0x7f800000;
          auVar266._28_4_ = 0x7f800000;
          auVar263 = vblendvps_avx(auVar266,auVar61,auVar22);
          auVar357._8_4_ = 0x7fffffff;
          auVar357._0_8_ = 0x7fffffff7fffffff;
          auVar357._12_4_ = 0x7fffffff;
          auVar357._16_4_ = 0x7fffffff;
          auVar357._20_4_ = 0x7fffffff;
          auVar357._24_4_ = 0x7fffffff;
          auVar357._28_4_ = 0x7fffffff;
          auVar365 = vandps_avx(auVar357,_local_580);
          auVar365 = vmaxps_avx(local_420,auVar365);
          auVar68._4_4_ = auVar365._4_4_ * 1.9073486e-06;
          auVar68._0_4_ = auVar365._0_4_ * 1.9073486e-06;
          auVar68._8_4_ = auVar365._8_4_ * 1.9073486e-06;
          auVar68._12_4_ = auVar365._12_4_ * 1.9073486e-06;
          auVar68._16_4_ = auVar365._16_4_ * 1.9073486e-06;
          auVar68._20_4_ = auVar365._20_4_ * 1.9073486e-06;
          auVar68._24_4_ = auVar365._24_4_ * 1.9073486e-06;
          auVar68._28_4_ = auVar365._28_4_;
          auVar365 = vandps_avx(auVar357,local_440);
          auVar365 = vcmpps_avx(auVar365,auVar68,1);
          auVar291._8_4_ = 0xff800000;
          auVar291._0_8_ = 0xff800000ff800000;
          auVar291._12_4_ = 0xff800000;
          auVar291._16_4_ = 0xff800000;
          auVar291._20_4_ = 0xff800000;
          auVar291._24_4_ = 0xff800000;
          auVar291._28_4_ = 0xff800000;
          auVar288 = vblendvps_avx(auVar291,auVar62,auVar22);
          auVar23 = auVar22 & auVar365;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0x7f,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0xbf,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar23[0x1f] < '\0') {
            auVar106 = vandps_avx(auVar365,auVar22);
            auVar203 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar365 = vcmpps_avx(auVar244,ZEXT832(0) << 0x20,2);
            auVar394._8_4_ = 0xff800000;
            auVar394._0_8_ = 0xff800000ff800000;
            auVar394._12_4_ = 0xff800000;
            auVar394._16_4_ = 0xff800000;
            auVar394._20_4_ = 0xff800000;
            auVar394._24_4_ = 0xff800000;
            auVar394._28_4_ = 0xff800000;
            auVar385._8_4_ = 0x7f800000;
            auVar385._0_8_ = 0x7f8000007f800000;
            auVar385._12_4_ = 0x7f800000;
            auVar385._16_4_ = 0x7f800000;
            auVar385._20_4_ = 0x7f800000;
            auVar385._24_4_ = 0x7f800000;
            auVar385._28_4_ = 0x7f800000;
            auVar244 = vblendvps_avx(auVar385,auVar394,auVar365);
            auVar223 = vpmovsxwd_avx(auVar203);
            auVar203 = vpunpckhwd_avx(auVar203,auVar203);
            auVar358._16_16_ = auVar203;
            auVar358._0_16_ = auVar223;
            auVar263 = vblendvps_avx(auVar263,auVar244,auVar358);
            auVar244 = vblendvps_avx(auVar394,auVar385,auVar365);
            auVar288 = vblendvps_avx(auVar288,auVar244,auVar358);
            auVar244 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar112._0_4_ = auVar244._0_4_ ^ auVar106._0_4_;
            auVar112._4_4_ = auVar244._4_4_ ^ auVar106._4_4_;
            auVar112._8_4_ = auVar244._8_4_ ^ auVar106._8_4_;
            auVar112._12_4_ = auVar244._12_4_ ^ auVar106._12_4_;
            auVar112._16_4_ = auVar244._16_4_ ^ auVar106._16_4_;
            auVar112._20_4_ = auVar244._20_4_ ^ auVar106._20_4_;
            auVar112._24_4_ = auVar244._24_4_ ^ auVar106._24_4_;
            auVar112._28_4_ = auVar244._28_4_ ^ auVar106._28_4_;
            auVar106 = vorps_avx(auVar365,auVar112);
            auVar106 = vandps_avx(auVar22,auVar106);
          }
        }
        auVar306 = ZEXT3264(local_480);
        local_560._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
        local_580._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar117 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_460 = vminps_avx(local_4a0,auVar263);
        local_760 = vmaxps_avx(local_480,auVar288);
        _local_4c0 = local_760;
        auVar244 = vcmpps_avx(local_480,local_460,2);
        local_520 = vandps_avx(auVar244,auVar105);
        auVar244 = vcmpps_avx(local_760,local_4a0,2);
        local_5a0 = vandps_avx(auVar244,auVar105);
        auVar105 = vorps_avx(local_5a0,local_520);
        auVar386 = ZEXT3264(_local_8e0);
        auVar366 = ZEXT3264(_local_900);
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0x7f,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0xbf,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar105[0x1f] < '\0') {
          auVar105 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_5c0._0_4_ = auVar106._0_4_ ^ auVar105._0_4_;
          local_5c0._4_4_ = auVar106._4_4_ ^ auVar105._4_4_;
          local_5c0._8_4_ = auVar106._8_4_ ^ auVar105._8_4_;
          local_5c0._12_4_ = auVar106._12_4_ ^ auVar105._12_4_;
          local_5c0._16_4_ = auVar106._16_4_ ^ auVar105._16_4_;
          local_5c0._20_4_ = auVar106._20_4_ ^ auVar105._20_4_;
          local_5c0._24_4_ = auVar106._24_4_ ^ auVar105._24_4_;
          local_5c0._28_4_ = (uint)auVar106._28_4_ ^ (uint)auVar105._28_4_;
          local_560._0_4_ = local_560._4_4_;
          fStack_558 = (float)local_560._4_4_;
          fStack_554 = (float)local_560._4_4_;
          fStack_550 = (float)local_560._4_4_;
          fStack_54c = (float)local_560._4_4_;
          fStack_548 = (float)local_560._4_4_;
          fStack_544 = (float)local_560._4_4_;
          auVar107._0_4_ =
               (float)local_560._4_4_ * (float)local_ac0._0_4_ +
               (float)local_580._4_4_ * (float)local_920._0_4_ + auVar228._0_4_ * fVar117;
          auVar107._4_4_ =
               (float)local_560._4_4_ * (float)local_ac0._4_4_ +
               (float)local_580._4_4_ * (float)local_920._4_4_ + auVar228._4_4_ * fVar117;
          auVar107._8_4_ =
               (float)local_560._4_4_ * fStack_ab8 +
               (float)local_580._4_4_ * fStack_918 + auVar228._8_4_ * fVar117;
          auVar107._12_4_ =
               (float)local_560._4_4_ * aStack_ab4.w +
               (float)local_580._4_4_ * fStack_914 + auVar228._12_4_ * fVar117;
          auVar107._16_4_ =
               (float)local_560._4_4_ * fStack_ab0 +
               (float)local_580._4_4_ * fStack_910 + auVar228._16_4_ * fVar117;
          auVar107._20_4_ =
               (float)local_560._4_4_ * fStack_aac +
               (float)local_580._4_4_ * fStack_90c + auVar228._20_4_ * fVar117;
          auVar107._24_4_ =
               (float)local_560._4_4_ * fStack_aa8 +
               (float)local_580._4_4_ * fStack_908 + auVar228._24_4_ * fVar117;
          auVar107._28_4_ = auVar106._28_4_ + (float)local_560._4_4_ + auVar105._28_4_;
          auVar133._8_4_ = 0x7fffffff;
          auVar133._0_8_ = 0x7fffffff7fffffff;
          auVar133._12_4_ = 0x7fffffff;
          auVar133._16_4_ = 0x7fffffff;
          auVar133._20_4_ = 0x7fffffff;
          auVar133._24_4_ = 0x7fffffff;
          auVar133._28_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar107,auVar133);
          auVar134._8_4_ = 0x3e99999a;
          auVar134._0_8_ = 0x3e99999a3e99999a;
          auVar134._12_4_ = 0x3e99999a;
          auVar134._16_4_ = 0x3e99999a;
          auVar134._20_4_ = 0x3e99999a;
          auVar134._24_4_ = 0x3e99999a;
          auVar134._28_4_ = 0x3e99999a;
          auVar105 = vcmpps_avx(auVar105,auVar134,1);
          auVar105 = vorps_avx(auVar105,local_5c0);
          auVar135._8_4_ = 3;
          auVar135._0_8_ = 0x300000003;
          auVar135._12_4_ = 3;
          auVar135._16_4_ = 3;
          auVar135._20_4_ = 3;
          auVar135._24_4_ = 3;
          auVar135._28_4_ = 3;
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar165,auVar135,auVar105);
          _local_5e0 = ZEXT432(local_aec);
          auVar223 = vpshufd_avx(ZEXT416(local_aec),0);
          auVar203 = vpcmpgtd_avx(auVar105._16_16_,auVar223);
          local_600 = auVar223._0_4_;
          fStack_5fc = auVar223._4_4_;
          fStack_5f8 = auVar223._8_4_;
          fStack_5f4 = auVar223._12_4_;
          auVar223 = vpcmpgtd_avx(auVar105._0_16_,auVar223);
          auVar136._16_16_ = auVar203;
          auVar136._0_16_ = auVar223;
          local_540 = vblendps_avx(ZEXT1632(auVar223),auVar136,0xf0);
          local_500 = vandnps_avx(local_540,local_520);
          auVar140 = ZEXT3264(local_500);
          auVar105 = local_520 & ~local_540;
          local_580._0_4_ = local_580._4_4_;
          fStack_578 = (float)local_580._4_4_;
          fStack_574 = (float)local_580._4_4_;
          fStack_570 = (float)local_580._4_4_;
          fStack_56c = (float)local_580._4_4_;
          fStack_568 = (float)local_580._4_4_;
          fStack_564 = (float)local_580._4_4_;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) {
            fVar142 = (ray->super_RayK<1>).tfar;
            auVar108._4_4_ = fVar142;
            auVar108._0_4_ = fVar142;
            auVar108._8_4_ = fVar142;
            auVar108._12_4_ = fVar142;
            auVar108._16_4_ = fVar142;
            auVar108._20_4_ = fVar142;
            auVar108._24_4_ = fVar142;
            auVar108._28_4_ = fVar142;
            fVar142 = fVar117;
            fVar144 = fVar117;
            fVar147 = fVar117;
            fVar191 = fVar117;
            fVar212 = fVar117;
            fVar213 = fVar117;
            _local_940 = auVar25;
          }
          else {
            local_7c0._0_4_ = local_480._0_4_;
            local_7c0._4_4_ = local_480._4_4_;
            fStack_7b8 = local_480._8_4_;
            fStack_7b4 = local_480._12_4_;
            fStack_7b0 = local_480._16_4_;
            fStack_7ac = local_480._20_4_;
            fStack_7a8 = local_480._24_4_;
            fStack_7a4 = local_480._28_4_;
            local_720._4_4_ = (float)local_7c0._4_4_ + (float)local_680._4_4_;
            local_720._0_4_ = (float)local_7c0._0_4_ + (float)local_680._0_4_;
            fStack_718 = fStack_7b8 + fStack_678;
            fStack_714 = fStack_7b4 + fStack_674;
            fStack_710 = fStack_7b0 + fStack_670;
            fStack_70c = fStack_7ac + fStack_66c;
            fStack_708 = fStack_7a8 + fStack_668;
            fStack_704 = fStack_7a4 + fStack_664;
            local_940._4_4_ = fVar117;
            local_940._0_4_ = fVar117;
            fStack_938 = fVar117;
            fStack_934 = fVar117;
            fStack_930 = fVar117;
            fStack_92c = fVar117;
            fStack_928 = fVar117;
            fStack_924 = fVar117;
            _local_7c0 = auVar234;
            do {
              auVar109._8_4_ = 0x7f800000;
              auVar109._0_8_ = 0x7f8000007f800000;
              auVar109._12_4_ = 0x7f800000;
              auVar109._16_4_ = 0x7f800000;
              auVar109._20_4_ = 0x7f800000;
              auVar109._24_4_ = 0x7f800000;
              auVar109._28_4_ = 0x7f800000;
              auVar105 = auVar140._0_32_;
              auVar106 = vblendvps_avx(auVar109,_local_7c0,auVar105);
              auVar244 = vshufps_avx(auVar106,auVar106,0xb1);
              auVar244 = vminps_avx(auVar106,auVar244);
              auVar365 = vshufpd_avx(auVar244,auVar244,5);
              auVar244 = vminps_avx(auVar244,auVar365);
              auVar365 = vperm2f128_avx(auVar244,auVar244,1);
              auVar244 = vminps_avx(auVar244,auVar365);
              auVar106 = vcmpps_avx(auVar106,auVar244,0);
              auVar244 = auVar105 & auVar106;
              if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar244 >> 0x7f,0) != '\0') ||
                    (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar244 >> 0xbf,0) != '\0') ||
                  (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar244[0x1f] < '\0') {
                auVar105 = vandps_avx(auVar106,auVar105);
              }
              uVar81 = vmovmskps_avx(auVar105);
              uVar84 = 0;
              if (uVar81 != 0) {
                for (; (uVar81 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
                }
              }
              uVar82 = (ulong)uVar84;
              *(undefined4 *)(local_500 + uVar82 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              auVar203 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar117 = local_1a0[uVar82];
              uVar84 = *(uint *)(local_480 + uVar82 * 4);
              if (auVar203._0_4_ < 0.0) {
                fVar142 = sqrtf(auVar203._0_4_);
              }
              else {
                auVar203 = vsqrtss_avx(auVar203,auVar203);
                fVar142 = auVar203._0_4_;
              }
              auVar223 = vminps_avx(_local_950,_local_970);
              auVar203 = vmaxps_avx(_local_950,_local_970);
              auVar158 = vminps_avx(_local_960,_local_980);
              auVar100 = vminps_avx(auVar223,auVar158);
              auVar223 = vmaxps_avx(_local_960,_local_980);
              auVar158 = vmaxps_avx(auVar203,auVar223);
              auVar195._8_4_ = 0x7fffffff;
              auVar195._0_8_ = 0x7fffffff7fffffff;
              auVar195._12_4_ = 0x7fffffff;
              auVar203 = vandps_avx(auVar100,auVar195);
              auVar223 = vandps_avx(auVar158,auVar195);
              auVar203 = vmaxps_avx(auVar203,auVar223);
              auVar223 = vmovshdup_avx(auVar203);
              auVar223 = vmaxss_avx(auVar223,auVar203);
              auVar203 = vshufpd_avx(auVar203,auVar203,1);
              auVar203 = vmaxss_avx(auVar203,auVar223);
              local_920._0_4_ = auVar203._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar142 * 1.9073486e-06;
              local_6e0._0_16_ = vshufps_avx(auVar158,auVar158,0xff);
              auVar203 = vinsertps_avx(ZEXT416(uVar84),ZEXT416((uint)fVar117),0x10);
              lVar88 = 5;
              do {
                auVar223 = vshufps_avx(auVar203,auVar203,0);
                local_ac0._0_4_ = aVar10.x;
                local_ac0._4_4_ = aVar10.y;
                fStack_ab8 = aVar10.z;
                aStack_ab4 = aVar10.field_3;
                auVar96._0_4_ = auVar223._0_4_ * (float)local_ac0._0_4_ + 0.0;
                auVar96._4_4_ = auVar223._4_4_ * (float)local_ac0._4_4_ + 0.0;
                auVar96._8_4_ = auVar223._8_4_ * fStack_ab8 + 0.0;
                auVar96._12_4_ = auVar223._12_4_ * aStack_ab4.w + 0.0;
                local_ae0 = auVar203._0_4_;
                auVar158 = vmovshdup_avx(auVar203);
                fVar212 = auVar158._0_4_;
                local_9e0._0_4_ = 1.0 - fVar212;
                fVar144 = fVar212 * fVar212;
                fVar147 = fVar212 * 3.0;
                fVar117 = fVar147 + -5.0;
                local_800._0_4_ = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
                auVar223 = ZEXT416((uint)(fVar212 * fVar212 * -(float)local_9e0._0_4_ * 0.5));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar100 = ZEXT416((uint)(((float)local_9e0._0_4_ * (float)local_9e0._0_4_ *
                                           ((float)local_9e0._0_4_ * 3.0 + -5.0) + 2.0) * 0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar99 = ZEXT416((uint)((fVar144 * fVar117 + 2.0) * 0.5));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar126 = ZEXT416((uint)((float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -fVar212
                                         * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar157._0_4_ =
                     auVar126._0_4_ * (float)local_950._0_4_ +
                     auVar99._0_4_ * (float)local_970._0_4_ +
                     auVar100._0_4_ * (float)local_960._0_4_ +
                     auVar223._0_4_ * (float)local_980._0_4_;
                auVar157._4_4_ =
                     auVar126._4_4_ * (float)local_950._4_4_ +
                     auVar99._4_4_ * (float)local_970._4_4_ +
                     auVar100._4_4_ * (float)local_960._4_4_ +
                     auVar223._4_4_ * (float)local_980._4_4_;
                auVar157._8_4_ =
                     auVar126._8_4_ * fStack_948 +
                     auVar99._8_4_ * fStack_968 +
                     auVar100._8_4_ * fStack_958 + auVar223._8_4_ * fStack_978;
                auVar157._12_4_ =
                     auVar126._12_4_ * fStack_944 +
                     auVar99._12_4_ * fStack_964 +
                     auVar100._12_4_ * fStack_954 + auVar223._12_4_ * fStack_974;
                fVar191 = (float)local_9e0._0_4_ * -2.0;
                local_820._0_16_ = auVar157;
                auVar223 = vsubps_avx(auVar96,auVar157);
                _local_a20 = auVar223;
                auVar223 = vdpps_avx(auVar223,auVar223,0x7f);
                fVar142 = fVar212 * -9.0 + 4.0;
                local_8a0 = fVar147 + -1.0;
                fStack_89c = 0.0;
                fStack_898 = 0.0;
                aStack_894 = (anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
                              )0x0;
                fVar211 = auVar223._0_4_;
                if (fVar211 < 0.0) {
                  local_9a0._0_16_ = auVar158;
                  local_9c0._0_4_ = fVar144;
                  local_9e0._0_16_ = ZEXT416((uint)local_9e0._0_4_);
                  local_8c0._0_4_ = fVar147;
                  local_7e0._0_4_ = fVar212 * 9.0;
                  local_a00._0_4_ = fVar117;
                  local_7a0._0_16_ = ZEXT416((uint)fVar142);
                  local_6c0._0_4_ = fVar191;
                  fVar213 = sqrtf(fVar211);
                  fVar212 = (float)local_7e0._0_4_;
                  fVar191 = (float)local_6c0._0_4_;
                  fVar144 = (float)local_9c0._0_4_;
                  fVar147 = (float)local_8c0._0_4_;
                  auVar158 = local_9a0._0_16_;
                  fVar117 = (float)local_a00._0_4_;
                  auVar100 = local_7a0._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar223,auVar223);
                  fVar213 = auVar100._0_4_;
                  fVar212 = fVar212 * 9.0;
                  auVar100 = ZEXT416((uint)fVar142);
                }
                fVar142 = auVar158._0_4_;
                auVar158 = ZEXT416((uint)((fVar144 + fVar142 * fVar191) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar99 = ZEXT416((uint)((((float)local_9e0._0_4_ + (float)local_9e0._0_4_) *
                                          (fVar147 + 2.0) +
                                         (float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -3.0) *
                                        0.5));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar126 = ZEXT416((uint)((fVar117 * (fVar142 + fVar142) + fVar142 * fVar147) * 0.5)
                                  );
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar306 = ZEXT1664(_local_970);
                auVar102 = ZEXT416((uint)((fVar142 * ((float)local_9e0._0_4_ +
                                                     (float)local_9e0._0_4_) -
                                          (float)local_800._0_4_) * 0.5));
                auVar102 = vshufps_avx(auVar102,auVar102,0);
                auVar352._0_4_ =
                     (float)local_950._0_4_ * auVar102._0_4_ +
                     local_970._0_4_ * auVar126._0_4_ +
                     (float)local_980._0_4_ * auVar158._0_4_ +
                     (float)local_960._0_4_ * auVar99._0_4_;
                auVar352._4_4_ =
                     (float)local_950._4_4_ * auVar102._4_4_ +
                     local_970._4_4_ * auVar126._4_4_ +
                     (float)local_980._4_4_ * auVar158._4_4_ +
                     (float)local_960._4_4_ * auVar99._4_4_;
                auVar352._8_4_ =
                     fStack_948 * auVar102._8_4_ +
                     local_970._8_4_ * auVar126._8_4_ +
                     fStack_978 * auVar158._8_4_ + fStack_958 * auVar99._8_4_;
                auVar352._12_4_ =
                     fStack_944 * auVar102._12_4_ +
                     local_970._12_4_ * auVar126._12_4_ +
                     fStack_974 * auVar158._12_4_ + fStack_954 * auVar99._12_4_;
                auVar74._4_4_ = fStack_89c;
                auVar74._0_4_ = local_8a0;
                auVar74._8_4_ = fStack_898;
                auVar74._12_4_ = aStack_894;
                auVar102 = vpermilps_avx(auVar74,0);
                auVar158 = vshufps_avx(auVar100,auVar100,0);
                auVar99 = vshufps_avx(ZEXT416((uint)(fVar212 + -5.0)),
                                      ZEXT416((uint)(fVar212 + -5.0)),0);
                auVar100 = ZEXT416((uint)(fVar142 * -3.0 + 2.0));
                auVar126 = vshufps_avx(auVar100,auVar100,0);
                auVar100 = vdpps_avx(auVar352,auVar352,0x7f);
                auVar122._0_4_ =
                     (float)local_950._0_4_ * auVar126._0_4_ +
                     local_970._0_4_ * auVar99._0_4_ +
                     (float)local_960._0_4_ * auVar158._0_4_ +
                     (float)local_980._0_4_ * auVar102._0_4_;
                auVar122._4_4_ =
                     (float)local_950._4_4_ * auVar126._4_4_ +
                     local_970._4_4_ * auVar99._4_4_ +
                     (float)local_960._4_4_ * auVar158._4_4_ +
                     (float)local_980._4_4_ * auVar102._4_4_;
                auVar122._8_4_ =
                     fStack_948 * auVar126._8_4_ +
                     local_970._8_4_ * auVar99._8_4_ +
                     fStack_958 * auVar158._8_4_ + fStack_978 * auVar102._8_4_;
                auVar122._12_4_ =
                     fStack_944 * auVar126._12_4_ +
                     local_970._12_4_ * auVar99._12_4_ +
                     fStack_954 * auVar158._12_4_ + fStack_974 * auVar102._12_4_;
                auVar158 = vblendps_avx(auVar100,_DAT_01f7aa10,0xe);
                auVar99 = vrsqrtss_avx(auVar158,auVar158);
                fVar142 = auVar99._0_4_;
                fVar117 = auVar100._0_4_;
                auVar99 = vdpps_avx(auVar352,auVar122,0x7f);
                auVar126 = vshufps_avx(auVar100,auVar100,0);
                auVar123._0_4_ = auVar122._0_4_ * auVar126._0_4_;
                auVar123._4_4_ = auVar122._4_4_ * auVar126._4_4_;
                auVar123._8_4_ = auVar122._8_4_ * auVar126._8_4_;
                auVar123._12_4_ = auVar122._12_4_ * auVar126._12_4_;
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar219._0_4_ = auVar352._0_4_ * auVar99._0_4_;
                auVar219._4_4_ = auVar352._4_4_ * auVar99._4_4_;
                auVar219._8_4_ = auVar352._8_4_ * auVar99._8_4_;
                auVar219._12_4_ = auVar352._12_4_ * auVar99._12_4_;
                auVar126 = vsubps_avx(auVar123,auVar219);
                auVar99 = vrcpss_avx(auVar158,auVar158);
                auVar158 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                      ZEXT416((uint)((float)local_6a0._0_4_ * local_ae0)));
                local_8a0 = auVar158._0_4_;
                auVar158 = ZEXT416((uint)(auVar99._0_4_ * (2.0 - fVar117 * auVar99._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar82 = CONCAT44(auVar352._4_4_,auVar352._0_4_);
                auVar285._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar285._8_4_ = -auVar352._8_4_;
                auVar285._12_4_ = -auVar352._12_4_;
                auVar99 = ZEXT416((uint)(fVar142 * 1.5 +
                                        fVar117 * -0.5 * fVar142 * fVar142 * fVar142));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar196._0_4_ = auVar99._0_4_ * auVar126._0_4_ * auVar158._0_4_;
                auVar196._4_4_ = auVar99._4_4_ * auVar126._4_4_ * auVar158._4_4_;
                auVar196._8_4_ = auVar99._8_4_ * auVar126._8_4_ * auVar158._8_4_;
                auVar196._12_4_ = auVar99._12_4_ * auVar126._12_4_ * auVar158._12_4_;
                local_800._0_16_ = auVar352;
                local_9e0._0_4_ = auVar352._0_4_ * auVar99._0_4_;
                local_9e0._4_4_ = auVar352._4_4_ * auVar99._4_4_;
                local_9e0._8_4_ = auVar352._8_4_ * auVar99._8_4_;
                local_9e0._12_4_ = auVar352._12_4_ * auVar99._12_4_;
                if (fVar117 < 0.0) {
                  local_9a0._0_4_ = fVar213;
                  local_9c0._0_16_ = auVar285;
                  local_8c0._0_16_ = auVar196;
                  auVar306 = ZEXT1664(_local_970);
                  fVar117 = sqrtf(fVar117);
                  auVar196 = local_8c0._0_16_;
                  auVar285 = local_9c0._0_16_;
                }
                else {
                  auVar158 = vsqrtss_avx(auVar100,auVar100);
                  fVar117 = auVar158._0_4_;
                  local_9a0._0_4_ = fVar213;
                }
                auVar158 = vdpps_avx(_local_a20,local_9e0._0_16_,0x7f);
                local_9c0._0_4_ =
                     ((float)local_920._0_4_ / fVar117) * ((float)local_9a0._0_4_ + 1.0) +
                     (float)local_9a0._0_4_ * (float)local_920._0_4_ + local_8a0;
                auVar100 = vdpps_avx(auVar285,local_9e0._0_16_,0x7f);
                auVar99 = vdpps_avx(_local_a20,auVar196,0x7f);
                auVar126 = vdpps_avx((undefined1  [16])aVar10,local_9e0._0_16_,0x7f);
                auVar102 = vdpps_avx(_local_a20,auVar285,0x7f);
                fVar117 = auVar100._0_4_ + auVar99._0_4_;
                fVar142 = auVar158._0_4_;
                auVar97._0_4_ = fVar142 * fVar142;
                auVar97._4_4_ = auVar158._4_4_ * auVar158._4_4_;
                auVar97._8_4_ = auVar158._8_4_ * auVar158._8_4_;
                auVar97._12_4_ = auVar158._12_4_ * auVar158._12_4_;
                auVar99 = vsubps_avx(auVar223,auVar97);
                local_9e0._0_16_ = ZEXT416((uint)fVar117);
                auVar100 = vdpps_avx(_local_a20,(undefined1  [16])aVar10,0x7f);
                fVar144 = auVar102._0_4_ - fVar142 * fVar117;
                local_9a0._0_16_ = auVar158;
                fVar142 = auVar100._0_4_ - fVar142 * auVar126._0_4_;
                auVar158 = vrsqrtss_avx(auVar99,auVar99);
                fVar147 = auVar99._0_4_;
                fVar117 = auVar158._0_4_;
                fVar117 = fVar117 * 1.5 + fVar147 * -0.5 * fVar117 * fVar117 * fVar117;
                if (fVar147 < 0.0) {
                  local_8c0._0_16_ = auVar126;
                  local_7e0._0_4_ = fVar144;
                  local_a00._0_4_ = fVar142;
                  local_7a0._0_4_ = fVar117;
                  auVar306 = ZEXT1664(auVar306._0_16_);
                  fVar147 = sqrtf(fVar147);
                  fVar117 = (float)local_7a0._0_4_;
                  fVar144 = (float)local_7e0._0_4_;
                  fVar142 = (float)local_a00._0_4_;
                  auVar126 = local_8c0._0_16_;
                }
                else {
                  auVar158 = vsqrtss_avx(auVar99,auVar99);
                  fVar147 = auVar158._0_4_;
                }
                auVar386 = ZEXT3264(_local_8e0);
                auVar366 = ZEXT3264(_local_900);
                auVar102 = vpermilps_avx(local_820._0_16_,0xff);
                auVar18 = vpermilps_avx(local_800._0_16_,0xff);
                fVar144 = fVar144 * fVar117 - auVar18._0_4_;
                auVar220._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar220._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar220._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar242._0_4_ = -fVar144;
                auVar242._4_4_ = 0x80000000;
                auVar242._8_4_ = 0x80000000;
                auVar242._12_4_ = 0x80000000;
                auVar158 = vinsertps_avx(auVar242,ZEXT416((uint)(fVar142 * fVar117)),0x1c);
                auVar99 = vmovsldup_avx(ZEXT416((uint)(local_9e0._0_4_ * fVar142 * fVar117 -
                                                      auVar126._0_4_ * fVar144)));
                auVar158 = vdivps_avx(auVar158,auVar99);
                auVar100 = vinsertps_avx(local_9e0._0_16_,auVar220,0x10);
                auVar100 = vdivps_avx(auVar100,auVar99);
                auVar99 = vmovsldup_avx(local_9a0._0_16_);
                auVar102 = ZEXT416((uint)(fVar147 - auVar102._0_4_));
                auVar126 = vmovsldup_avx(auVar102);
                auVar159._0_4_ = auVar99._0_4_ * auVar158._0_4_ + auVar126._0_4_ * auVar100._0_4_;
                auVar159._4_4_ = auVar99._4_4_ * auVar158._4_4_ + auVar126._4_4_ * auVar100._4_4_;
                auVar159._8_4_ = auVar99._8_4_ * auVar158._8_4_ + auVar126._8_4_ * auVar100._8_4_;
                auVar159._12_4_ =
                     auVar99._12_4_ * auVar158._12_4_ + auVar126._12_4_ * auVar100._12_4_;
                auVar203 = vsubps_avx(auVar203,auVar159);
                auVar160._8_4_ = 0x7fffffff;
                auVar160._0_8_ = 0x7fffffff7fffffff;
                auVar160._12_4_ = 0x7fffffff;
                auVar158 = vandps_avx(local_9a0._0_16_,auVar160);
                fVar142 = (float)local_940._4_4_;
                fVar144 = fStack_938;
                fVar147 = fStack_934;
                fVar191 = fStack_930;
                fVar212 = fStack_92c;
                fVar213 = fStack_928;
                fVar117 = (float)local_940._0_4_;
                if (auVar158._0_4_ < (float)local_9c0._0_4_) {
                  auVar197._8_4_ = 0x7fffffff;
                  auVar197._0_8_ = 0x7fffffff7fffffff;
                  auVar197._12_4_ = 0x7fffffff;
                  auVar158 = vandps_avx(auVar102,auVar197);
                  if (auVar158._0_4_ <
                      (float)local_6e0._0_4_ * 1.9073486e-06 + (float)local_9c0._0_4_ + local_8a0) {
                    fVar215 = auVar203._0_4_ + (float)local_770._0_4_;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar215) &&
                       (fVar235 = (ray->super_RayK<1>).tfar, fVar215 <= fVar235)) {
                      auVar203 = vmovshdup_avx(auVar203);
                      fVar236 = auVar203._0_4_;
                      if ((0.0 <= fVar236) && (fVar236 <= 1.0)) {
                        auVar203 = vrsqrtss_avx(auVar223,auVar223);
                        fVar237 = auVar203._0_4_;
                        pGVar13 = (context->scene->geometries).items[uVar86].ptr;
                        if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                          auVar203 = ZEXT416((uint)(fVar237 * 1.5 +
                                                   fVar211 * -0.5 * fVar237 * fVar237 * fVar237));
                          auVar203 = vshufps_avx(auVar203,auVar203,0);
                          auVar198._0_4_ = auVar203._0_4_ * (float)local_a20._0_4_;
                          auVar198._4_4_ = auVar203._4_4_ * (float)local_a20._4_4_;
                          auVar198._8_4_ = auVar203._8_4_ * fStack_a18;
                          auVar198._12_4_ = auVar203._12_4_ * fStack_a14;
                          auVar124._0_4_ = local_800._0_4_ + auVar18._0_4_ * auVar198._0_4_;
                          auVar124._4_4_ = local_800._4_4_ + auVar18._4_4_ * auVar198._4_4_;
                          auVar124._8_4_ = local_800._8_4_ + auVar18._8_4_ * auVar198._8_4_;
                          auVar124._12_4_ = local_800._12_4_ + auVar18._12_4_ * auVar198._12_4_;
                          auVar203 = vshufps_avx(auVar198,auVar198,0xc9);
                          auVar223 = vshufps_avx(local_800._0_16_,local_800._0_16_,0xc9);
                          auVar199._0_4_ = auVar223._0_4_ * auVar198._0_4_;
                          auVar199._4_4_ = auVar223._4_4_ * auVar198._4_4_;
                          auVar199._8_4_ = auVar223._8_4_ * auVar198._8_4_;
                          auVar199._12_4_ = auVar223._12_4_ * auVar198._12_4_;
                          auVar221._0_4_ = local_800._0_4_ * auVar203._0_4_;
                          auVar221._4_4_ = local_800._4_4_ * auVar203._4_4_;
                          auVar221._8_4_ = local_800._8_4_ * auVar203._8_4_;
                          auVar221._12_4_ = local_800._12_4_ * auVar203._12_4_;
                          auVar158 = vsubps_avx(auVar221,auVar199);
                          auVar203 = vshufps_avx(auVar158,auVar158,0xc9);
                          auVar223 = vshufps_avx(auVar124,auVar124,0xc9);
                          auVar222._0_4_ = auVar223._0_4_ * auVar203._0_4_;
                          auVar222._4_4_ = auVar223._4_4_ * auVar203._4_4_;
                          auVar222._8_4_ = auVar223._8_4_ * auVar203._8_4_;
                          auVar222._12_4_ = auVar223._12_4_ * auVar203._12_4_;
                          auVar203 = vshufps_avx(auVar158,auVar158,0xd2);
                          auVar125._0_4_ = auVar124._0_4_ * auVar203._0_4_;
                          auVar125._4_4_ = auVar124._4_4_ * auVar203._4_4_;
                          auVar125._8_4_ = auVar124._8_4_ * auVar203._8_4_;
                          auVar125._12_4_ = auVar124._12_4_ * auVar203._12_4_;
                          auVar203 = vsubps_avx(auVar222,auVar125);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar215;
                            auVar223 = vshufps_avx(auVar203,auVar203,0xe9);
                            uVar9 = vmovlps_avx(auVar223);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                            (ray->Ng).field_0.field_0.z = auVar203._0_4_;
                            ray->u = fVar236;
                            ray->v = 0.0;
                            ray->primID = (uint)local_840;
                            ray->geomID = uVar86;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar223 = vshufps_avx(auVar203,auVar203,0xe9);
                            local_870 = vmovlps_avx(auVar223);
                            local_868 = auVar203._0_4_;
                            local_864 = fVar236;
                            local_860 = 0;
                            local_85c = (uint)local_840;
                            local_858 = uVar86;
                            local_854 = context->user->instID[0];
                            local_850 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar215;
                            local_660._0_4_ = 0xffffffff;
                            local_a58.valid = (int *)local_660;
                            local_a58.geometryUserPtr = pGVar13->userPtr;
                            local_a58.context = context->user;
                            local_a58.hit = (RTCHitN *)&local_870;
                            local_a58.N = 1;
                            local_a58.ray = (RTCRayN *)ray;
                            if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f91372:
                              p_Var17 = context->args->filter;
                              if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar306 = ZEXT1664(auVar306._0_16_);
                                (*p_Var17)(&local_a58);
                                if (*local_a58.valid == 0) goto LAB_00f91406;
                              }
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_a58.hit;
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_a58.hit + 4);
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_a58.hit + 8);
                              *(float *)((long)local_a58.ray + 0x3c) =
                                   *(float *)(local_a58.hit + 0xc);
                              *(float *)((long)local_a58.ray + 0x40) =
                                   *(float *)(local_a58.hit + 0x10);
                              *(float *)((long)local_a58.ray + 0x44) =
                                   *(float *)(local_a58.hit + 0x14);
                              *(float *)((long)local_a58.ray + 0x48) =
                                   *(float *)(local_a58.hit + 0x18);
                              *(float *)((long)local_a58.ray + 0x4c) =
                                   *(float *)(local_a58.hit + 0x1c);
                              *(float *)((long)local_a58.ray + 0x50) =
                                   *(float *)(local_a58.hit + 0x20);
                            }
                            else {
                              auVar306 = ZEXT1664(auVar306._0_16_);
                              (*pGVar13->intersectionFilterN)(&local_a58);
                              if (*local_a58.valid != 0) goto LAB_00f91372;
LAB_00f91406:
                              (ray->super_RayK<1>).tfar = fVar235;
                            }
                            auVar386 = ZEXT3264(_local_8e0);
                            auVar366 = ZEXT3264(_local_900);
                            fVar117 = (float)local_940._0_4_;
                            fVar142 = (float)local_940._4_4_;
                            fVar144 = fStack_938;
                            fVar147 = fStack_934;
                            fVar191 = fStack_930;
                            fVar212 = fStack_92c;
                            fVar213 = fStack_928;
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar88 = lVar88 + -1;
              } while (lVar88 != 0);
              auVar106 = local_500;
              fVar211 = (ray->super_RayK<1>).tfar;
              auVar108._4_4_ = fVar211;
              auVar108._0_4_ = fVar211;
              auVar108._8_4_ = fVar211;
              auVar108._12_4_ = fVar211;
              auVar108._16_4_ = fVar211;
              auVar108._20_4_ = fVar211;
              auVar108._24_4_ = fVar211;
              auVar108._28_4_ = fVar211;
              auVar105 = vcmpps_avx(_local_720,auVar108,2);
              local_500 = vandps_avx(auVar105,local_500);
              auVar140 = ZEXT3264(local_500);
              auVar106 = auVar106 & auVar105;
            } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar106 >> 0x7f,0) != '\0') ||
                       (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0xbf,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar106[0x1f] < '\0');
          }
          auVar137._0_4_ =
               (float)local_560._0_4_ * (float)local_620._0_4_ +
               (float)local_580._0_4_ * (float)local_640._0_4_ + fVar117 * (float)local_740._0_4_;
          auVar137._4_4_ =
               (float)local_560._4_4_ * (float)local_620._4_4_ +
               (float)local_580._4_4_ * (float)local_640._4_4_ + fVar142 * (float)local_740._4_4_;
          auVar137._8_4_ = fStack_558 * fStack_618 + fStack_578 * fStack_638 + fVar144 * fStack_738;
          auVar137._12_4_ = fStack_554 * fStack_614 + fStack_574 * fStack_634 + fVar147 * fStack_734
          ;
          auVar137._16_4_ = fStack_550 * fStack_610 + fStack_570 * fStack_630 + fVar191 * fStack_730
          ;
          auVar137._20_4_ = fStack_54c * fStack_60c + fStack_56c * fStack_62c + fVar212 * fStack_72c
          ;
          auVar137._24_4_ = fStack_548 * fStack_608 + fStack_568 * fStack_628 + fVar213 * fStack_728
          ;
          auVar137._28_4_ = fStack_544 + fStack_564 + auVar140._28_4_;
          auVar166._8_4_ = 0x7fffffff;
          auVar166._0_8_ = 0x7fffffff7fffffff;
          auVar166._12_4_ = 0x7fffffff;
          auVar166._16_4_ = 0x7fffffff;
          auVar166._20_4_ = 0x7fffffff;
          auVar166._24_4_ = 0x7fffffff;
          auVar166._28_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar137,auVar166);
          auVar167._8_4_ = 0x3e99999a;
          auVar167._0_8_ = 0x3e99999a3e99999a;
          auVar167._12_4_ = 0x3e99999a;
          auVar167._16_4_ = 0x3e99999a;
          auVar167._20_4_ = 0x3e99999a;
          auVar167._24_4_ = 0x3e99999a;
          auVar167._28_4_ = 0x3e99999a;
          auVar105 = vcmpps_avx(auVar105,auVar167,1);
          auVar106 = vorps_avx(auVar105,local_5c0);
          auVar168._0_4_ = (float)local_680._0_4_ + local_760._0_4_;
          auVar168._4_4_ = (float)local_680._4_4_ + local_760._4_4_;
          auVar168._8_4_ = fStack_678 + local_760._8_4_;
          auVar168._12_4_ = fStack_674 + local_760._12_4_;
          auVar168._16_4_ = fStack_670 + local_760._16_4_;
          auVar168._20_4_ = fStack_66c + local_760._20_4_;
          auVar168._24_4_ = fStack_668 + local_760._24_4_;
          auVar168._28_4_ = fStack_664 + local_760._28_4_;
          auVar105 = vcmpps_avx(auVar168,auVar108,2);
          _local_720 = vandps_avx(auVar105,local_5a0);
          auVar169._8_4_ = 3;
          auVar169._0_8_ = 0x300000003;
          auVar169._12_4_ = 3;
          auVar169._16_4_ = 3;
          auVar169._20_4_ = 3;
          auVar169._24_4_ = 3;
          auVar169._28_4_ = 3;
          auVar210._8_4_ = 2;
          auVar210._0_8_ = 0x200000002;
          auVar210._12_4_ = 2;
          auVar210._16_4_ = 2;
          auVar210._20_4_ = 2;
          auVar210._24_4_ = 2;
          auVar210._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar210,auVar169,auVar106);
          auVar78._4_4_ = fStack_5fc;
          auVar78._0_4_ = local_600;
          auVar78._8_4_ = fStack_5f8;
          auVar78._12_4_ = fStack_5f4;
          auVar203 = vpcmpgtd_avx(auVar105._16_16_,auVar78);
          auVar223 = vpshufd_avx(_local_5e0,0);
          auVar223 = vpcmpgtd_avx(auVar105._0_16_,auVar223);
          auVar170._16_16_ = auVar203;
          auVar170._0_16_ = auVar108._0_16_;
          local_760 = vblendps_avx(ZEXT1632(auVar223),auVar170,0xf0);
          local_660 = vandnps_avx(local_760,_local_720);
          auVar105 = _local_720 & ~local_760;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0x7f,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0xbf,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar105[0x1f] < '\0') {
            local_7c0._4_4_ = (float)local_680._4_4_ + local_4c0._4_4_;
            local_7c0._0_4_ = (float)local_680._0_4_ + local_4c0._0_4_;
            fStack_7b8 = fStack_678 + local_4c0._8_4_;
            fStack_7b4 = fStack_674 + local_4c0._12_4_;
            fStack_7b0 = fStack_670 + local_4c0._16_4_;
            fStack_7ac = fStack_66c + local_4c0._20_4_;
            fStack_7a8 = fStack_668 + local_4c0._24_4_;
            fStack_7a4 = fStack_664 + local_4c0._28_4_;
            local_6e0 = _local_4c0;
            do {
              auVar110._8_4_ = 0x7f800000;
              auVar110._0_8_ = 0x7f8000007f800000;
              auVar110._12_4_ = 0x7f800000;
              auVar110._16_4_ = 0x7f800000;
              auVar110._20_4_ = 0x7f800000;
              auVar110._24_4_ = 0x7f800000;
              auVar110._28_4_ = 0x7f800000;
              auVar105 = vblendvps_avx(auVar110,local_6e0,local_660);
              auVar106 = vshufps_avx(auVar105,auVar105,0xb1);
              auVar106 = vminps_avx(auVar105,auVar106);
              auVar244 = vshufpd_avx(auVar106,auVar106,5);
              auVar106 = vminps_avx(auVar106,auVar244);
              auVar244 = vperm2f128_avx(auVar106,auVar106,1);
              auVar106 = vminps_avx(auVar106,auVar244);
              auVar106 = vcmpps_avx(auVar105,auVar106,0);
              auVar244 = local_660 & auVar106;
              auVar105 = local_660;
              if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar244 >> 0x7f,0) != '\0') ||
                    (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar244 >> 0xbf,0) != '\0') ||
                  (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar244[0x1f] < '\0') {
                auVar105 = vandps_avx(auVar106,local_660);
              }
              uVar81 = vmovmskps_avx(auVar105);
              uVar84 = 0;
              if (uVar81 != 0) {
                for (; (uVar81 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
                }
              }
              uVar82 = (ulong)uVar84;
              *(undefined4 *)(local_660 + uVar82 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_8a0 = aVar10.x;
              fStack_89c = aVar10.y;
              fStack_898 = aVar10.z;
              aStack_894 = aVar10.field_3;
              auVar203 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar117 = local_1c0[uVar82];
              uVar84 = *(uint *)(local_4a0 + uVar82 * 4);
              if (auVar203._0_4_ < 0.0) {
                fVar142 = sqrtf(auVar203._0_4_);
              }
              else {
                auVar203 = vsqrtss_avx(auVar203,auVar203);
                fVar142 = auVar203._0_4_;
              }
              auVar223 = vminps_avx(_local_950,_local_970);
              auVar203 = vmaxps_avx(_local_950,_local_970);
              auVar158 = vminps_avx(_local_960,_local_980);
              auVar100 = vminps_avx(auVar223,auVar158);
              auVar223 = vmaxps_avx(_local_960,_local_980);
              auVar158 = vmaxps_avx(auVar203,auVar223);
              auVar200._8_4_ = 0x7fffffff;
              auVar200._0_8_ = 0x7fffffff7fffffff;
              auVar200._12_4_ = 0x7fffffff;
              auVar203 = vandps_avx(auVar100,auVar200);
              auVar223 = vandps_avx(auVar158,auVar200);
              auVar203 = vmaxps_avx(auVar203,auVar223);
              auVar223 = vmovshdup_avx(auVar203);
              auVar223 = vmaxss_avx(auVar223,auVar203);
              auVar203 = vshufpd_avx(auVar203,auVar203,1);
              auVar203 = vmaxss_avx(auVar203,auVar223);
              fVar144 = auVar203._0_4_ * 1.9073486e-06;
              local_6a0._0_4_ = fVar142 * 1.9073486e-06;
              local_6c0._0_16_ = vshufps_avx(auVar158,auVar158,0xff);
              auVar203 = vinsertps_avx(ZEXT416(uVar84),ZEXT416((uint)fVar117),0x10);
              lVar88 = 5;
              do {
                auVar223 = vshufps_avx(auVar203,auVar203,0);
                auVar98._0_4_ = auVar223._0_4_ * local_8a0 + 0.0;
                auVar98._4_4_ = auVar223._4_4_ * fStack_89c + 0.0;
                auVar98._8_4_ = auVar223._8_4_ * fStack_898 + 0.0;
                auVar98._12_4_ = auVar223._12_4_ * aStack_894.w + 0.0;
                local_ae0 = auVar203._0_4_;
                auVar158 = vmovshdup_avx(auVar203);
                fVar215 = auVar158._0_4_;
                local_9e0._0_4_ = 1.0 - fVar215;
                fVar147 = fVar215 * fVar215;
                fVar191 = fVar215 * 3.0;
                fVar117 = fVar191 + -5.0;
                fVar211 = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
                auVar223 = ZEXT416((uint)(fVar215 * fVar215 * -(float)local_9e0._0_4_ * 0.5));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar100 = ZEXT416((uint)((fVar211 * ((float)local_9e0._0_4_ * 3.0 + -5.0) + 2.0) *
                                         0.5));
                auVar100 = vshufps_avx(auVar100,auVar100,0);
                auVar99 = ZEXT416((uint)((fVar147 * fVar117 + 2.0) * 0.5));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar126 = ZEXT416((uint)((float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -fVar215
                                         * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar161._0_4_ =
                     auVar126._0_4_ * (float)local_950._0_4_ +
                     auVar99._0_4_ * (float)local_970._0_4_ +
                     auVar100._0_4_ * (float)local_960._0_4_ +
                     auVar223._0_4_ * (float)local_980._0_4_;
                auVar161._4_4_ =
                     auVar126._4_4_ * (float)local_950._4_4_ +
                     auVar99._4_4_ * (float)local_970._4_4_ +
                     auVar100._4_4_ * (float)local_960._4_4_ +
                     auVar223._4_4_ * (float)local_980._4_4_;
                auVar161._8_4_ =
                     auVar126._8_4_ * fStack_948 +
                     auVar99._8_4_ * fStack_968 +
                     auVar100._8_4_ * fStack_958 + auVar223._8_4_ * fStack_978;
                auVar161._12_4_ =
                     auVar126._12_4_ * fStack_944 +
                     auVar99._12_4_ * fStack_964 +
                     auVar100._12_4_ * fStack_954 + auVar223._12_4_ * fStack_974;
                fVar212 = (float)local_9e0._0_4_ * -2.0;
                local_800._0_16_ = auVar161;
                auVar223 = vsubps_avx(auVar98,auVar161);
                _local_920 = auVar223;
                auVar223 = vdpps_avx(auVar223,auVar223,0x7f);
                fVar142 = fVar215 * -9.0 + 4.0;
                fVar213 = auVar223._0_4_;
                _local_a20 = ZEXT416((uint)(fVar191 + -1.0));
                local_820._0_4_ = fVar211;
                if (fVar213 < 0.0) {
                  local_9a0._0_16_ = auVar158;
                  local_9c0._0_4_ = fVar147;
                  local_9e0._0_16_ = ZEXT416((uint)local_9e0._0_4_);
                  local_940._0_4_ = fVar191;
                  local_8c0._0_4_ = fVar215 * 9.0;
                  local_7e0._0_4_ = fVar117;
                  _local_a00 = ZEXT416((uint)fVar142);
                  local_7a0._0_4_ = fVar212;
                  fVar211 = sqrtf(fVar213);
                  fVar215 = (float)local_8c0._0_4_;
                  fVar212 = (float)local_7a0._0_4_;
                  fVar147 = (float)local_9c0._0_4_;
                  fVar191 = (float)local_940._0_4_;
                  auVar158 = local_9a0._0_16_;
                  fVar117 = (float)local_7e0._0_4_;
                  auVar100 = _local_a00;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar223,auVar223);
                  fVar211 = auVar100._0_4_;
                  fVar215 = fVar215 * 9.0;
                  auVar100 = ZEXT416((uint)fVar142);
                }
                fVar142 = auVar158._0_4_;
                auVar158 = ZEXT416((uint)((fVar147 + fVar142 * fVar212) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar99 = ZEXT416((uint)((((float)local_9e0._0_4_ + (float)local_9e0._0_4_) *
                                          (fVar191 + 2.0) +
                                         (float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -3.0) *
                                        0.5));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar126 = ZEXT416((uint)((fVar117 * (fVar142 + fVar142) + fVar142 * fVar191) * 0.5)
                                  );
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar102 = ZEXT416((uint)((fVar142 * ((float)local_9e0._0_4_ +
                                                     (float)local_9e0._0_4_) -
                                          (float)local_820._0_4_) * 0.5));
                auVar102 = vshufps_avx(auVar102,auVar102,0);
                auVar353._0_4_ =
                     (float)local_950._0_4_ * auVar102._0_4_ +
                     (float)local_970._0_4_ * auVar126._0_4_ +
                     (float)local_980._0_4_ * auVar158._0_4_ +
                     (float)local_960._0_4_ * auVar99._0_4_;
                auVar353._4_4_ =
                     (float)local_950._4_4_ * auVar102._4_4_ +
                     (float)local_970._4_4_ * auVar126._4_4_ +
                     (float)local_980._4_4_ * auVar158._4_4_ +
                     (float)local_960._4_4_ * auVar99._4_4_;
                auVar353._8_4_ =
                     fStack_948 * auVar102._8_4_ +
                     fStack_968 * auVar126._8_4_ +
                     fStack_978 * auVar158._8_4_ + fStack_958 * auVar99._8_4_;
                auVar353._12_4_ =
                     fStack_944 * auVar102._12_4_ +
                     fStack_964 * auVar126._12_4_ +
                     fStack_974 * auVar158._12_4_ + fStack_954 * auVar99._12_4_;
                auVar102 = vpermilps_avx(_local_a20,0);
                auVar158 = vshufps_avx(auVar100,auVar100,0);
                auVar99 = vshufps_avx(ZEXT416((uint)(fVar215 + -5.0)),
                                      ZEXT416((uint)(fVar215 + -5.0)),0);
                auVar100 = ZEXT416((uint)(fVar142 * -3.0 + 2.0));
                auVar126 = vshufps_avx(auVar100,auVar100,0);
                auVar100 = vdpps_avx(auVar353,auVar353,0x7f);
                auVar127._0_4_ =
                     (float)local_950._0_4_ * auVar126._0_4_ +
                     (float)local_970._0_4_ * auVar99._0_4_ +
                     (float)local_960._0_4_ * auVar158._0_4_ +
                     (float)local_980._0_4_ * auVar102._0_4_;
                auVar127._4_4_ =
                     (float)local_950._4_4_ * auVar126._4_4_ +
                     (float)local_970._4_4_ * auVar99._4_4_ +
                     (float)local_960._4_4_ * auVar158._4_4_ +
                     (float)local_980._4_4_ * auVar102._4_4_;
                auVar127._8_4_ =
                     fStack_948 * auVar126._8_4_ +
                     fStack_968 * auVar99._8_4_ +
                     fStack_958 * auVar158._8_4_ + fStack_978 * auVar102._8_4_;
                auVar127._12_4_ =
                     fStack_944 * auVar126._12_4_ +
                     fStack_964 * auVar99._12_4_ +
                     fStack_954 * auVar158._12_4_ + fStack_974 * auVar102._12_4_;
                auVar158 = vblendps_avx(auVar100,_DAT_01f7aa10,0xe);
                auVar99 = vrsqrtss_avx(auVar158,auVar158);
                fVar142 = auVar99._0_4_;
                fVar117 = auVar100._0_4_;
                auVar99 = vdpps_avx(auVar353,auVar127,0x7f);
                auVar126 = vshufps_avx(auVar100,auVar100,0);
                auVar128._0_4_ = auVar127._0_4_ * auVar126._0_4_;
                auVar128._4_4_ = auVar127._4_4_ * auVar126._4_4_;
                auVar128._8_4_ = auVar127._8_4_ * auVar126._8_4_;
                auVar128._12_4_ = auVar127._12_4_ * auVar126._12_4_;
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                auVar224._0_4_ = auVar353._0_4_ * auVar99._0_4_;
                auVar224._4_4_ = auVar353._4_4_ * auVar99._4_4_;
                auVar224._8_4_ = auVar353._8_4_ * auVar99._8_4_;
                auVar224._12_4_ = auVar353._12_4_ * auVar99._12_4_;
                auVar102 = vsubps_avx(auVar128,auVar224);
                auVar99 = vrcpss_avx(auVar158,auVar158);
                auVar158 = vmaxss_avx(ZEXT416((uint)fVar144),
                                      ZEXT416((uint)((float)local_6a0._0_4_ * local_ae0)));
                auVar99 = ZEXT416((uint)(auVar99._0_4_ * (2.0 - fVar117 * auVar99._0_4_)));
                auVar99 = vshufps_avx(auVar99,auVar99,0);
                uVar82 = CONCAT44(auVar353._4_4_,auVar353._0_4_);
                auVar302._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar302._8_4_ = -auVar353._8_4_;
                auVar302._12_4_ = -auVar353._12_4_;
                auVar126 = ZEXT416((uint)(fVar142 * 1.5 +
                                         fVar117 * -0.5 * fVar142 * fVar142 * fVar142));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar201._0_4_ = auVar126._0_4_ * auVar102._0_4_ * auVar99._0_4_;
                auVar201._4_4_ = auVar126._4_4_ * auVar102._4_4_ * auVar99._4_4_;
                auVar201._8_4_ = auVar126._8_4_ * auVar102._8_4_ * auVar99._8_4_;
                auVar201._12_4_ = auVar126._12_4_ * auVar102._12_4_ * auVar99._12_4_;
                _local_a20 = auVar353;
                local_9e0._0_4_ = auVar353._0_4_ * auVar126._0_4_;
                local_9e0._4_4_ = auVar353._4_4_ * auVar126._4_4_;
                local_9e0._8_4_ = auVar353._8_4_ * auVar126._8_4_;
                local_9e0._12_4_ = auVar353._12_4_ * auVar126._12_4_;
                local_820._0_4_ = auVar158._0_4_;
                if (fVar117 < 0.0) {
                  local_9a0._0_4_ = fVar211;
                  local_9c0._0_16_ = auVar302;
                  _local_940 = auVar201;
                  fVar142 = sqrtf(fVar117);
                  auVar201 = _local_940;
                  auVar302 = local_9c0._0_16_;
                  fVar117 = (float)local_820._0_4_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  fVar142 = auVar100._0_4_;
                  local_9a0._0_4_ = fVar211;
                  fVar117 = auVar158._0_4_;
                }
                auVar306 = ZEXT1664(auVar302);
                auVar158 = vdpps_avx(_local_920,local_9e0._0_16_,0x7f);
                local_9c0._0_4_ =
                     (fVar144 / fVar142) * ((float)local_9a0._0_4_ + 1.0) +
                     fVar117 + (float)local_9a0._0_4_ * fVar144;
                auVar100 = vdpps_avx(auVar302,local_9e0._0_16_,0x7f);
                auVar99 = vdpps_avx(_local_920,auVar201,0x7f);
                auVar75._4_4_ = fStack_89c;
                auVar75._0_4_ = local_8a0;
                auVar75._8_4_ = fStack_898;
                auVar75._12_4_ = aStack_894.a;
                auVar126 = vdpps_avx(auVar75,local_9e0._0_16_,0x7f);
                auVar102 = vdpps_avx(_local_920,auVar302,0x7f);
                fVar142 = auVar100._0_4_ + auVar99._0_4_;
                fVar147 = auVar158._0_4_;
                auVar101._0_4_ = fVar147 * fVar147;
                auVar101._4_4_ = auVar158._4_4_ * auVar158._4_4_;
                auVar101._8_4_ = auVar158._8_4_ * auVar158._8_4_;
                auVar101._12_4_ = auVar158._12_4_ * auVar158._12_4_;
                auVar99 = vsubps_avx(auVar223,auVar101);
                local_9e0._0_16_ = ZEXT416((uint)fVar142);
                auVar100 = vdpps_avx(_local_920,auVar75,0x7f);
                fVar191 = auVar102._0_4_ - fVar147 * fVar142;
                local_9a0._0_16_ = auVar158;
                fVar147 = auVar100._0_4_ - fVar147 * auVar126._0_4_;
                auVar158 = vrsqrtss_avx(auVar99,auVar99);
                fVar211 = auVar99._0_4_;
                fVar142 = auVar158._0_4_;
                fVar142 = fVar142 * 1.5 + fVar211 * -0.5 * fVar142 * fVar142 * fVar142;
                if (fVar211 < 0.0) {
                  _local_940 = auVar126;
                  local_8c0._0_4_ = fVar191;
                  local_7e0._0_4_ = fVar147;
                  local_a00._0_4_ = fVar142;
                  auVar306 = ZEXT1664(auVar302);
                  fVar211 = sqrtf(fVar211);
                  fVar142 = (float)local_a00._0_4_;
                  fVar191 = (float)local_8c0._0_4_;
                  fVar147 = (float)local_7e0._0_4_;
                  auVar126 = _local_940;
                  fVar117 = (float)local_820._0_4_;
                }
                else {
                  auVar158 = vsqrtss_avx(auVar99,auVar99);
                  fVar211 = auVar158._0_4_;
                }
                auVar386 = ZEXT3264(_local_8e0);
                auVar366 = ZEXT3264(_local_900);
                auVar102 = vpermilps_avx(local_800._0_16_,0xff);
                auVar18 = vpermilps_avx(_local_a20,0xff);
                fVar191 = fVar191 * fVar142 - auVar18._0_4_;
                auVar225._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar225._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar225._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar243._0_4_ = -fVar191;
                auVar243._4_4_ = 0x80000000;
                auVar243._8_4_ = 0x80000000;
                auVar243._12_4_ = 0x80000000;
                auVar158 = vinsertps_avx(auVar243,ZEXT416((uint)(fVar147 * fVar142)),0x1c);
                auVar99 = vmovsldup_avx(ZEXT416((uint)(local_9e0._0_4_ * fVar147 * fVar142 -
                                                      auVar126._0_4_ * fVar191)));
                auVar158 = vdivps_avx(auVar158,auVar99);
                auVar100 = vinsertps_avx(local_9e0._0_16_,auVar225,0x10);
                auVar100 = vdivps_avx(auVar100,auVar99);
                auVar99 = vmovsldup_avx(local_9a0._0_16_);
                auVar102 = ZEXT416((uint)(fVar211 - auVar102._0_4_));
                auVar126 = vmovsldup_avx(auVar102);
                auVar162._0_4_ = auVar99._0_4_ * auVar158._0_4_ + auVar126._0_4_ * auVar100._0_4_;
                auVar162._4_4_ = auVar99._4_4_ * auVar158._4_4_ + auVar126._4_4_ * auVar100._4_4_;
                auVar162._8_4_ = auVar99._8_4_ * auVar158._8_4_ + auVar126._8_4_ * auVar100._8_4_;
                auVar162._12_4_ =
                     auVar99._12_4_ * auVar158._12_4_ + auVar126._12_4_ * auVar100._12_4_;
                auVar203 = vsubps_avx(auVar203,auVar162);
                auVar163._8_4_ = 0x7fffffff;
                auVar163._0_8_ = 0x7fffffff7fffffff;
                auVar163._12_4_ = 0x7fffffff;
                auVar158 = vandps_avx(local_9a0._0_16_,auVar163);
                if (auVar158._0_4_ < (float)local_9c0._0_4_) {
                  auVar202._8_4_ = 0x7fffffff;
                  auVar202._0_8_ = 0x7fffffff7fffffff;
                  auVar202._12_4_ = 0x7fffffff;
                  auVar158 = vandps_avx(auVar102,auVar202);
                  if (auVar158._0_4_ <
                      (float)local_6c0._0_4_ * 1.9073486e-06 + fVar117 + (float)local_9c0._0_4_) {
                    fVar117 = auVar203._0_4_ + (float)local_770._0_4_;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar117) &&
                       (fVar142 = (ray->super_RayK<1>).tfar, fVar117 <= fVar142)) {
                      auVar203 = vmovshdup_avx(auVar203);
                      fVar144 = auVar203._0_4_;
                      if ((0.0 <= fVar144) && (fVar144 <= 1.0)) {
                        auVar203 = vrsqrtss_avx(auVar223,auVar223);
                        fVar147 = auVar203._0_4_;
                        pGVar13 = (context->scene->geometries).items[uVar86].ptr;
                        if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                          auVar203 = ZEXT416((uint)(fVar147 * 1.5 +
                                                   fVar213 * -0.5 * fVar147 * fVar147 * fVar147));
                          auVar203 = vshufps_avx(auVar203,auVar203,0);
                          auVar204._0_4_ = auVar203._0_4_ * (float)local_920._0_4_;
                          auVar204._4_4_ = auVar203._4_4_ * (float)local_920._4_4_;
                          auVar204._8_4_ = auVar203._8_4_ * fStack_918;
                          auVar204._12_4_ = auVar203._12_4_ * fStack_914;
                          auVar129._0_4_ = local_a20._0_4_ + auVar18._0_4_ * auVar204._0_4_;
                          auVar129._4_4_ = local_a20._4_4_ + auVar18._4_4_ * auVar204._4_4_;
                          auVar129._8_4_ = local_a20._8_4_ + auVar18._8_4_ * auVar204._8_4_;
                          auVar129._12_4_ = local_a20._12_4_ + auVar18._12_4_ * auVar204._12_4_;
                          auVar203 = vshufps_avx(auVar204,auVar204,0xc9);
                          auVar223 = vshufps_avx(_local_a20,_local_a20,0xc9);
                          auVar205._0_4_ = auVar223._0_4_ * auVar204._0_4_;
                          auVar205._4_4_ = auVar223._4_4_ * auVar204._4_4_;
                          auVar205._8_4_ = auVar223._8_4_ * auVar204._8_4_;
                          auVar205._12_4_ = auVar223._12_4_ * auVar204._12_4_;
                          auVar226._0_4_ = local_a20._0_4_ * auVar203._0_4_;
                          auVar226._4_4_ = local_a20._4_4_ * auVar203._4_4_;
                          auVar226._8_4_ = local_a20._8_4_ * auVar203._8_4_;
                          auVar226._12_4_ = local_a20._12_4_ * auVar203._12_4_;
                          auVar158 = vsubps_avx(auVar226,auVar205);
                          auVar203 = vshufps_avx(auVar158,auVar158,0xc9);
                          auVar223 = vshufps_avx(auVar129,auVar129,0xc9);
                          auVar227._0_4_ = auVar223._0_4_ * auVar203._0_4_;
                          auVar227._4_4_ = auVar223._4_4_ * auVar203._4_4_;
                          auVar227._8_4_ = auVar223._8_4_ * auVar203._8_4_;
                          auVar227._12_4_ = auVar223._12_4_ * auVar203._12_4_;
                          auVar203 = vshufps_avx(auVar158,auVar158,0xd2);
                          auVar130._0_4_ = auVar129._0_4_ * auVar203._0_4_;
                          auVar130._4_4_ = auVar129._4_4_ * auVar203._4_4_;
                          auVar130._8_4_ = auVar129._8_4_ * auVar203._8_4_;
                          auVar130._12_4_ = auVar129._12_4_ * auVar203._12_4_;
                          auVar203 = vsubps_avx(auVar227,auVar130);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar117;
                            auVar223 = vshufps_avx(auVar203,auVar203,0xe9);
                            uVar9 = vmovlps_avx(auVar223);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                            (ray->Ng).field_0.field_0.z = auVar203._0_4_;
                            ray->u = fVar144;
                            ray->v = 0.0;
                            ray->primID = (uint)local_840;
                            ray->geomID = uVar86;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar223 = vshufps_avx(auVar203,auVar203,0xe9);
                            local_870 = vmovlps_avx(auVar223);
                            local_868 = auVar203._0_4_;
                            local_864 = fVar144;
                            local_860 = 0;
                            local_85c = (uint)local_840;
                            local_858 = uVar86;
                            local_854 = context->user->instID[0];
                            local_850 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar117;
                            local_a24 = -1;
                            local_a58.valid = &local_a24;
                            local_a58.geometryUserPtr = pGVar13->userPtr;
                            local_a58.context = context->user;
                            local_a58.hit = (RTCHitN *)&local_870;
                            local_a58.N = 1;
                            local_a58.ray = (RTCRayN *)ray;
                            if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00f91f58:
                              p_Var17 = context->args->filter;
                              if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar306 = ZEXT1664(auVar306._0_16_);
                                (*p_Var17)(&local_a58);
                                if (*local_a58.valid == 0) goto LAB_00f91fec;
                              }
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_a58.hit;
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_a58.hit + 4);
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_a58.hit + 8);
                              *(float *)((long)local_a58.ray + 0x3c) =
                                   *(float *)(local_a58.hit + 0xc);
                              *(float *)((long)local_a58.ray + 0x40) =
                                   *(float *)(local_a58.hit + 0x10);
                              *(float *)((long)local_a58.ray + 0x44) =
                                   *(float *)(local_a58.hit + 0x14);
                              *(float *)((long)local_a58.ray + 0x48) =
                                   *(float *)(local_a58.hit + 0x18);
                              *(float *)((long)local_a58.ray + 0x4c) =
                                   *(float *)(local_a58.hit + 0x1c);
                              *(float *)((long)local_a58.ray + 0x50) =
                                   *(float *)(local_a58.hit + 0x20);
                            }
                            else {
                              auVar306 = ZEXT1664(auVar306._0_16_);
                              (*pGVar13->intersectionFilterN)(&local_a58);
                              if (*local_a58.valid != 0) goto LAB_00f91f58;
LAB_00f91fec:
                              (ray->super_RayK<1>).tfar = fVar142;
                            }
                            auVar386 = ZEXT3264(_local_8e0);
                            auVar366 = ZEXT3264(_local_900);
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar88 = lVar88 + -1;
              } while (lVar88 != 0);
              auVar106 = local_660;
              fVar117 = (ray->super_RayK<1>).tfar;
              auVar108._4_4_ = fVar117;
              auVar108._0_4_ = fVar117;
              auVar108._8_4_ = fVar117;
              auVar108._12_4_ = fVar117;
              auVar108._16_4_ = fVar117;
              auVar108._20_4_ = fVar117;
              auVar108._24_4_ = fVar117;
              auVar108._28_4_ = fVar117;
              auVar105 = vcmpps_avx(_local_7c0,auVar108,2);
              local_660 = vandps_avx(auVar105,local_660);
              auVar106 = auVar106 & auVar105;
            } while ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar106 >> 0x7f,0) != '\0') ||
                       (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0xbf,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar106[0x1f] < '\0');
          }
          auVar105 = vandps_avx(local_540,local_520);
          auVar106 = vandps_avx(_local_720,local_760);
          auVar232._0_4_ = (float)local_680._0_4_ + local_480._0_4_;
          auVar232._4_4_ = (float)local_680._4_4_ + local_480._4_4_;
          auVar232._8_4_ = fStack_678 + local_480._8_4_;
          auVar232._12_4_ = fStack_674 + local_480._12_4_;
          auVar232._16_4_ = fStack_670 + local_480._16_4_;
          auVar232._20_4_ = fStack_66c + local_480._20_4_;
          auVar232._24_4_ = fStack_668 + local_480._24_4_;
          auVar232._28_4_ = fStack_664 + local_480._28_4_;
          auVar244 = vcmpps_avx(auVar232,auVar108,2);
          auVar105 = vandps_avx(auVar244,auVar105);
          auVar233._0_4_ = (float)local_680._0_4_ + local_4c0._0_4_;
          auVar233._4_4_ = (float)local_680._4_4_ + local_4c0._4_4_;
          auVar233._8_4_ = fStack_678 + local_4c0._8_4_;
          auVar233._12_4_ = fStack_674 + local_4c0._12_4_;
          auVar233._16_4_ = fStack_670 + local_4c0._16_4_;
          auVar233._20_4_ = fStack_66c + local_4c0._20_4_;
          auVar233._24_4_ = fStack_668 + local_4c0._24_4_;
          auVar233._28_4_ = fStack_664 + local_4c0._28_4_;
          auVar244 = vcmpps_avx(auVar233,auVar108,2);
          auVar106 = vandps_avx(auVar244,auVar106);
          auVar106 = vorps_avx(auVar105,auVar106);
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar90 * 0x60) = auVar106;
            auVar105 = vblendvps_avx(_local_4c0,local_480,auVar105);
            *(undefined1 (*) [32])(auStack_160 + uVar90 * 0x60) = auVar105;
            uVar9 = vmovlps_avx(local_4d0);
            (&uStack_140)[uVar90 * 0xc] = uVar9;
            aiStack_138[uVar90 * 0x18] = local_aec + 1;
            iVar89 = iVar89 + 1;
          }
        }
      }
    }
    if (iVar89 == 0) break;
    fVar117 = (ray->super_RayK<1>).tfar;
    auVar138._4_4_ = fVar117;
    auVar138._0_4_ = fVar117;
    auVar138._8_4_ = fVar117;
    auVar138._12_4_ = fVar117;
    auVar138._16_4_ = fVar117;
    auVar138._20_4_ = fVar117;
    auVar138._24_4_ = fVar117;
    auVar138._28_4_ = fVar117;
    uVar84 = -iVar89;
    pauVar83 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar89 - 1) * 0x60);
    while( true ) {
      auVar105 = pauVar83[1];
      auVar171._0_4_ = auVar105._0_4_ + (float)local_680._0_4_;
      auVar171._4_4_ = auVar105._4_4_ + (float)local_680._4_4_;
      auVar171._8_4_ = auVar105._8_4_ + fStack_678;
      auVar171._12_4_ = auVar105._12_4_ + fStack_674;
      auVar171._16_4_ = auVar105._16_4_ + fStack_670;
      auVar171._20_4_ = auVar105._20_4_ + fStack_66c;
      auVar171._24_4_ = auVar105._24_4_ + fStack_668;
      auVar171._28_4_ = auVar105._28_4_ + fStack_664;
      auVar244 = vcmpps_avx(auVar171,auVar138,2);
      auVar106 = vandps_avx(auVar244,*pauVar83);
      local_480 = auVar106;
      auVar244 = *pauVar83 & auVar244;
      if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar244 >> 0x7f,0) != '\0') ||
            (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar244 >> 0xbf,0) != '\0') ||
          (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar244[0x1f] < '\0') break;
      pauVar83 = pauVar83 + -3;
      uVar84 = uVar84 + 1;
      if (uVar84 == 0) goto LAB_00f9230e;
    }
    auVar111._8_4_ = 0x7f800000;
    auVar111._0_8_ = 0x7f8000007f800000;
    auVar111._12_4_ = 0x7f800000;
    auVar111._16_4_ = 0x7f800000;
    auVar111._20_4_ = 0x7f800000;
    auVar111._24_4_ = 0x7f800000;
    auVar111._28_4_ = 0x7f800000;
    auVar105 = vblendvps_avx(auVar111,auVar105,auVar106);
    auVar244 = vshufps_avx(auVar105,auVar105,0xb1);
    auVar244 = vminps_avx(auVar105,auVar244);
    auVar365 = vshufpd_avx(auVar244,auVar244,5);
    auVar244 = vminps_avx(auVar244,auVar365);
    auVar365 = vperm2f128_avx(auVar244,auVar244,1);
    auVar244 = vminps_avx(auVar244,auVar365);
    auVar105 = vcmpps_avx(auVar105,auVar244,0);
    auVar244 = auVar106 & auVar105;
    if ((((((((auVar244 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar244 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar244 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar244 >> 0x7f,0) != '\0') ||
          (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar244 >> 0xbf,0) != '\0') ||
        (auVar244 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar244[0x1f] < '\0') {
      auVar106 = vandps_avx(auVar105,auVar106);
    }
    auVar103._8_8_ = 0;
    auVar103._0_8_ = *(ulong *)pauVar83[2];
    local_aec = *(uint *)(pauVar83[2] + 8);
    uVar85 = vmovmskps_avx(auVar106);
    uVar81 = 0;
    if (uVar85 != 0) {
      for (; (uVar85 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
      }
    }
    *(undefined4 *)(local_480 + (ulong)uVar81 * 4) = 0;
    *pauVar83 = local_480;
    uVar85 = ~uVar84;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar85 = -uVar84;
    }
    uVar90 = (ulong)uVar85;
    auVar203 = vshufps_avx(auVar103,auVar103,0);
    auVar223 = vshufps_avx(auVar103,auVar103,0x55);
    auVar223 = vsubps_avx(auVar223,auVar203);
    local_4c0._4_4_ = auVar203._4_4_ + auVar223._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar203._0_4_ + auVar223._0_4_ * 0.0;
    fStack_4b8 = auVar203._8_4_ + auVar223._8_4_ * 0.2857143;
    fStack_4b4 = auVar203._12_4_ + auVar223._12_4_ * 0.42857146;
    fStack_4b0 = auVar203._0_4_ + auVar223._0_4_ * 0.5714286;
    fStack_4ac = auVar203._4_4_ + auVar223._4_4_ * 0.71428573;
    fStack_4a8 = auVar203._8_4_ + auVar223._8_4_ * 0.8571429;
    fStack_4a4 = auVar203._12_4_ + auVar223._12_4_;
    local_4d0._8_8_ = 0;
    local_4d0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar81 * 4);
    uVar82 = local_840;
  } while( true );
LAB_00f9230e:
  auVar104 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar104 = vcmpps_avx(local_4e0,auVar104,2);
  uVar86 = vmovmskps_avx(auVar104);
  uVar80 = uVar80 - 1 & uVar80 & uVar86;
  if (uVar80 == 0) {
    return;
  }
  goto LAB_00f8f6a7;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }